

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

void embree::avx512::CurveNiIntersectorK<8,16>::
     intersect_t<embree::avx512::RibbonCurve1IntersectorK<embree::CatmullRomCurveT,16,8>,embree::avx512::Intersect1KEpilogMU<8,16,true>>
               (Precalculations *pre,RayHitK<16> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  int iVar1;
  int iVar2;
  undefined1 (*pauVar3) [16];
  undefined1 (*pauVar4) [16];
  undefined1 (*pauVar5) [12];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar6;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  Primitive PVar13;
  uint uVar14;
  undefined4 uVar15;
  RTCFilterFunctionN p_Var16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  bool bVar26;
  bool bVar27;
  bool bVar28;
  bool bVar29;
  bool bVar30;
  undefined1 auVar31 [16];
  undefined8 uVar32;
  undefined8 uVar33;
  undefined8 uVar34;
  ulong uVar35;
  undefined8 uVar36;
  long lVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  int iVar80;
  int iVar81;
  int iVar82;
  int iVar83;
  int iVar84;
  int iVar85;
  int iVar86;
  int iVar87;
  int iVar88;
  int iVar89;
  int iVar90;
  int iVar91;
  int iVar92;
  undefined8 uVar93;
  undefined8 uVar94;
  undefined8 uVar95;
  undefined8 uVar96;
  undefined1 auVar97 [32];
  byte bVar98;
  ulong uVar99;
  uint uVar100;
  uint uVar101;
  int iVar102;
  ulong uVar103;
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  uint uVar104;
  ulong uVar105;
  long lVar106;
  Geometry *pGVar107;
  byte bVar108;
  float fVar109;
  float fVar110;
  float fVar162;
  float fVar163;
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar118 [16];
  float fVar164;
  float fVar166;
  float fVar167;
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  float fVar165;
  float fVar168;
  float fVar169;
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [64];
  float fVar170;
  undefined4 uVar171;
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  float fVar183;
  float fVar184;
  undefined1 auVar182 [64];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  float fVar187;
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  float fVar193;
  float fVar194;
  float fVar208;
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  undefined1 auVar214 [64];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [64];
  undefined1 auVar220 [32];
  undefined1 auVar221 [32];
  undefined1 auVar222 [32];
  undefined1 auVar223 [64];
  undefined1 auVar224 [16];
  undefined1 auVar225 [32];
  undefined1 auVar226 [32];
  undefined1 auVar227 [16];
  undefined1 auVar228 [64];
  undefined1 auVar229 [16];
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  undefined1 auVar234 [32];
  undefined1 auVar235 [32];
  undefined1 auVar236 [32];
  undefined1 auVar237 [32];
  undefined1 auVar238 [32];
  undefined1 auVar240 [64];
  undefined1 auVar241 [64];
  RTCFilterFunctionNArguments args;
  vint<16> mask;
  float local_880;
  float fStack_87c;
  float fStack_878;
  float fStack_874;
  RTCFilterFunctionNArguments local_840;
  undefined1 (*local_810) [32];
  ulong local_808;
  undefined1 local_800 [32];
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [32];
  undefined8 local_7a0;
  float fStack_798;
  float fStack_794;
  float fStack_790;
  float fStack_78c;
  float fStack_788;
  float fStack_784;
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  undefined4 local_720;
  undefined4 uStack_71c;
  undefined4 uStack_718;
  undefined4 uStack_714;
  undefined4 uStack_710;
  undefined4 uStack_70c;
  undefined4 uStack_708;
  undefined4 uStack_704;
  undefined1 local_700 [64];
  undefined1 local_6c0 [8];
  float fStack_6b8;
  float fStack_6b4;
  float fStack_6b0;
  float fStack_6ac;
  float fStack_6a8;
  undefined4 uStack_6a4;
  undefined1 local_6a0 [8];
  float fStack_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  float fStack_688;
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined4 local_560;
  int local_55c;
  undefined1 local_550 [16];
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 local_530;
  undefined8 uStack_528;
  undefined8 local_520;
  undefined8 uStack_518;
  float local_500 [4];
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  float fStack_4e4;
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [64];
  undefined1 local_440 [64];
  undefined1 local_400 [64];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [64];
  RTCHitN local_2c0 [64];
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  undefined1 local_1c0 [64];
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 uStack_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined1 local_140 [64];
  undefined1 local_100 [64];
  undefined1 local_c0 [64];
  undefined1 auVar239 [64];
  
  PVar13 = prim[1];
  uVar103 = (ulong)(byte)PVar13;
  fVar187 = *(float *)(prim + uVar103 * 0x19 + 0x12);
  auVar31 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          0x10);
  auVar31 = vinsertps_avx(auVar31,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x20);
  auVar116 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x100)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0x140)),0x10);
  auVar115 = vinsertps_avx(auVar116,ZEXT416(*(uint *)(ray + k * 4 + 0x180)),0x20);
  auVar203 = vsubps_avx(auVar31,*(undefined1 (*) [16])(prim + uVar103 * 0x19 + 6));
  fVar193 = fVar187 * auVar203._0_4_;
  fVar170 = fVar187 * auVar115._0_4_;
  auVar31._8_8_ = 0;
  auVar31._0_8_ = *(ulong *)(prim + uVar103 * 4 + 6);
  auVar124 = vpmovsxbd_avx2(auVar31);
  auVar116._8_8_ = 0;
  auVar116._0_8_ = *(ulong *)(prim + uVar103 * 5 + 6);
  auVar122 = vpmovsxbd_avx2(auVar116);
  auVar124 = vcvtdq2ps_avx(auVar124);
  auVar122 = vcvtdq2ps_avx(auVar122);
  auVar117._8_8_ = 0;
  auVar117._0_8_ = *(ulong *)(prim + uVar103 * 6 + 6);
  auVar135 = vpmovsxbd_avx2(auVar117);
  auVar135 = vcvtdq2ps_avx(auVar135);
  auVar172._8_8_ = 0;
  auVar172._0_8_ = *(ulong *)(prim + uVar103 * 0xb + 6);
  auVar134 = vpmovsxbd_avx2(auVar172);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar13 * 0xc) + 6);
  auVar128 = vpmovsxbd_avx2(auVar8);
  auVar134 = vcvtdq2ps_avx(auVar134);
  auVar125 = vcvtdq2ps_avx(auVar128);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + (uint)(byte)PVar13 * 0xc + uVar103 + 6);
  auVar123 = vpmovsxbd_avx2(auVar9);
  auVar123 = vcvtdq2ps_avx(auVar123);
  uVar105 = (ulong)(uint)((int)(uVar103 * 9) * 2);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar105 + 6);
  auVar126 = vpmovsxbd_avx2(auVar10);
  auVar126 = vcvtdq2ps_avx(auVar126);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar105 + uVar103 + 6);
  auVar133 = vpmovsxbd_avx2(auVar11);
  auVar133 = vcvtdq2ps_avx(auVar133);
  uVar99 = (ulong)(uint)((int)(uVar103 * 5) << 2);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar99 + 6);
  auVar121 = vpmovsxbd_avx2(auVar12);
  auVar127 = vcvtdq2ps_avx(auVar121);
  auVar232._4_4_ = fVar170;
  auVar232._0_4_ = fVar170;
  auVar232._8_4_ = fVar170;
  auVar232._12_4_ = fVar170;
  auVar232._16_4_ = fVar170;
  auVar232._20_4_ = fVar170;
  auVar232._24_4_ = fVar170;
  auVar232._28_4_ = fVar170;
  auVar234._8_4_ = 1;
  auVar234._0_8_ = 0x100000001;
  auVar234._12_4_ = 1;
  auVar234._16_4_ = 1;
  auVar234._20_4_ = 1;
  auVar234._24_4_ = 1;
  auVar234._28_4_ = 1;
  auVar119 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar130 = ZEXT1632(CONCAT412(fVar187 * auVar115._12_4_,
                                CONCAT48(fVar187 * auVar115._8_4_,
                                         CONCAT44(fVar187 * auVar115._4_4_,fVar170))));
  auVar129 = vpermps_avx2(auVar234,auVar130);
  auVar120 = vpermps_avx512vl(auVar119,auVar130);
  fVar170 = auVar120._0_4_;
  fVar183 = auVar120._4_4_;
  auVar130._4_4_ = fVar183 * auVar135._4_4_;
  auVar130._0_4_ = fVar170 * auVar135._0_4_;
  fVar184 = auVar120._8_4_;
  auVar130._8_4_ = fVar184 * auVar135._8_4_;
  fVar194 = auVar120._12_4_;
  auVar130._12_4_ = fVar194 * auVar135._12_4_;
  fVar208 = auVar120._16_4_;
  auVar130._16_4_ = fVar208 * auVar135._16_4_;
  fVar109 = auVar120._20_4_;
  auVar130._20_4_ = fVar109 * auVar135._20_4_;
  fVar110 = auVar120._24_4_;
  auVar130._24_4_ = fVar110 * auVar135._24_4_;
  auVar130._28_4_ = auVar128._28_4_;
  auVar128._4_4_ = auVar123._4_4_ * fVar183;
  auVar128._0_4_ = auVar123._0_4_ * fVar170;
  auVar128._8_4_ = auVar123._8_4_ * fVar184;
  auVar128._12_4_ = auVar123._12_4_ * fVar194;
  auVar128._16_4_ = auVar123._16_4_ * fVar208;
  auVar128._20_4_ = auVar123._20_4_ * fVar109;
  auVar128._24_4_ = auVar123._24_4_ * fVar110;
  auVar128._28_4_ = auVar121._28_4_;
  auVar121._4_4_ = auVar127._4_4_ * fVar183;
  auVar121._0_4_ = auVar127._0_4_ * fVar170;
  auVar121._8_4_ = auVar127._8_4_ * fVar184;
  auVar121._12_4_ = auVar127._12_4_ * fVar194;
  auVar121._16_4_ = auVar127._16_4_ * fVar208;
  auVar121._20_4_ = auVar127._20_4_ * fVar109;
  auVar121._24_4_ = auVar127._24_4_ * fVar110;
  auVar121._28_4_ = auVar120._28_4_;
  auVar31 = vfmadd231ps_fma(auVar130,auVar129,auVar122);
  auVar116 = vfmadd231ps_fma(auVar128,auVar129,auVar125);
  auVar117 = vfmadd231ps_fma(auVar121,auVar133,auVar129);
  auVar31 = vfmadd231ps_fma(ZEXT1632(auVar31),auVar232,auVar124);
  auVar116 = vfmadd231ps_fma(ZEXT1632(auVar116),auVar232,auVar134);
  auVar117 = vfmadd231ps_fma(ZEXT1632(auVar117),auVar126,auVar232);
  auVar233._4_4_ = fVar193;
  auVar233._0_4_ = fVar193;
  auVar233._8_4_ = fVar193;
  auVar233._12_4_ = fVar193;
  auVar233._16_4_ = fVar193;
  auVar233._20_4_ = fVar193;
  auVar233._24_4_ = fVar193;
  auVar233._28_4_ = fVar193;
  auVar121 = ZEXT1632(CONCAT412(fVar187 * auVar203._12_4_,
                                CONCAT48(fVar187 * auVar203._8_4_,
                                         CONCAT44(fVar187 * auVar203._4_4_,fVar193))));
  auVar128 = vpermps_avx2(auVar234,auVar121);
  auVar121 = vpermps_avx512vl(auVar119,auVar121);
  fVar187 = auVar121._0_4_;
  fVar170 = auVar121._4_4_;
  auVar129._4_4_ = fVar170 * auVar135._4_4_;
  auVar129._0_4_ = fVar187 * auVar135._0_4_;
  fVar183 = auVar121._8_4_;
  auVar129._8_4_ = fVar183 * auVar135._8_4_;
  fVar184 = auVar121._12_4_;
  auVar129._12_4_ = fVar184 * auVar135._12_4_;
  fVar194 = auVar121._16_4_;
  auVar129._16_4_ = fVar194 * auVar135._16_4_;
  fVar208 = auVar121._20_4_;
  auVar129._20_4_ = fVar208 * auVar135._20_4_;
  fVar109 = auVar121._24_4_;
  auVar129._24_4_ = fVar109 * auVar135._24_4_;
  auVar129._28_4_ = 1;
  auVar119._4_4_ = auVar123._4_4_ * fVar170;
  auVar119._0_4_ = auVar123._0_4_ * fVar187;
  auVar119._8_4_ = auVar123._8_4_ * fVar183;
  auVar119._12_4_ = auVar123._12_4_ * fVar184;
  auVar119._16_4_ = auVar123._16_4_ * fVar194;
  auVar119._20_4_ = auVar123._20_4_ * fVar208;
  auVar119._24_4_ = auVar123._24_4_ * fVar109;
  auVar119._28_4_ = auVar135._28_4_;
  auVar123._4_4_ = auVar127._4_4_ * fVar170;
  auVar123._0_4_ = auVar127._0_4_ * fVar187;
  auVar123._8_4_ = auVar127._8_4_ * fVar183;
  auVar123._12_4_ = auVar127._12_4_ * fVar184;
  auVar123._16_4_ = auVar127._16_4_ * fVar194;
  auVar123._20_4_ = auVar127._20_4_ * fVar208;
  auVar123._24_4_ = auVar127._24_4_ * fVar109;
  auVar123._28_4_ = auVar121._28_4_;
  auVar172 = vfmadd231ps_fma(auVar129,auVar128,auVar122);
  auVar8 = vfmadd231ps_fma(auVar119,auVar128,auVar125);
  auVar9 = vfmadd231ps_fma(auVar123,auVar128,auVar133);
  auVar172 = vfmadd231ps_fma(ZEXT1632(auVar172),auVar233,auVar124);
  auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar233,auVar134);
  auVar222._8_4_ = 0x7fffffff;
  auVar222._0_8_ = 0x7fffffff7fffffff;
  auVar222._12_4_ = 0x7fffffff;
  auVar222._16_4_ = 0x7fffffff;
  auVar222._20_4_ = 0x7fffffff;
  auVar222._24_4_ = 0x7fffffff;
  auVar222._28_4_ = 0x7fffffff;
  auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar233,auVar126);
  auVar124 = vandps_avx(ZEXT1632(auVar31),auVar222);
  auVar220._8_4_ = 0x219392ef;
  auVar220._0_8_ = 0x219392ef219392ef;
  auVar220._12_4_ = 0x219392ef;
  auVar220._16_4_ = 0x219392ef;
  auVar220._20_4_ = 0x219392ef;
  auVar220._24_4_ = 0x219392ef;
  auVar220._28_4_ = 0x219392ef;
  uVar105 = vcmpps_avx512vl(auVar124,auVar220,1);
  bVar17 = (bool)((byte)uVar105 & 1);
  auVar120._0_4_ = (uint)bVar17 * 0x219392ef | (uint)!bVar17 * auVar31._0_4_;
  bVar17 = (bool)((byte)(uVar105 >> 1) & 1);
  auVar120._4_4_ = (uint)bVar17 * 0x219392ef | (uint)!bVar17 * auVar31._4_4_;
  bVar17 = (bool)((byte)(uVar105 >> 2) & 1);
  auVar120._8_4_ = (uint)bVar17 * 0x219392ef | (uint)!bVar17 * auVar31._8_4_;
  bVar17 = (bool)((byte)(uVar105 >> 3) & 1);
  auVar120._12_4_ = (uint)bVar17 * 0x219392ef | (uint)!bVar17 * auVar31._12_4_;
  auVar120._16_4_ = (uint)((byte)(uVar105 >> 4) & 1) * 0x219392ef;
  auVar120._20_4_ = (uint)((byte)(uVar105 >> 5) & 1) * 0x219392ef;
  auVar120._24_4_ = (uint)((byte)(uVar105 >> 6) & 1) * 0x219392ef;
  auVar120._28_4_ = (uint)(byte)(uVar105 >> 7) * 0x219392ef;
  auVar124 = vandps_avx(ZEXT1632(auVar116),auVar222);
  uVar105 = vcmpps_avx512vl(auVar124,auVar220,1);
  bVar17 = (bool)((byte)uVar105 & 1);
  auVar131._0_4_ = (uint)bVar17 * 0x219392ef | (uint)!bVar17 * auVar116._0_4_;
  bVar17 = (bool)((byte)(uVar105 >> 1) & 1);
  auVar131._4_4_ = (uint)bVar17 * 0x219392ef | (uint)!bVar17 * auVar116._4_4_;
  bVar17 = (bool)((byte)(uVar105 >> 2) & 1);
  auVar131._8_4_ = (uint)bVar17 * 0x219392ef | (uint)!bVar17 * auVar116._8_4_;
  bVar17 = (bool)((byte)(uVar105 >> 3) & 1);
  auVar131._12_4_ = (uint)bVar17 * 0x219392ef | (uint)!bVar17 * auVar116._12_4_;
  auVar131._16_4_ = (uint)((byte)(uVar105 >> 4) & 1) * 0x219392ef;
  auVar131._20_4_ = (uint)((byte)(uVar105 >> 5) & 1) * 0x219392ef;
  auVar131._24_4_ = (uint)((byte)(uVar105 >> 6) & 1) * 0x219392ef;
  auVar131._28_4_ = (uint)(byte)(uVar105 >> 7) * 0x219392ef;
  auVar124 = vandps_avx(ZEXT1632(auVar117),auVar222);
  uVar105 = vcmpps_avx512vl(auVar124,auVar220,1);
  bVar17 = (bool)((byte)uVar105 & 1);
  auVar124._0_4_ = (uint)bVar17 * 0x219392ef | (uint)!bVar17 * auVar117._0_4_;
  bVar17 = (bool)((byte)(uVar105 >> 1) & 1);
  auVar124._4_4_ = (uint)bVar17 * 0x219392ef | (uint)!bVar17 * auVar117._4_4_;
  bVar17 = (bool)((byte)(uVar105 >> 2) & 1);
  auVar124._8_4_ = (uint)bVar17 * 0x219392ef | (uint)!bVar17 * auVar117._8_4_;
  bVar17 = (bool)((byte)(uVar105 >> 3) & 1);
  auVar124._12_4_ = (uint)bVar17 * 0x219392ef | (uint)!bVar17 * auVar117._12_4_;
  auVar124._16_4_ = (uint)((byte)(uVar105 >> 4) & 1) * 0x219392ef;
  auVar124._20_4_ = (uint)((byte)(uVar105 >> 5) & 1) * 0x219392ef;
  auVar124._24_4_ = (uint)((byte)(uVar105 >> 6) & 1) * 0x219392ef;
  auVar124._28_4_ = (uint)(byte)(uVar105 >> 7) * 0x219392ef;
  auVar122 = vrcp14ps_avx512vl(auVar120);
  auVar221._8_4_ = 0x3f800000;
  auVar221._0_8_ = 0x3f8000003f800000;
  auVar221._12_4_ = 0x3f800000;
  auVar221._16_4_ = 0x3f800000;
  auVar221._20_4_ = 0x3f800000;
  auVar221._24_4_ = 0x3f800000;
  auVar221._28_4_ = 0x3f800000;
  auVar31 = vfnmadd213ps_fma(auVar120,auVar122,auVar221);
  auVar31 = vfmadd132ps_fma(ZEXT1632(auVar31),auVar122,auVar122);
  auVar122 = vrcp14ps_avx512vl(auVar131);
  auVar116 = vfnmadd213ps_fma(auVar131,auVar122,auVar221);
  auVar116 = vfmadd132ps_fma(ZEXT1632(auVar116),auVar122,auVar122);
  auVar122 = vrcp14ps_avx512vl(auVar124);
  auVar117 = vfnmadd213ps_fma(auVar124,auVar122,auVar221);
  auVar117 = vfmadd132ps_fma(ZEXT1632(auVar117),auVar122,auVar122);
  auVar124 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar103 * 7 + 6));
  auVar124 = vcvtdq2ps_avx(auVar124);
  auVar124 = vsubps_avx(auVar124,ZEXT1632(auVar172));
  auVar126._4_4_ = auVar31._4_4_ * auVar124._4_4_;
  auVar126._0_4_ = auVar31._0_4_ * auVar124._0_4_;
  auVar126._8_4_ = auVar31._8_4_ * auVar124._8_4_;
  auVar126._12_4_ = auVar31._12_4_ * auVar124._12_4_;
  auVar126._16_4_ = auVar124._16_4_ * 0.0;
  auVar126._20_4_ = auVar124._20_4_ * 0.0;
  auVar126._24_4_ = auVar124._24_4_ * 0.0;
  auVar126._28_4_ = auVar124._28_4_;
  auVar124 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar103 * 9 + 6));
  auVar124 = vcvtdq2ps_avx(auVar124);
  auVar124 = vsubps_avx(auVar124,ZEXT1632(auVar172));
  auVar123 = vpbroadcastd_avx512vl();
  auVar122 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar13 * 0x10 + 6));
  auVar190._0_4_ = auVar31._0_4_ * auVar124._0_4_;
  auVar190._4_4_ = auVar31._4_4_ * auVar124._4_4_;
  auVar190._8_4_ = auVar31._8_4_ * auVar124._8_4_;
  auVar190._12_4_ = auVar31._12_4_ * auVar124._12_4_;
  auVar190._16_4_ = auVar124._16_4_ * 0.0;
  auVar190._20_4_ = auVar124._20_4_ * 0.0;
  auVar190._24_4_ = auVar124._24_4_ * 0.0;
  auVar190._28_4_ = 0;
  auVar124 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                             (prim + (ulong)(byte)PVar13 * 0x10 + uVar103 * -2 + 6));
  auVar124 = vcvtdq2ps_avx(auVar124);
  auVar124 = vsubps_avx(auVar124,ZEXT1632(auVar8));
  auVar133._4_4_ = auVar116._4_4_ * auVar124._4_4_;
  auVar133._0_4_ = auVar116._0_4_ * auVar124._0_4_;
  auVar133._8_4_ = auVar116._8_4_ * auVar124._8_4_;
  auVar133._12_4_ = auVar116._12_4_ * auVar124._12_4_;
  auVar133._16_4_ = auVar124._16_4_ * 0.0;
  auVar133._20_4_ = auVar124._20_4_ * 0.0;
  auVar133._24_4_ = auVar124._24_4_ * 0.0;
  auVar133._28_4_ = auVar124._28_4_;
  auVar124 = vcvtdq2ps_avx(auVar122);
  auVar124 = vsubps_avx(auVar124,ZEXT1632(auVar8));
  auVar185._0_4_ = auVar116._0_4_ * auVar124._0_4_;
  auVar185._4_4_ = auVar116._4_4_ * auVar124._4_4_;
  auVar185._8_4_ = auVar116._8_4_ * auVar124._8_4_;
  auVar185._12_4_ = auVar116._12_4_ * auVar124._12_4_;
  auVar185._16_4_ = auVar124._16_4_ * 0.0;
  auVar185._20_4_ = auVar124._20_4_ * 0.0;
  auVar185._24_4_ = auVar124._24_4_ * 0.0;
  auVar185._28_4_ = 0;
  auVar124 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar99 + uVar103 + 6));
  auVar124 = vcvtdq2ps_avx(auVar124);
  auVar124 = vsubps_avx(auVar124,ZEXT1632(auVar9));
  auVar127._4_4_ = auVar124._4_4_ * auVar117._4_4_;
  auVar127._0_4_ = auVar124._0_4_ * auVar117._0_4_;
  auVar127._8_4_ = auVar124._8_4_ * auVar117._8_4_;
  auVar127._12_4_ = auVar124._12_4_ * auVar117._12_4_;
  auVar127._16_4_ = auVar124._16_4_ * 0.0;
  auVar127._20_4_ = auVar124._20_4_ * 0.0;
  auVar127._24_4_ = auVar124._24_4_ * 0.0;
  auVar127._28_4_ = auVar124._28_4_;
  auVar124 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar103 * 0x17 + 6));
  auVar124 = vcvtdq2ps_avx(auVar124);
  auVar124 = vsubps_avx(auVar124,ZEXT1632(auVar9));
  auVar132._0_4_ = auVar117._0_4_ * auVar124._0_4_;
  auVar132._4_4_ = auVar117._4_4_ * auVar124._4_4_;
  auVar132._8_4_ = auVar117._8_4_ * auVar124._8_4_;
  auVar132._12_4_ = auVar117._12_4_ * auVar124._12_4_;
  auVar132._16_4_ = auVar124._16_4_ * 0.0;
  auVar132._20_4_ = auVar124._20_4_ * 0.0;
  auVar132._24_4_ = auVar124._24_4_ * 0.0;
  auVar132._28_4_ = 0;
  auVar124 = vpminsd_avx2(auVar126,auVar190);
  auVar122 = vpminsd_avx2(auVar133,auVar185);
  auVar124 = vmaxps_avx(auVar124,auVar122);
  auVar122 = vpminsd_avx2(auVar127,auVar132);
  uVar171 = *(undefined4 *)(ray + k * 4 + 0xc0);
  auVar135._4_4_ = uVar171;
  auVar135._0_4_ = uVar171;
  auVar135._8_4_ = uVar171;
  auVar135._12_4_ = uVar171;
  auVar135._16_4_ = uVar171;
  auVar135._20_4_ = uVar171;
  auVar135._24_4_ = uVar171;
  auVar135._28_4_ = uVar171;
  auVar122 = vmaxps_avx512vl(auVar122,auVar135);
  auVar124 = vmaxps_avx(auVar124,auVar122);
  auVar122._8_4_ = 0x3f7ffffa;
  auVar122._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar122._12_4_ = 0x3f7ffffa;
  auVar122._16_4_ = 0x3f7ffffa;
  auVar122._20_4_ = 0x3f7ffffa;
  auVar122._24_4_ = 0x3f7ffffa;
  auVar122._28_4_ = 0x3f7ffffa;
  local_320 = vmulps_avx512vl(auVar124,auVar122);
  auVar124 = vpmaxsd_avx2(auVar126,auVar190);
  auVar122 = vpmaxsd_avx2(auVar133,auVar185);
  auVar124 = vminps_avx(auVar124,auVar122);
  auVar122 = vpmaxsd_avx2(auVar127,auVar132);
  uVar171 = *(undefined4 *)(ray + k * 4 + 0x200);
  auVar134._4_4_ = uVar171;
  auVar134._0_4_ = uVar171;
  auVar134._8_4_ = uVar171;
  auVar134._12_4_ = uVar171;
  auVar134._16_4_ = uVar171;
  auVar134._20_4_ = uVar171;
  auVar134._24_4_ = uVar171;
  auVar134._28_4_ = uVar171;
  auVar122 = vminps_avx512vl(auVar122,auVar134);
  auVar124 = vminps_avx(auVar124,auVar122);
  auVar125._8_4_ = 0x3f800003;
  auVar125._0_8_ = 0x3f8000033f800003;
  auVar125._12_4_ = 0x3f800003;
  auVar125._16_4_ = 0x3f800003;
  auVar125._20_4_ = 0x3f800003;
  auVar125._24_4_ = 0x3f800003;
  auVar125._28_4_ = 0x3f800003;
  auVar124 = vmulps_avx512vl(auVar124,auVar125);
  uVar36 = vpcmpgtd_avx512vl(auVar123,_DAT_01fe9900);
  uVar32 = vcmpps_avx512vl(local_320,auVar124,2);
  if ((byte)((byte)uVar32 & (byte)uVar36) != 0) {
    uVar105 = (ulong)(byte)((byte)uVar32 & (byte)uVar36);
    local_810 = (undefined1 (*) [32])local_100;
    auVar182 = vpmovm2d_avx512dq((ulong)(uint)(1 << ((uint)k & 0x1f)));
    local_300 = vmovdqa64_avx512f(auVar182);
    do {
      auVar182 = local_440;
      lVar37 = 0;
      for (uVar99 = uVar105; (uVar99 & 1) == 0; uVar99 = uVar99 >> 1 | 0x8000000000000000) {
        lVar37 = lVar37 + 1;
      }
      uVar104 = *(uint *)(prim + 2);
      uVar14 = *(uint *)(prim + lVar37 * 4 + 6);
      pGVar107 = (context->scene->geometries).items[uVar104].ptr;
      uVar99 = (ulong)*(uint *)(*(long *)&pGVar107->field_0x58 +
                               pGVar107[1].super_RefCount.refCounter.
                               super___atomic_base<unsigned_long>._M_i * (ulong)uVar14);
      p_Var16 = pGVar107[1].intersectionFilterN;
      lVar37 = *(long *)&pGVar107[1].time_range.upper;
      auVar31 = *(undefined1 (*) [16])(lVar37 + (long)p_Var16 * uVar99);
      pauVar3 = (undefined1 (*) [16])(lVar37 + (uVar99 + 1) * (long)p_Var16);
      uVar32 = *(undefined8 *)*pauVar3;
      uVar36 = *(undefined8 *)(*pauVar3 + 8);
      auVar12 = *pauVar3;
      auVar10 = *pauVar3;
      auVar8 = *pauVar3;
      auVar116 = *pauVar3;
      pauVar4 = (undefined1 (*) [16])(lVar37 + (uVar99 + 2) * (long)p_Var16);
      uVar93 = *(undefined8 *)*pauVar4;
      uVar94 = *(undefined8 *)(*pauVar4 + 8);
      auVar11 = *pauVar4;
      auVar9 = *pauVar4;
      auVar172 = *pauVar4;
      auVar117 = *pauVar4;
      uVar105 = uVar105 - 1 & uVar105;
      pauVar5 = (undefined1 (*) [12])(lVar37 + (uVar99 + 3) * (long)p_Var16);
      uVar95 = *(undefined8 *)*pauVar5;
      uVar96 = *(undefined8 *)(*pauVar5 + 8);
      local_880 = (float)uVar95;
      fStack_87c = (float)((ulong)uVar95 >> 0x20);
      fStack_878 = (float)uVar96;
      fStack_874 = (float)((ulong)uVar96 >> 0x20);
      if (uVar105 != 0) {
        uVar103 = uVar105 - 1 & uVar105;
        for (uVar99 = uVar105; (uVar99 & 1) == 0; uVar99 = uVar99 >> 1 | 0x8000000000000000) {
        }
        if (uVar103 != 0) {
          for (; (uVar103 & 1) == 0; uVar103 = uVar103 >> 1 | 0x8000000000000000) {
          }
        }
      }
      iVar102 = (int)pGVar107[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      auVar115 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),
                               ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x1c);
      auVar115 = vinsertps_avx(auVar115,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x28);
      auVar114 = vsubps_avx(auVar31,auVar115);
      uVar171 = auVar114._0_4_;
      auVar111._4_4_ = uVar171;
      auVar111._0_4_ = uVar171;
      auVar111._8_4_ = uVar171;
      auVar111._12_4_ = uVar171;
      auVar203 = vshufps_avx(auVar114,auVar114,0x55);
      auVar114 = vshufps_avx(auVar114,auVar114,0xaa);
      aVar6 = pre->ray_space[k].vx.field_0;
      aVar7 = pre->ray_space[k].vy.field_0;
      fVar187 = pre->ray_space[k].vz.field_0.m128[0];
      fVar170 = pre->ray_space[k].vz.field_0.m128[1];
      fVar183 = pre->ray_space[k].vz.field_0.m128[2];
      fVar184 = pre->ray_space[k].vz.field_0.m128[3];
      auVar224._0_4_ = fVar187 * auVar114._0_4_;
      auVar224._4_4_ = fVar170 * auVar114._4_4_;
      auVar224._8_4_ = fVar183 * auVar114._8_4_;
      auVar224._12_4_ = fVar184 * auVar114._12_4_;
      auVar203 = vfmadd231ps_fma(auVar224,(undefined1  [16])aVar7,auVar203);
      auVar224 = vfmadd231ps_fma(auVar203,(undefined1  [16])aVar6,auVar111);
      auVar203 = vshufps_avx(auVar31,auVar31,0xff);
      auVar111 = vsubps_avx512vl(auVar116,auVar115);
      uVar171 = auVar111._0_4_;
      auVar195._4_4_ = uVar171;
      auVar195._0_4_ = uVar171;
      auVar195._8_4_ = uVar171;
      auVar195._12_4_ = uVar171;
      auVar114 = vshufps_avx(auVar111,auVar111,0x55);
      auVar111 = vshufps_avx(auVar111,auVar111,0xaa);
      auVar112._0_4_ = fVar187 * auVar111._0_4_;
      auVar112._4_4_ = fVar170 * auVar111._4_4_;
      auVar112._8_4_ = fVar183 * auVar111._8_4_;
      auVar112._12_4_ = fVar184 * auVar111._12_4_;
      auVar114 = vfmadd231ps_fma(auVar112,(undefined1  [16])aVar7,auVar114);
      auVar195 = vfmadd231ps_fma(auVar114,(undefined1  [16])aVar6,auVar195);
      auVar112 = vshufps_avx512vl(auVar116,auVar116,0xff);
      auVar111 = vsubps_avx512vl(auVar117,auVar115);
      uVar171 = auVar111._0_4_;
      auVar113._4_4_ = uVar171;
      auVar113._0_4_ = uVar171;
      auVar113._8_4_ = uVar171;
      auVar113._12_4_ = uVar171;
      auVar114 = vshufps_avx(auVar111,auVar111,0x55);
      auVar111 = vshufps_avx(auVar111,auVar111,0xaa);
      auVar227._0_4_ = fVar187 * auVar111._0_4_;
      auVar227._4_4_ = fVar170 * auVar111._4_4_;
      auVar227._8_4_ = fVar183 * auVar111._8_4_;
      auVar227._12_4_ = fVar184 * auVar111._12_4_;
      auVar114 = vfmadd231ps_fma(auVar227,(undefined1  [16])aVar7,auVar114);
      auVar111 = vfmadd231ps_fma(auVar114,(undefined1  [16])aVar6,auVar113);
      auVar113 = vshufps_avx512vl(auVar117,auVar117,0xff);
      auVar38._12_4_ = fStack_874;
      auVar38._0_12_ = *pauVar5;
      auVar114 = vsubps_avx512vl(auVar38,auVar115);
      uVar171 = auVar114._0_4_;
      auVar196._4_4_ = uVar171;
      auVar196._0_4_ = uVar171;
      auVar196._8_4_ = uVar171;
      auVar196._12_4_ = uVar171;
      auVar115 = vshufps_avx(auVar114,auVar114,0x55);
      auVar114 = vshufps_avx(auVar114,auVar114,0xaa);
      auVar229._0_4_ = fVar187 * auVar114._0_4_;
      auVar229._4_4_ = fVar170 * auVar114._4_4_;
      auVar229._8_4_ = fVar183 * auVar114._8_4_;
      auVar229._12_4_ = fVar184 * auVar114._12_4_;
      auVar115 = vfmadd231ps_fma(auVar229,(undefined1  [16])aVar7,auVar115);
      auVar114 = vfmadd231ps_fma(auVar115,(undefined1  [16])aVar6,auVar196);
      lVar37 = (long)iVar102 * 0x44;
      auVar124 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar37);
      auVar115 = vshufps_avx512vl(auVar38,auVar38,0xff);
      uVar171 = auVar224._0_4_;
      local_5e0._4_4_ = uVar171;
      local_5e0._0_4_ = uVar171;
      local_5e0._8_4_ = uVar171;
      local_5e0._12_4_ = uVar171;
      local_5e0._16_4_ = uVar171;
      local_5e0._20_4_ = uVar171;
      local_5e0._24_4_ = uVar171;
      local_5e0._28_4_ = uVar171;
      auVar209._8_4_ = 1;
      auVar209._0_8_ = 0x100000001;
      auVar209._12_4_ = 1;
      auVar209._16_4_ = 1;
      auVar209._20_4_ = 1;
      auVar209._24_4_ = 1;
      auVar209._28_4_ = 1;
      local_600 = vpermps_avx2(auVar209,ZEXT1632(auVar224));
      local_340 = vbroadcastsd_avx512vl(auVar203);
      auVar122 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar37 + 0x484);
      uVar171 = auVar195._0_4_;
      auVar118._4_4_ = uVar171;
      auVar118._0_4_ = uVar171;
      auVar118._8_4_ = uVar171;
      auVar118._12_4_ = uVar171;
      local_620._16_4_ = uVar171;
      local_620._0_16_ = auVar118;
      local_620._20_4_ = uVar171;
      local_620._24_4_ = uVar171;
      local_620._28_4_ = uVar171;
      local_640 = vpermps_avx512vl(auVar209,ZEXT1632(auVar195));
      local_360 = vbroadcastsd_avx512vl(auVar112);
      auVar135 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar37 + 0x908);
      uVar171 = auVar111._0_4_;
      local_660._4_4_ = uVar171;
      local_660._0_4_ = uVar171;
      local_660._8_4_ = uVar171;
      local_660._12_4_ = uVar171;
      local_660._16_4_ = uVar171;
      local_660._20_4_ = uVar171;
      local_660._24_4_ = uVar171;
      local_660._28_4_ = uVar171;
      local_680 = vpermps_avx512vl(auVar209,ZEXT1632(auVar111));
      local_380 = vbroadcastsd_avx512vl(auVar113);
      auVar134 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar37 + 0xd8c);
      fVar170 = auVar114._0_4_;
      local_6a0._4_4_ = fVar170;
      local_6a0._0_4_ = fVar170;
      fStack_698 = fVar170;
      fStack_694 = fVar170;
      fStack_690 = fVar170;
      fStack_68c = fVar170;
      fStack_688 = fVar170;
      register0x0000139c = fVar170;
      _local_6c0 = vpermps_avx512vl(auVar209,ZEXT1632(auVar114));
      local_3a0 = vbroadcastsd_avx512vl(auVar115);
      auVar125 = vmulps_avx512vl(_local_6a0,auVar134);
      auVar123 = vmulps_avx512vl(_local_6c0,auVar134);
      auVar115 = vfmadd231ps_fma(auVar125,auVar135,local_660);
      auVar125 = vfmadd231ps_avx512vl(auVar123,auVar135,local_680);
      auVar115 = vfmadd231ps_fma(ZEXT1632(auVar115),auVar122,local_620);
      auVar126 = vfmadd231ps_avx512vl(auVar125,auVar122,local_640);
      auVar127 = vfmadd231ps_avx512vl(ZEXT1632(auVar115),auVar124,local_5e0);
      auVar219 = ZEXT3264(auVar127);
      auVar125 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar37);
      auVar123 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar37 + 0x484);
      auVar128 = vfmadd231ps_avx512vl(auVar126,auVar124,local_600);
      auVar214 = ZEXT3264(auVar128);
      auVar126 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar37 + 0x908);
      auVar133 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar37 + 0xd8c);
      auVar121 = vmulps_avx512vl(_local_6a0,auVar133);
      auVar129 = vmulps_avx512vl(_local_6c0,auVar133);
      auVar121 = vfmadd231ps_avx512vl(auVar121,auVar126,local_660);
      auVar129 = vfmadd231ps_avx512vl(auVar129,auVar126,local_680);
      auVar121 = vfmadd231ps_avx512vl(auVar121,auVar123,local_620);
      auVar129 = vfmadd231ps_avx512vl(auVar129,auVar123,local_640);
      auVar203 = vfmadd231ps_fma(auVar121,auVar125,local_5e0);
      auVar223 = ZEXT1664(auVar203);
      auVar112 = vfmadd231ps_fma(auVar129,auVar125,local_600);
      auVar121 = vsubps_avx512vl(ZEXT1632(auVar203),auVar127);
      auVar129 = vsubps_avx512vl(ZEXT1632(auVar112),auVar128);
      auVar130 = vmulps_avx512vl(auVar128,auVar121);
      auVar119 = vmulps_avx512vl(auVar127,auVar129);
      auVar130 = vsubps_avx512vl(auVar130,auVar119);
      auVar119 = vmulps_avx512vl(local_3a0,auVar134);
      auVar119 = vfmadd231ps_avx512vl(auVar119,auVar135,local_380);
      auVar119 = vfmadd231ps_avx512vl(auVar119,auVar122,local_360);
      auVar119 = vfmadd231ps_avx512vl(auVar119,auVar124,local_340);
      auVar120 = vmulps_avx512vl(local_3a0,auVar133);
      auVar120 = vfmadd231ps_avx512vl(auVar120,auVar126,local_380);
      auVar120 = vfmadd231ps_avx512vl(auVar120,auVar123,local_360);
      auVar120 = vfmadd231ps_avx512vl(auVar120,auVar125,local_340);
      auVar131 = vmulps_avx512vl(auVar129,auVar129);
      auVar131 = vfmadd231ps_avx512vl(auVar131,auVar121,auVar121);
      auVar132 = vmaxps_avx512vl(auVar119,auVar120);
      auVar132 = vmulps_avx512vl(auVar132,auVar132);
      auVar131 = vmulps_avx512vl(auVar132,auVar131);
      auVar130 = vmulps_avx512vl(auVar130,auVar130);
      uVar33 = vcmpps_avx512vl(auVar130,auVar131,2);
      auVar115 = vblendps_avx(auVar224,auVar31,8);
      auVar113 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar115 = vandps_avx512vl(auVar115,auVar113);
      auVar116 = vblendps_avx(auVar195,auVar116,8);
      auVar116 = vandps_avx512vl(auVar116,auVar113);
      auVar115 = vmaxps_avx(auVar115,auVar116);
      auVar116 = vblendps_avx(auVar111,auVar117,8);
      auVar117 = vandps_avx512vl(auVar116,auVar113);
      auVar116 = vblendps_avx(auVar114,auVar38,8);
      auVar116 = vandps_avx512vl(auVar116,auVar113);
      auVar116 = vmaxps_avx(auVar117,auVar116);
      auVar116 = vmaxps_avx(auVar115,auVar116);
      auVar117 = vmovshdup_avx(auVar116);
      auVar117 = vmaxss_avx(auVar117,auVar116);
      auVar116 = vshufpd_avx(auVar116,auVar116,1);
      auVar116 = vmaxss_avx(auVar116,auVar117);
      auVar231._0_4_ = (float)iVar102;
      local_440._4_12_ = auVar224._4_12_;
      local_440._0_4_ = auVar231._0_4_;
      local_440._16_48_ = auVar182._16_48_;
      auVar231._4_4_ = auVar231._0_4_;
      auVar231._8_4_ = auVar231._0_4_;
      auVar231._12_4_ = auVar231._0_4_;
      auVar231._16_4_ = auVar231._0_4_;
      auVar231._20_4_ = auVar231._0_4_;
      auVar231._24_4_ = auVar231._0_4_;
      auVar231._28_4_ = auVar231._0_4_;
      uVar34 = vcmpps_avx512vl(auVar231,_DAT_01faff40,0xe);
      bVar108 = (byte)uVar33 & (byte)uVar34;
      fVar187 = auVar116._0_4_ * 4.7683716e-07;
      local_7e0._0_16_ = ZEXT416((uint)fVar187);
      auVar204._8_4_ = 2;
      auVar204._0_8_ = 0x200000002;
      auVar204._12_4_ = 2;
      auVar204._16_4_ = 2;
      auVar204._20_4_ = 2;
      auVar204._24_4_ = 2;
      auVar204._28_4_ = 2;
      local_760 = vpermps_avx512vl(auVar204,ZEXT1632(auVar224));
      auVar182 = ZEXT3264(local_760);
      local_780 = vpermps_avx512vl(auVar204,ZEXT1632(auVar195));
      auVar241 = ZEXT3264(local_780);
      auVar130 = vpermps_avx512vl(auVar204,ZEXT1632(auVar111));
      local_4a0 = vpermps_avx2(auVar204,ZEXT1632(auVar114));
      local_720 = *(undefined4 *)(ray + k * 4 + 0xc0);
      uStack_71c = 0;
      uStack_718 = 0;
      uStack_714 = 0;
      if (bVar108 != 0) {
        auVar133 = vmulps_avx512vl(local_4a0,auVar133);
        auVar126 = vfmadd213ps_avx512vl(auVar126,auVar130,auVar133);
        auVar123 = vfmadd213ps_avx512vl(auVar123,local_780,auVar126);
        auVar123 = vfmadd213ps_avx512vl(auVar125,local_760,auVar123);
        auVar134 = vmulps_avx512vl(local_4a0,auVar134);
        auVar135 = vfmadd213ps_avx512vl(auVar135,auVar130,auVar134);
        auVar126 = vfmadd213ps_avx512vl(auVar122,local_780,auVar135);
        auVar122 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar37 + 0x1210);
        auVar135 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar37 + 0x1694);
        auVar134 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar37 + 0x1b18);
        auVar125 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar37 + 0x1f9c);
        auVar126 = vfmadd213ps_avx512vl(auVar124,local_760,auVar126);
        auVar225._0_4_ = fVar170 * auVar125._0_4_;
        auVar225._4_4_ = fVar170 * auVar125._4_4_;
        auVar225._8_4_ = fVar170 * auVar125._8_4_;
        auVar225._12_4_ = fVar170 * auVar125._12_4_;
        auVar225._16_4_ = fVar170 * auVar125._16_4_;
        auVar225._20_4_ = fVar170 * auVar125._20_4_;
        auVar225._24_4_ = fVar170 * auVar125._24_4_;
        auVar225._28_4_ = 0;
        auVar124 = vmulps_avx512vl(_local_6c0,auVar125);
        auVar125 = vmulps_avx512vl(local_4a0,auVar125);
        auVar133 = vfmadd231ps_avx512vl(auVar225,auVar134,local_660);
        auVar124 = vfmadd231ps_avx512vl(auVar124,auVar134,local_680);
        auVar134 = vfmadd231ps_avx512vl(auVar125,auVar130,auVar134);
        auVar125 = vfmadd231ps_avx512vl(auVar133,auVar135,local_620);
        auVar124 = vfmadd231ps_avx512vl(auVar124,auVar135,local_640);
        auVar133 = vfmadd231ps_avx512vl(auVar134,local_780,auVar135);
        auVar116 = vfmadd231ps_fma(auVar125,auVar122,local_5e0);
        auVar125 = vfmadd231ps_avx512vl(auVar124,auVar122,local_600);
        auVar124 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar37 + 0x1210);
        auVar135 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar37 + 0x1b18);
        auVar134 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar37 + 0x1f9c);
        auVar133 = vfmadd231ps_avx512vl(auVar133,local_760,auVar122);
        auVar46._4_4_ = fVar170 * auVar134._4_4_;
        auVar46._0_4_ = fVar170 * auVar134._0_4_;
        auVar46._8_4_ = fVar170 * auVar134._8_4_;
        auVar46._12_4_ = fVar170 * auVar134._12_4_;
        auVar46._16_4_ = fVar170 * auVar134._16_4_;
        auVar46._20_4_ = fVar170 * auVar134._20_4_;
        auVar46._24_4_ = fVar170 * auVar134._24_4_;
        auVar46._28_4_ = auVar122._28_4_;
        auVar122 = vmulps_avx512vl(_local_6c0,auVar134);
        auVar134 = vmulps_avx512vl(local_4a0,auVar134);
        auVar131 = vfmadd231ps_avx512vl(auVar46,auVar135,local_660);
        auVar132 = vfmadd231ps_avx512vl(auVar122,auVar135,local_680);
        auVar182 = ZEXT3264(local_760);
        auVar241 = ZEXT3264(local_780);
        auVar240 = ZEXT3264(auVar130);
        auVar135 = vfmadd231ps_avx512vl(auVar134,auVar130,auVar135);
        auVar122 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar37 + 0x1694);
        auVar134 = vfmadd231ps_avx512vl(auVar131,auVar122,local_620);
        auVar131 = vfmadd231ps_avx512vl(auVar132,auVar122,local_640);
        auVar122 = vfmadd231ps_avx512vl(auVar135,local_780,auVar122);
        auVar117 = vfmadd231ps_fma(auVar134,auVar124,local_5e0);
        auVar135 = vfmadd231ps_avx512vl(auVar131,auVar124,local_600);
        auVar134 = vfmadd231ps_avx512vl(auVar122,local_760,auVar124);
        auVar235._8_4_ = 0x7fffffff;
        auVar235._0_8_ = 0x7fffffff7fffffff;
        auVar235._12_4_ = 0x7fffffff;
        auVar235._16_4_ = 0x7fffffff;
        auVar235._20_4_ = 0x7fffffff;
        auVar235._24_4_ = 0x7fffffff;
        auVar235._28_4_ = 0x7fffffff;
        auVar124 = vandps_avx(ZEXT1632(auVar116),auVar235);
        auVar122 = vandps_avx(auVar125,auVar235);
        auVar122 = vmaxps_avx(auVar124,auVar122);
        auVar124 = vandps_avx(auVar133,auVar235);
        auVar124 = vmaxps_avx(auVar122,auVar124);
        auVar230._4_4_ = fVar187;
        auVar230._0_4_ = fVar187;
        auVar230._8_4_ = fVar187;
        auVar230._12_4_ = fVar187;
        auVar230._16_4_ = fVar187;
        auVar230._20_4_ = fVar187;
        auVar230._24_4_ = fVar187;
        auVar230._28_4_ = fVar187;
        uVar99 = vcmpps_avx512vl(auVar124,auVar230,1);
        bVar17 = (bool)((byte)uVar99 & 1);
        auVar136._0_4_ = (float)((uint)bVar17 * auVar121._0_4_ | (uint)!bVar17 * auVar116._0_4_);
        bVar17 = (bool)((byte)(uVar99 >> 1) & 1);
        auVar136._4_4_ = (float)((uint)bVar17 * auVar121._4_4_ | (uint)!bVar17 * auVar116._4_4_);
        bVar17 = (bool)((byte)(uVar99 >> 2) & 1);
        auVar136._8_4_ = (float)((uint)bVar17 * auVar121._8_4_ | (uint)!bVar17 * auVar116._8_4_);
        bVar17 = (bool)((byte)(uVar99 >> 3) & 1);
        auVar136._12_4_ = (float)((uint)bVar17 * auVar121._12_4_ | (uint)!bVar17 * auVar116._12_4_);
        fVar170 = (float)((uint)((byte)(uVar99 >> 4) & 1) * auVar121._16_4_);
        auVar136._16_4_ = fVar170;
        fVar187 = (float)((uint)((byte)(uVar99 >> 5) & 1) * auVar121._20_4_);
        auVar136._20_4_ = fVar187;
        fVar183 = (float)((uint)((byte)(uVar99 >> 6) & 1) * auVar121._24_4_);
        auVar136._24_4_ = fVar183;
        uVar100 = (uint)(byte)(uVar99 >> 7) * auVar121._28_4_;
        auVar136._28_4_ = uVar100;
        bVar17 = (bool)((byte)uVar99 & 1);
        auVar137._0_4_ = (float)((uint)bVar17 * auVar129._0_4_ | (uint)!bVar17 * auVar125._0_4_);
        bVar17 = (bool)((byte)(uVar99 >> 1) & 1);
        auVar137._4_4_ = (float)((uint)bVar17 * auVar129._4_4_ | (uint)!bVar17 * auVar125._4_4_);
        bVar17 = (bool)((byte)(uVar99 >> 2) & 1);
        auVar137._8_4_ = (float)((uint)bVar17 * auVar129._8_4_ | (uint)!bVar17 * auVar125._8_4_);
        bVar17 = (bool)((byte)(uVar99 >> 3) & 1);
        auVar137._12_4_ = (float)((uint)bVar17 * auVar129._12_4_ | (uint)!bVar17 * auVar125._12_4_);
        bVar17 = (bool)((byte)(uVar99 >> 4) & 1);
        auVar137._16_4_ = (float)((uint)bVar17 * auVar129._16_4_ | (uint)!bVar17 * auVar125._16_4_);
        bVar17 = (bool)((byte)(uVar99 >> 5) & 1);
        auVar137._20_4_ = (float)((uint)bVar17 * auVar129._20_4_ | (uint)!bVar17 * auVar125._20_4_);
        bVar17 = (bool)((byte)(uVar99 >> 6) & 1);
        auVar137._24_4_ = (float)((uint)bVar17 * auVar129._24_4_ | (uint)!bVar17 * auVar125._24_4_);
        bVar17 = SUB81(uVar99 >> 7,0);
        auVar137._28_4_ = (uint)bVar17 * auVar129._28_4_ | (uint)!bVar17 * auVar125._28_4_;
        auVar124 = vandps_avx(auVar235,ZEXT1632(auVar117));
        auVar122 = vandps_avx(auVar135,auVar235);
        auVar122 = vmaxps_avx(auVar124,auVar122);
        auVar124 = vandps_avx(auVar134,auVar235);
        auVar124 = vmaxps_avx(auVar122,auVar124);
        uVar99 = vcmpps_avx512vl(auVar124,auVar230,1);
        bVar17 = (bool)((byte)uVar99 & 1);
        auVar138._0_4_ = (float)((uint)bVar17 * auVar121._0_4_ | (uint)!bVar17 * auVar117._0_4_);
        bVar17 = (bool)((byte)(uVar99 >> 1) & 1);
        auVar138._4_4_ = (float)((uint)bVar17 * auVar121._4_4_ | (uint)!bVar17 * auVar117._4_4_);
        bVar17 = (bool)((byte)(uVar99 >> 2) & 1);
        auVar138._8_4_ = (float)((uint)bVar17 * auVar121._8_4_ | (uint)!bVar17 * auVar117._8_4_);
        bVar17 = (bool)((byte)(uVar99 >> 3) & 1);
        auVar138._12_4_ = (float)((uint)bVar17 * auVar121._12_4_ | (uint)!bVar17 * auVar117._12_4_);
        fVar184 = (float)((uint)((byte)(uVar99 >> 4) & 1) * auVar121._16_4_);
        auVar138._16_4_ = fVar184;
        fVar194 = (float)((uint)((byte)(uVar99 >> 5) & 1) * auVar121._20_4_);
        auVar138._20_4_ = fVar194;
        fVar208 = (float)((uint)((byte)(uVar99 >> 6) & 1) * auVar121._24_4_);
        auVar138._24_4_ = fVar208;
        auVar138._28_4_ = (uint)(byte)(uVar99 >> 7) * auVar121._28_4_;
        bVar17 = (bool)((byte)uVar99 & 1);
        auVar139._0_4_ = (float)((uint)bVar17 * auVar129._0_4_ | (uint)!bVar17 * auVar135._0_4_);
        bVar17 = (bool)((byte)(uVar99 >> 1) & 1);
        auVar139._4_4_ = (float)((uint)bVar17 * auVar129._4_4_ | (uint)!bVar17 * auVar135._4_4_);
        bVar17 = (bool)((byte)(uVar99 >> 2) & 1);
        auVar139._8_4_ = (float)((uint)bVar17 * auVar129._8_4_ | (uint)!bVar17 * auVar135._8_4_);
        bVar17 = (bool)((byte)(uVar99 >> 3) & 1);
        auVar139._12_4_ = (float)((uint)bVar17 * auVar129._12_4_ | (uint)!bVar17 * auVar135._12_4_);
        bVar17 = (bool)((byte)(uVar99 >> 4) & 1);
        auVar139._16_4_ = (float)((uint)bVar17 * auVar129._16_4_ | (uint)!bVar17 * auVar135._16_4_);
        bVar17 = (bool)((byte)(uVar99 >> 5) & 1);
        auVar139._20_4_ = (float)((uint)bVar17 * auVar129._20_4_ | (uint)!bVar17 * auVar135._20_4_);
        bVar17 = (bool)((byte)(uVar99 >> 6) & 1);
        auVar139._24_4_ = (float)((uint)bVar17 * auVar129._24_4_ | (uint)!bVar17 * auVar135._24_4_);
        bVar17 = SUB81(uVar99 >> 7,0);
        auVar139._28_4_ = (uint)bVar17 * auVar129._28_4_ | (uint)!bVar17 * auVar135._28_4_;
        auVar118 = vxorps_avx512vl(auVar118,auVar118);
        auVar124 = vfmadd213ps_avx512vl(auVar136,auVar136,ZEXT1632(auVar118));
        auVar116 = vfmadd231ps_fma(auVar124,auVar137,auVar137);
        auVar124 = vrsqrt14ps_avx512vl(ZEXT1632(auVar116));
        fVar109 = auVar124._0_4_;
        fVar110 = auVar124._4_4_;
        fVar193 = auVar124._8_4_;
        fVar162 = auVar124._12_4_;
        fVar163 = auVar124._16_4_;
        fVar164 = auVar124._20_4_;
        fVar166 = auVar124._24_4_;
        auVar47._4_4_ = fVar110 * fVar110 * fVar110 * auVar116._4_4_ * -0.5;
        auVar47._0_4_ = fVar109 * fVar109 * fVar109 * auVar116._0_4_ * -0.5;
        auVar47._8_4_ = fVar193 * fVar193 * fVar193 * auVar116._8_4_ * -0.5;
        auVar47._12_4_ = fVar162 * fVar162 * fVar162 * auVar116._12_4_ * -0.5;
        auVar47._16_4_ = fVar163 * fVar163 * fVar163 * -0.0;
        auVar47._20_4_ = fVar164 * fVar164 * fVar164 * -0.0;
        auVar47._24_4_ = fVar166 * fVar166 * fVar166 * -0.0;
        auVar47._28_4_ = 0;
        auVar122 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
        auVar135 = vfmadd231ps_avx512vl(auVar47,auVar122,auVar124);
        auVar48._4_4_ = auVar137._4_4_ * auVar135._4_4_;
        auVar48._0_4_ = auVar137._0_4_ * auVar135._0_4_;
        auVar48._8_4_ = auVar137._8_4_ * auVar135._8_4_;
        auVar48._12_4_ = auVar137._12_4_ * auVar135._12_4_;
        auVar48._16_4_ = auVar137._16_4_ * auVar135._16_4_;
        auVar48._20_4_ = auVar137._20_4_ * auVar135._20_4_;
        auVar48._24_4_ = auVar137._24_4_ * auVar135._24_4_;
        auVar48._28_4_ = auVar124._28_4_;
        auVar49._4_4_ = auVar135._4_4_ * -auVar136._4_4_;
        auVar49._0_4_ = auVar135._0_4_ * -auVar136._0_4_;
        auVar49._8_4_ = auVar135._8_4_ * -auVar136._8_4_;
        auVar49._12_4_ = auVar135._12_4_ * -auVar136._12_4_;
        auVar49._16_4_ = auVar135._16_4_ * -fVar170;
        auVar49._20_4_ = auVar135._20_4_ * -fVar187;
        auVar49._24_4_ = auVar135._24_4_ * -fVar183;
        auVar49._28_4_ = uVar100 ^ 0x80000000;
        auVar124 = vmulps_avx512vl(auVar135,ZEXT1632(auVar118));
        auVar133 = ZEXT1632(auVar118);
        auVar134 = vfmadd213ps_avx512vl(auVar138,auVar138,auVar133);
        auVar116 = vfmadd231ps_fma(auVar134,auVar139,auVar139);
        auVar134 = vrsqrt14ps_avx512vl(ZEXT1632(auVar116));
        fVar187 = auVar134._0_4_;
        fVar170 = auVar134._4_4_;
        fVar183 = auVar134._8_4_;
        fVar109 = auVar134._12_4_;
        fVar110 = auVar134._16_4_;
        fVar193 = auVar134._20_4_;
        fVar162 = auVar134._24_4_;
        auVar50._4_4_ = fVar170 * fVar170 * fVar170 * auVar116._4_4_ * -0.5;
        auVar50._0_4_ = fVar187 * fVar187 * fVar187 * auVar116._0_4_ * -0.5;
        auVar50._8_4_ = fVar183 * fVar183 * fVar183 * auVar116._8_4_ * -0.5;
        auVar50._12_4_ = fVar109 * fVar109 * fVar109 * auVar116._12_4_ * -0.5;
        auVar50._16_4_ = fVar110 * fVar110 * fVar110 * -0.0;
        auVar50._20_4_ = fVar193 * fVar193 * fVar193 * -0.0;
        auVar50._24_4_ = fVar162 * fVar162 * fVar162 * -0.0;
        auVar50._28_4_ = 0;
        auVar122 = vfmadd231ps_avx512vl(auVar50,auVar122,auVar134);
        auVar51._4_4_ = auVar139._4_4_ * auVar122._4_4_;
        auVar51._0_4_ = auVar139._0_4_ * auVar122._0_4_;
        auVar51._8_4_ = auVar139._8_4_ * auVar122._8_4_;
        auVar51._12_4_ = auVar139._12_4_ * auVar122._12_4_;
        auVar51._16_4_ = auVar139._16_4_ * auVar122._16_4_;
        auVar51._20_4_ = auVar139._20_4_ * auVar122._20_4_;
        auVar51._24_4_ = auVar139._24_4_ * auVar122._24_4_;
        auVar51._28_4_ = auVar134._28_4_;
        auVar52._4_4_ = -auVar138._4_4_ * auVar122._4_4_;
        auVar52._0_4_ = -auVar138._0_4_ * auVar122._0_4_;
        auVar52._8_4_ = -auVar138._8_4_ * auVar122._8_4_;
        auVar52._12_4_ = -auVar138._12_4_ * auVar122._12_4_;
        auVar52._16_4_ = -fVar184 * auVar122._16_4_;
        auVar52._20_4_ = -fVar194 * auVar122._20_4_;
        auVar52._24_4_ = -fVar208 * auVar122._24_4_;
        auVar52._28_4_ = auVar135._28_4_;
        auVar122 = vmulps_avx512vl(auVar122,auVar133);
        auVar116 = vfmadd213ps_fma(auVar48,auVar119,auVar127);
        auVar117 = vfmadd213ps_fma(auVar49,auVar119,auVar128);
        auVar135 = vfmadd213ps_avx512vl(auVar124,auVar119,auVar126);
        auVar134 = vfmadd213ps_avx512vl(auVar51,auVar120,ZEXT1632(auVar203));
        auVar224 = vfnmadd213ps_fma(auVar48,auVar119,auVar127);
        auVar115 = vfmadd213ps_fma(auVar52,auVar120,ZEXT1632(auVar112));
        auVar195 = vfnmadd213ps_fma(auVar49,auVar119,auVar128);
        auVar114 = vfmadd213ps_fma(auVar122,auVar120,auVar123);
        auVar125 = vfnmadd231ps_avx512vl(auVar126,auVar119,auVar124);
        auVar38 = vfnmadd213ps_fma(auVar51,auVar120,ZEXT1632(auVar203));
        auVar112 = vfnmadd213ps_fma(auVar52,auVar120,ZEXT1632(auVar112));
        auVar113 = vfnmadd231ps_fma(auVar123,auVar120,auVar122);
        auVar122 = vsubps_avx512vl(auVar134,ZEXT1632(auVar224));
        auVar124 = vsubps_avx(ZEXT1632(auVar115),ZEXT1632(auVar195));
        auVar123 = vsubps_avx512vl(ZEXT1632(auVar114),auVar125);
        auVar126 = vmulps_avx512vl(auVar124,auVar125);
        auVar203 = vfmsub231ps_fma(auVar126,ZEXT1632(auVar195),auVar123);
        auVar53._4_4_ = auVar224._4_4_ * auVar123._4_4_;
        auVar53._0_4_ = auVar224._0_4_ * auVar123._0_4_;
        auVar53._8_4_ = auVar224._8_4_ * auVar123._8_4_;
        auVar53._12_4_ = auVar224._12_4_ * auVar123._12_4_;
        auVar53._16_4_ = auVar123._16_4_ * 0.0;
        auVar53._20_4_ = auVar123._20_4_ * 0.0;
        auVar53._24_4_ = auVar123._24_4_ * 0.0;
        auVar53._28_4_ = auVar123._28_4_;
        auVar123 = vfmsub231ps_avx512vl(auVar53,auVar125,auVar122);
        auVar54._4_4_ = auVar195._4_4_ * auVar122._4_4_;
        auVar54._0_4_ = auVar195._0_4_ * auVar122._0_4_;
        auVar54._8_4_ = auVar195._8_4_ * auVar122._8_4_;
        auVar54._12_4_ = auVar195._12_4_ * auVar122._12_4_;
        auVar54._16_4_ = auVar122._16_4_ * 0.0;
        auVar54._20_4_ = auVar122._20_4_ * 0.0;
        auVar54._24_4_ = auVar122._24_4_ * 0.0;
        auVar54._28_4_ = auVar122._28_4_;
        auVar111 = vfmsub231ps_fma(auVar54,ZEXT1632(auVar224),auVar124);
        auVar124 = vfmadd231ps_avx512vl(ZEXT1632(auVar111),auVar133,auVar123);
        auVar124 = vfmadd231ps_avx512vl(auVar124,auVar133,ZEXT1632(auVar203));
        auVar129 = ZEXT1632(auVar118);
        uVar99 = vcmpps_avx512vl(auVar124,auVar129,2);
        bVar98 = (byte)uVar99;
        fVar109 = (float)((uint)(bVar98 & 1) * auVar116._0_4_ |
                         (uint)!(bool)(bVar98 & 1) * auVar38._0_4_);
        bVar17 = (bool)((byte)(uVar99 >> 1) & 1);
        fVar193 = (float)((uint)bVar17 * auVar116._4_4_ | (uint)!bVar17 * auVar38._4_4_);
        bVar17 = (bool)((byte)(uVar99 >> 2) & 1);
        fVar163 = (float)((uint)bVar17 * auVar116._8_4_ | (uint)!bVar17 * auVar38._8_4_);
        bVar17 = (bool)((byte)(uVar99 >> 3) & 1);
        fVar166 = (float)((uint)bVar17 * auVar116._12_4_ | (uint)!bVar17 * auVar38._12_4_);
        auVar126 = ZEXT1632(CONCAT412(fVar166,CONCAT48(fVar163,CONCAT44(fVar193,fVar109))));
        fVar110 = (float)((uint)(bVar98 & 1) * auVar117._0_4_ |
                         (uint)!(bool)(bVar98 & 1) * auVar112._0_4_);
        bVar17 = (bool)((byte)(uVar99 >> 1) & 1);
        fVar162 = (float)((uint)bVar17 * auVar117._4_4_ | (uint)!bVar17 * auVar112._4_4_);
        bVar17 = (bool)((byte)(uVar99 >> 2) & 1);
        fVar164 = (float)((uint)bVar17 * auVar117._8_4_ | (uint)!bVar17 * auVar112._8_4_);
        bVar17 = (bool)((byte)(uVar99 >> 3) & 1);
        fVar167 = (float)((uint)bVar17 * auVar117._12_4_ | (uint)!bVar17 * auVar112._12_4_);
        auVar133 = ZEXT1632(CONCAT412(fVar167,CONCAT48(fVar164,CONCAT44(fVar162,fVar110))));
        auVar140._0_4_ =
             (float)((uint)(bVar98 & 1) * auVar135._0_4_ |
                    (uint)!(bool)(bVar98 & 1) * auVar113._0_4_);
        bVar17 = (bool)((byte)(uVar99 >> 1) & 1);
        auVar140._4_4_ = (float)((uint)bVar17 * auVar135._4_4_ | (uint)!bVar17 * auVar113._4_4_);
        bVar17 = (bool)((byte)(uVar99 >> 2) & 1);
        auVar140._8_4_ = (float)((uint)bVar17 * auVar135._8_4_ | (uint)!bVar17 * auVar113._8_4_);
        bVar17 = (bool)((byte)(uVar99 >> 3) & 1);
        auVar140._12_4_ = (float)((uint)bVar17 * auVar135._12_4_ | (uint)!bVar17 * auVar113._12_4_);
        fVar170 = (float)((uint)((byte)(uVar99 >> 4) & 1) * auVar135._16_4_);
        auVar140._16_4_ = fVar170;
        fVar183 = (float)((uint)((byte)(uVar99 >> 5) & 1) * auVar135._20_4_);
        auVar140._20_4_ = fVar183;
        fVar187 = (float)((uint)((byte)(uVar99 >> 6) & 1) * auVar135._24_4_);
        auVar140._24_4_ = fVar187;
        iVar1 = (uint)(byte)(uVar99 >> 7) * auVar135._28_4_;
        auVar140._28_4_ = iVar1;
        auVar122 = vblendmps_avx512vl(ZEXT1632(auVar224),auVar134);
        auVar141._0_4_ =
             (uint)(bVar98 & 1) * auVar122._0_4_ | (uint)!(bool)(bVar98 & 1) * auVar203._0_4_;
        bVar17 = (bool)((byte)(uVar99 >> 1) & 1);
        auVar141._4_4_ = (uint)bVar17 * auVar122._4_4_ | (uint)!bVar17 * auVar203._4_4_;
        bVar17 = (bool)((byte)(uVar99 >> 2) & 1);
        auVar141._8_4_ = (uint)bVar17 * auVar122._8_4_ | (uint)!bVar17 * auVar203._8_4_;
        bVar17 = (bool)((byte)(uVar99 >> 3) & 1);
        auVar141._12_4_ = (uint)bVar17 * auVar122._12_4_ | (uint)!bVar17 * auVar203._12_4_;
        auVar141._16_4_ = (uint)((byte)(uVar99 >> 4) & 1) * auVar122._16_4_;
        auVar141._20_4_ = (uint)((byte)(uVar99 >> 5) & 1) * auVar122._20_4_;
        auVar141._24_4_ = (uint)((byte)(uVar99 >> 6) & 1) * auVar122._24_4_;
        auVar141._28_4_ = (uint)(byte)(uVar99 >> 7) * auVar122._28_4_;
        auVar122 = vblendmps_avx512vl(ZEXT1632(auVar195),ZEXT1632(auVar115));
        auVar142._0_4_ =
             (float)((uint)(bVar98 & 1) * auVar122._0_4_ |
                    (uint)!(bool)(bVar98 & 1) * auVar117._0_4_);
        bVar17 = (bool)((byte)(uVar99 >> 1) & 1);
        auVar142._4_4_ = (float)((uint)bVar17 * auVar122._4_4_ | (uint)!bVar17 * auVar117._4_4_);
        bVar17 = (bool)((byte)(uVar99 >> 2) & 1);
        auVar142._8_4_ = (float)((uint)bVar17 * auVar122._8_4_ | (uint)!bVar17 * auVar117._8_4_);
        bVar17 = (bool)((byte)(uVar99 >> 3) & 1);
        auVar142._12_4_ = (float)((uint)bVar17 * auVar122._12_4_ | (uint)!bVar17 * auVar117._12_4_);
        fVar208 = (float)((uint)((byte)(uVar99 >> 4) & 1) * auVar122._16_4_);
        auVar142._16_4_ = fVar208;
        fVar194 = (float)((uint)((byte)(uVar99 >> 5) & 1) * auVar122._20_4_);
        auVar142._20_4_ = fVar194;
        fVar184 = (float)((uint)((byte)(uVar99 >> 6) & 1) * auVar122._24_4_);
        auVar142._24_4_ = fVar184;
        auVar142._28_4_ = (uint)(byte)(uVar99 >> 7) * auVar122._28_4_;
        auVar122 = vblendmps_avx512vl(auVar125,ZEXT1632(auVar114));
        auVar143._0_4_ =
             (float)((uint)(bVar98 & 1) * auVar122._0_4_ |
                    (uint)!(bool)(bVar98 & 1) * auVar135._0_4_);
        bVar17 = (bool)((byte)(uVar99 >> 1) & 1);
        auVar143._4_4_ = (float)((uint)bVar17 * auVar122._4_4_ | (uint)!bVar17 * auVar135._4_4_);
        bVar17 = (bool)((byte)(uVar99 >> 2) & 1);
        auVar143._8_4_ = (float)((uint)bVar17 * auVar122._8_4_ | (uint)!bVar17 * auVar135._8_4_);
        bVar17 = (bool)((byte)(uVar99 >> 3) & 1);
        auVar143._12_4_ = (float)((uint)bVar17 * auVar122._12_4_ | (uint)!bVar17 * auVar135._12_4_);
        bVar17 = (bool)((byte)(uVar99 >> 4) & 1);
        auVar143._16_4_ = (float)((uint)bVar17 * auVar122._16_4_ | (uint)!bVar17 * auVar135._16_4_);
        bVar17 = (bool)((byte)(uVar99 >> 5) & 1);
        auVar143._20_4_ = (float)((uint)bVar17 * auVar122._20_4_ | (uint)!bVar17 * auVar135._20_4_);
        bVar17 = (bool)((byte)(uVar99 >> 6) & 1);
        auVar143._24_4_ = (float)((uint)bVar17 * auVar122._24_4_ | (uint)!bVar17 * auVar135._24_4_);
        bVar17 = SUB81(uVar99 >> 7,0);
        auVar143._28_4_ = (uint)bVar17 * auVar122._28_4_ | (uint)!bVar17 * auVar135._28_4_;
        auVar144._0_4_ =
             (uint)(bVar98 & 1) * (int)auVar224._0_4_ | (uint)!(bool)(bVar98 & 1) * auVar134._0_4_;
        bVar17 = (bool)((byte)(uVar99 >> 1) & 1);
        auVar144._4_4_ = (uint)bVar17 * (int)auVar224._4_4_ | (uint)!bVar17 * auVar134._4_4_;
        bVar17 = (bool)((byte)(uVar99 >> 2) & 1);
        auVar144._8_4_ = (uint)bVar17 * (int)auVar224._8_4_ | (uint)!bVar17 * auVar134._8_4_;
        bVar17 = (bool)((byte)(uVar99 >> 3) & 1);
        auVar144._12_4_ = (uint)bVar17 * (int)auVar224._12_4_ | (uint)!bVar17 * auVar134._12_4_;
        auVar144._16_4_ = (uint)!(bool)((byte)(uVar99 >> 4) & 1) * auVar134._16_4_;
        auVar144._20_4_ = (uint)!(bool)((byte)(uVar99 >> 5) & 1) * auVar134._20_4_;
        auVar144._24_4_ = (uint)!(bool)((byte)(uVar99 >> 6) & 1) * auVar134._24_4_;
        auVar144._28_4_ = (uint)!SUB81(uVar99 >> 7,0) * auVar134._28_4_;
        bVar17 = (bool)((byte)(uVar99 >> 1) & 1);
        bVar19 = (bool)((byte)(uVar99 >> 2) & 1);
        bVar20 = (bool)((byte)(uVar99 >> 3) & 1);
        auVar145._0_4_ =
             (uint)(bVar98 & 1) * auVar125._0_4_ | (uint)!(bool)(bVar98 & 1) * auVar114._0_4_;
        bVar18 = (bool)((byte)(uVar99 >> 1) & 1);
        auVar145._4_4_ = (uint)bVar18 * auVar125._4_4_ | (uint)!bVar18 * auVar114._4_4_;
        bVar18 = (bool)((byte)(uVar99 >> 2) & 1);
        auVar145._8_4_ = (uint)bVar18 * auVar125._8_4_ | (uint)!bVar18 * auVar114._8_4_;
        bVar18 = (bool)((byte)(uVar99 >> 3) & 1);
        auVar145._12_4_ = (uint)bVar18 * auVar125._12_4_ | (uint)!bVar18 * auVar114._12_4_;
        auVar145._16_4_ = (uint)((byte)(uVar99 >> 4) & 1) * auVar125._16_4_;
        auVar145._20_4_ = (uint)((byte)(uVar99 >> 5) & 1) * auVar125._20_4_;
        auVar145._24_4_ = (uint)((byte)(uVar99 >> 6) & 1) * auVar125._24_4_;
        iVar2 = (uint)(byte)(uVar99 >> 7) * auVar125._28_4_;
        auVar145._28_4_ = iVar2;
        auVar127 = vsubps_avx512vl(auVar144,auVar126);
        auVar122 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar20 * (int)auVar195._12_4_ |
                                                 (uint)!bVar20 * auVar115._12_4_,
                                                 CONCAT48((uint)bVar19 * (int)auVar195._8_4_ |
                                                          (uint)!bVar19 * auVar115._8_4_,
                                                          CONCAT44((uint)bVar17 *
                                                                   (int)auVar195._4_4_ |
                                                                   (uint)!bVar17 * auVar115._4_4_,
                                                                   (uint)(bVar98 & 1) *
                                                                   (int)auVar195._0_4_ |
                                                                   (uint)!(bool)(bVar98 & 1) *
                                                                   auVar115._0_4_)))),auVar133);
        auVar219 = ZEXT3264(auVar122);
        auVar135 = vsubps_avx(auVar145,auVar140);
        auVar134 = vsubps_avx(auVar126,auVar141);
        auVar223 = ZEXT3264(auVar134);
        auVar125 = vsubps_avx(auVar133,auVar142);
        auVar123 = vsubps_avx(auVar140,auVar143);
        auVar55._4_4_ = auVar135._4_4_ * fVar193;
        auVar55._0_4_ = auVar135._0_4_ * fVar109;
        auVar55._8_4_ = auVar135._8_4_ * fVar163;
        auVar55._12_4_ = auVar135._12_4_ * fVar166;
        auVar55._16_4_ = auVar135._16_4_ * 0.0;
        auVar55._20_4_ = auVar135._20_4_ * 0.0;
        auVar55._24_4_ = auVar135._24_4_ * 0.0;
        auVar55._28_4_ = iVar2;
        auVar116 = vfmsub231ps_fma(auVar55,auVar140,auVar127);
        auVar56._4_4_ = fVar162 * auVar127._4_4_;
        auVar56._0_4_ = fVar110 * auVar127._0_4_;
        auVar56._8_4_ = fVar164 * auVar127._8_4_;
        auVar56._12_4_ = fVar167 * auVar127._12_4_;
        auVar56._16_4_ = auVar127._16_4_ * 0.0;
        auVar56._20_4_ = auVar127._20_4_ * 0.0;
        auVar56._24_4_ = auVar127._24_4_ * 0.0;
        auVar56._28_4_ = auVar124._28_4_;
        auVar117 = vfmsub231ps_fma(auVar56,auVar126,auVar122);
        auVar124 = vfmadd231ps_avx512vl(ZEXT1632(auVar117),auVar129,ZEXT1632(auVar116));
        auVar210._0_4_ = auVar122._0_4_ * auVar140._0_4_;
        auVar210._4_4_ = auVar122._4_4_ * auVar140._4_4_;
        auVar210._8_4_ = auVar122._8_4_ * auVar140._8_4_;
        auVar210._12_4_ = auVar122._12_4_ * auVar140._12_4_;
        auVar210._16_4_ = auVar122._16_4_ * fVar170;
        auVar210._20_4_ = auVar122._20_4_ * fVar183;
        auVar210._24_4_ = auVar122._24_4_ * fVar187;
        auVar210._28_4_ = 0;
        auVar116 = vfmsub231ps_fma(auVar210,auVar133,auVar135);
        auVar128 = vfmadd231ps_avx512vl(auVar124,auVar129,ZEXT1632(auVar116));
        auVar124 = vmulps_avx512vl(auVar123,auVar141);
        auVar124 = vfmsub231ps_avx512vl(auVar124,auVar134,auVar143);
        auVar57._4_4_ = auVar125._4_4_ * auVar143._4_4_;
        auVar57._0_4_ = auVar125._0_4_ * auVar143._0_4_;
        auVar57._8_4_ = auVar125._8_4_ * auVar143._8_4_;
        auVar57._12_4_ = auVar125._12_4_ * auVar143._12_4_;
        auVar57._16_4_ = auVar125._16_4_ * auVar143._16_4_;
        auVar57._20_4_ = auVar125._20_4_ * auVar143._20_4_;
        auVar57._24_4_ = auVar125._24_4_ * auVar143._24_4_;
        auVar57._28_4_ = auVar143._28_4_;
        auVar116 = vfmsub231ps_fma(auVar57,auVar142,auVar123);
        auVar211._0_4_ = auVar142._0_4_ * auVar134._0_4_;
        auVar211._4_4_ = auVar142._4_4_ * auVar134._4_4_;
        auVar211._8_4_ = auVar142._8_4_ * auVar134._8_4_;
        auVar211._12_4_ = auVar142._12_4_ * auVar134._12_4_;
        auVar211._16_4_ = fVar208 * auVar134._16_4_;
        auVar211._20_4_ = fVar194 * auVar134._20_4_;
        auVar211._24_4_ = fVar184 * auVar134._24_4_;
        auVar211._28_4_ = 0;
        auVar117 = vfmsub231ps_fma(auVar211,auVar125,auVar141);
        auVar124 = vfmadd231ps_avx512vl(ZEXT1632(auVar117),auVar129,auVar124);
        auVar121 = vfmadd231ps_avx512vl(auVar124,auVar129,ZEXT1632(auVar116));
        auVar214 = ZEXT3264(auVar121);
        auVar124 = vmaxps_avx(auVar128,auVar121);
        uVar33 = vcmpps_avx512vl(auVar124,auVar129,2);
        bVar108 = bVar108 & (byte)uVar33;
        if (bVar108 != 0) {
          uVar171 = *(undefined4 *)(ray + k * 4 + 0x200);
          auVar236._4_4_ = uVar171;
          auVar236._0_4_ = uVar171;
          auVar236._8_4_ = uVar171;
          auVar236._12_4_ = uVar171;
          auVar236._16_4_ = uVar171;
          auVar236._20_4_ = uVar171;
          auVar236._24_4_ = uVar171;
          auVar236._28_4_ = uVar171;
          auVar239 = ZEXT3264(auVar236);
          auVar58._4_4_ = auVar123._4_4_ * auVar122._4_4_;
          auVar58._0_4_ = auVar123._0_4_ * auVar122._0_4_;
          auVar58._8_4_ = auVar123._8_4_ * auVar122._8_4_;
          auVar58._12_4_ = auVar123._12_4_ * auVar122._12_4_;
          auVar58._16_4_ = auVar123._16_4_ * auVar122._16_4_;
          auVar58._20_4_ = auVar123._20_4_ * auVar122._20_4_;
          auVar58._24_4_ = auVar123._24_4_ * auVar122._24_4_;
          auVar58._28_4_ = auVar124._28_4_;
          auVar203 = vfmsub231ps_fma(auVar58,auVar125,auVar135);
          auVar59._4_4_ = auVar135._4_4_ * auVar134._4_4_;
          auVar59._0_4_ = auVar135._0_4_ * auVar134._0_4_;
          auVar59._8_4_ = auVar135._8_4_ * auVar134._8_4_;
          auVar59._12_4_ = auVar135._12_4_ * auVar134._12_4_;
          auVar59._16_4_ = auVar135._16_4_ * auVar134._16_4_;
          auVar59._20_4_ = auVar135._20_4_ * auVar134._20_4_;
          auVar59._24_4_ = auVar135._24_4_ * auVar134._24_4_;
          auVar59._28_4_ = auVar135._28_4_;
          auVar115 = vfmsub231ps_fma(auVar59,auVar127,auVar123);
          auVar60._4_4_ = auVar125._4_4_ * auVar127._4_4_;
          auVar60._0_4_ = auVar125._0_4_ * auVar127._0_4_;
          auVar60._8_4_ = auVar125._8_4_ * auVar127._8_4_;
          auVar60._12_4_ = auVar125._12_4_ * auVar127._12_4_;
          auVar60._16_4_ = auVar125._16_4_ * auVar127._16_4_;
          auVar60._20_4_ = auVar125._20_4_ * auVar127._20_4_;
          auVar60._24_4_ = auVar125._24_4_ * auVar127._24_4_;
          auVar60._28_4_ = auVar125._28_4_;
          auVar114 = vfmsub231ps_fma(auVar60,auVar134,auVar122);
          auVar116 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar115),ZEXT1632(auVar114));
          auVar117 = vfmadd231ps_fma(ZEXT1632(auVar116),ZEXT1632(auVar203),
                                     ZEXT1232(ZEXT412(0)) << 0x20);
          auVar124 = vrcp14ps_avx512vl(ZEXT1632(auVar117));
          auVar223 = ZEXT3264(auVar124);
          auVar39._8_4_ = 0x3f800000;
          auVar39._0_8_ = 0x3f8000003f800000;
          auVar39._12_4_ = 0x3f800000;
          auVar39._16_4_ = 0x3f800000;
          auVar39._20_4_ = 0x3f800000;
          auVar39._24_4_ = 0x3f800000;
          auVar39._28_4_ = 0x3f800000;
          auVar122 = vfnmadd213ps_avx512vl(auVar124,ZEXT1632(auVar117),auVar39);
          auVar116 = vfmadd132ps_fma(auVar122,auVar124,auVar124);
          auVar219 = ZEXT1664(auVar116);
          auVar61._4_4_ = auVar114._4_4_ * auVar140._4_4_;
          auVar61._0_4_ = auVar114._0_4_ * auVar140._0_4_;
          auVar61._8_4_ = auVar114._8_4_ * auVar140._8_4_;
          auVar61._12_4_ = auVar114._12_4_ * auVar140._12_4_;
          auVar61._16_4_ = fVar170 * 0.0;
          auVar61._20_4_ = fVar183 * 0.0;
          auVar61._24_4_ = fVar187 * 0.0;
          auVar61._28_4_ = iVar1;
          auVar115 = vfmadd231ps_fma(auVar61,auVar133,ZEXT1632(auVar115));
          auVar115 = vfmadd231ps_fma(ZEXT1632(auVar115),auVar126,ZEXT1632(auVar203));
          fVar187 = auVar116._0_4_;
          fVar170 = auVar116._4_4_;
          fVar183 = auVar116._8_4_;
          fVar184 = auVar116._12_4_;
          local_580 = ZEXT1632(CONCAT412(auVar115._12_4_ * fVar184,
                                         CONCAT48(auVar115._8_4_ * fVar183,
                                                  CONCAT44(auVar115._4_4_ * fVar170,
                                                           auVar115._0_4_ * fVar187))));
          auVar228 = ZEXT3264(local_580);
          auVar174._4_4_ = local_720;
          auVar174._0_4_ = local_720;
          auVar174._8_4_ = local_720;
          auVar174._12_4_ = local_720;
          auVar174._16_4_ = local_720;
          auVar174._20_4_ = local_720;
          auVar174._24_4_ = local_720;
          auVar174._28_4_ = local_720;
          uVar33 = vcmpps_avx512vl(local_580,auVar236,2);
          uVar34 = vcmpps_avx512vl(auVar174,local_580,2);
          bVar108 = (byte)uVar33 & (byte)uVar34 & bVar108;
          if (bVar108 != 0) {
            uVar103 = vcmpps_avx512vl(ZEXT1632(auVar117),ZEXT1232(ZEXT412(0)) << 0x20,4);
            uVar103 = bVar108 & uVar103;
            if ((char)uVar103 != '\0') {
              fVar194 = auVar128._0_4_ * fVar187;
              fVar208 = auVar128._4_4_ * fVar170;
              auVar62._4_4_ = fVar208;
              auVar62._0_4_ = fVar194;
              fVar109 = auVar128._8_4_ * fVar183;
              auVar62._8_4_ = fVar109;
              fVar110 = auVar128._12_4_ * fVar184;
              auVar62._12_4_ = fVar110;
              fVar193 = auVar128._16_4_ * 0.0;
              auVar62._16_4_ = fVar193;
              fVar162 = auVar128._20_4_ * 0.0;
              auVar62._20_4_ = fVar162;
              fVar163 = auVar128._24_4_ * 0.0;
              auVar62._24_4_ = fVar163;
              auVar62._28_4_ = auVar128._28_4_;
              auVar175._8_4_ = 0x3f800000;
              auVar175._0_8_ = 0x3f8000003f800000;
              auVar175._12_4_ = 0x3f800000;
              auVar175._16_4_ = 0x3f800000;
              auVar175._20_4_ = 0x3f800000;
              auVar175._24_4_ = 0x3f800000;
              auVar175._28_4_ = 0x3f800000;
              auVar124 = vsubps_avx(auVar175,auVar62);
              local_5c0._0_4_ =
                   (float)((uint)(bVar98 & 1) * (int)fVar194 |
                          (uint)!(bool)(bVar98 & 1) * auVar124._0_4_);
              bVar17 = (bool)((byte)(uVar99 >> 1) & 1);
              local_5c0._4_4_ =
                   (float)((uint)bVar17 * (int)fVar208 | (uint)!bVar17 * auVar124._4_4_);
              bVar17 = (bool)((byte)(uVar99 >> 2) & 1);
              local_5c0._8_4_ =
                   (float)((uint)bVar17 * (int)fVar109 | (uint)!bVar17 * auVar124._8_4_);
              bVar17 = (bool)((byte)(uVar99 >> 3) & 1);
              local_5c0._12_4_ =
                   (float)((uint)bVar17 * (int)fVar110 | (uint)!bVar17 * auVar124._12_4_);
              bVar17 = (bool)((byte)(uVar99 >> 4) & 1);
              local_5c0._16_4_ =
                   (float)((uint)bVar17 * (int)fVar193 | (uint)!bVar17 * auVar124._16_4_);
              bVar17 = (bool)((byte)(uVar99 >> 5) & 1);
              local_5c0._20_4_ =
                   (float)((uint)bVar17 * (int)fVar162 | (uint)!bVar17 * auVar124._20_4_);
              bVar17 = (bool)((byte)(uVar99 >> 6) & 1);
              local_5c0._24_4_ =
                   (float)((uint)bVar17 * (int)fVar163 | (uint)!bVar17 * auVar124._24_4_);
              bVar17 = SUB81(uVar99 >> 7,0);
              local_5c0._28_4_ =
                   (float)((uint)bVar17 * auVar128._28_4_ | (uint)!bVar17 * auVar124._28_4_);
              auVar124 = vsubps_avx(auVar120,auVar119);
              auVar116 = vfmadd213ps_fma(auVar124,local_5c0,auVar119);
              uVar171 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x40);
              auVar40._4_4_ = uVar171;
              auVar40._0_4_ = uVar171;
              auVar40._8_4_ = uVar171;
              auVar40._12_4_ = uVar171;
              auVar40._16_4_ = uVar171;
              auVar40._20_4_ = uVar171;
              auVar40._24_4_ = uVar171;
              auVar40._28_4_ = uVar171;
              auVar124 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar116._12_4_ + auVar116._12_4_,
                                                            CONCAT48(auVar116._8_4_ + auVar116._8_4_
                                                                     ,CONCAT44(auVar116._4_4_ +
                                                                               auVar116._4_4_,
                                                                               auVar116._0_4_ +
                                                                               auVar116._0_4_)))),
                                         auVar40);
              uVar35 = vcmpps_avx512vl(local_580,auVar124,6);
              uVar103 = uVar103 & uVar35;
              bVar108 = (byte)uVar103;
              if (bVar108 != 0) {
                auVar191._0_4_ = auVar121._0_4_ * fVar187;
                auVar191._4_4_ = auVar121._4_4_ * fVar170;
                auVar191._8_4_ = auVar121._8_4_ * fVar183;
                auVar191._12_4_ = auVar121._12_4_ * fVar184;
                auVar191._16_4_ = auVar121._16_4_ * 0.0;
                auVar191._20_4_ = auVar121._20_4_ * 0.0;
                auVar191._24_4_ = auVar121._24_4_ * 0.0;
                auVar191._28_4_ = 0;
                auVar205._8_4_ = 0x3f800000;
                auVar205._0_8_ = 0x3f8000003f800000;
                auVar205._12_4_ = 0x3f800000;
                auVar205._16_4_ = 0x3f800000;
                auVar205._20_4_ = 0x3f800000;
                auVar205._24_4_ = 0x3f800000;
                auVar205._28_4_ = 0x3f800000;
                auVar124 = vsubps_avx(auVar205,auVar191);
                auVar146._0_4_ =
                     (uint)(bVar98 & 1) * (int)auVar191._0_4_ |
                     (uint)!(bool)(bVar98 & 1) * auVar124._0_4_;
                bVar17 = (bool)((byte)(uVar99 >> 1) & 1);
                auVar146._4_4_ = (uint)bVar17 * (int)auVar191._4_4_ | (uint)!bVar17 * auVar124._4_4_
                ;
                bVar17 = (bool)((byte)(uVar99 >> 2) & 1);
                auVar146._8_4_ = (uint)bVar17 * (int)auVar191._8_4_ | (uint)!bVar17 * auVar124._8_4_
                ;
                bVar17 = (bool)((byte)(uVar99 >> 3) & 1);
                auVar146._12_4_ =
                     (uint)bVar17 * (int)auVar191._12_4_ | (uint)!bVar17 * auVar124._12_4_;
                bVar17 = (bool)((byte)(uVar99 >> 4) & 1);
                auVar146._16_4_ =
                     (uint)bVar17 * (int)auVar191._16_4_ | (uint)!bVar17 * auVar124._16_4_;
                bVar17 = (bool)((byte)(uVar99 >> 5) & 1);
                auVar146._20_4_ =
                     (uint)bVar17 * (int)auVar191._20_4_ | (uint)!bVar17 * auVar124._20_4_;
                bVar17 = (bool)((byte)(uVar99 >> 6) & 1);
                auVar146._24_4_ =
                     (uint)bVar17 * (int)auVar191._24_4_ | (uint)!bVar17 * auVar124._24_4_;
                auVar146._28_4_ = (uint)!SUB81(uVar99 >> 7,0) * auVar124._28_4_;
                auVar41._8_4_ = 0x40000000;
                auVar41._0_8_ = 0x4000000040000000;
                auVar41._12_4_ = 0x40000000;
                auVar41._16_4_ = 0x40000000;
                auVar41._20_4_ = 0x40000000;
                auVar41._24_4_ = 0x40000000;
                auVar41._28_4_ = 0x40000000;
                local_5a0 = vfmsub132ps_avx512vl(auVar146,auVar205,auVar41);
                local_560 = 0;
                if ((pGVar107->mask & *(uint *)(ray + k * 4 + 0x240)) != 0) {
                  fVar187 = 1.0 / auVar231._0_4_;
                  local_500[0] = fVar187 * (local_5c0._0_4_ + 0.0);
                  local_500[1] = fVar187 * (local_5c0._4_4_ + 1.0);
                  local_500[2] = fVar187 * (local_5c0._8_4_ + 2.0);
                  local_500[3] = fVar187 * (local_5c0._12_4_ + 3.0);
                  fStack_4f0 = fVar187 * (local_5c0._16_4_ + 4.0);
                  fStack_4ec = fVar187 * (local_5c0._20_4_ + 5.0);
                  fStack_4e8 = fVar187 * (local_5c0._24_4_ + 6.0);
                  fStack_4e4 = local_5c0._28_4_ + 7.0;
                  local_4e0 = local_5a0;
                  local_4c0 = local_580;
                  auVar176._8_4_ = 0x7f800000;
                  auVar176._0_8_ = 0x7f8000007f800000;
                  auVar176._12_4_ = 0x7f800000;
                  auVar176._16_4_ = 0x7f800000;
                  auVar176._20_4_ = 0x7f800000;
                  auVar176._24_4_ = 0x7f800000;
                  auVar176._28_4_ = 0x7f800000;
                  auVar124 = vblendmps_avx512vl(auVar176,local_580);
                  auVar147._0_4_ =
                       (uint)(bVar108 & 1) * auVar124._0_4_ |
                       (uint)!(bool)(bVar108 & 1) * 0x7f800000;
                  bVar17 = (bool)((byte)(uVar103 >> 1) & 1);
                  auVar147._4_4_ = (uint)bVar17 * auVar124._4_4_ | (uint)!bVar17 * 0x7f800000;
                  bVar17 = (bool)((byte)(uVar103 >> 2) & 1);
                  auVar147._8_4_ = (uint)bVar17 * auVar124._8_4_ | (uint)!bVar17 * 0x7f800000;
                  bVar17 = (bool)((byte)(uVar103 >> 3) & 1);
                  auVar147._12_4_ = (uint)bVar17 * auVar124._12_4_ | (uint)!bVar17 * 0x7f800000;
                  bVar17 = (bool)((byte)(uVar103 >> 4) & 1);
                  auVar147._16_4_ = (uint)bVar17 * auVar124._16_4_ | (uint)!bVar17 * 0x7f800000;
                  bVar17 = (bool)((byte)(uVar103 >> 5) & 1);
                  auVar147._20_4_ = (uint)bVar17 * auVar124._20_4_ | (uint)!bVar17 * 0x7f800000;
                  bVar17 = (bool)((byte)(uVar103 >> 6) & 1);
                  auVar147._24_4_ = (uint)bVar17 * auVar124._24_4_ | (uint)!bVar17 * 0x7f800000;
                  bVar17 = SUB81(uVar103 >> 7,0);
                  auVar147._28_4_ = (uint)bVar17 * auVar124._28_4_ | (uint)!bVar17 * 0x7f800000;
                  auVar124 = vshufps_avx(auVar147,auVar147,0xb1);
                  auVar124 = vminps_avx(auVar147,auVar124);
                  auVar122 = vshufpd_avx(auVar124,auVar124,5);
                  auVar124 = vminps_avx(auVar124,auVar122);
                  auVar122 = vpermpd_avx2(auVar124,0x4e);
                  auVar124 = vminps_avx(auVar124,auVar122);
                  uVar33 = vcmpps_avx512vl(auVar147,auVar124,0);
                  uVar100 = (uint)uVar103;
                  if (((byte)uVar33 & bVar108) != 0) {
                    uVar100 = (uint)((byte)uVar33 & bVar108);
                  }
                  uVar101 = 0;
                  for (; (uVar100 & 1) == 0; uVar100 = uVar100 >> 1 | 0x80000000) {
                    uVar101 = uVar101 + 1;
                  }
                  uVar99 = (ulong)uVar101;
                  if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                     (pGVar107->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                    auVar214 = vpbroadcastd_avx512f();
                    local_400 = vmovdqa64_avx512f(auVar214);
                    auVar214 = vpbroadcastd_avx512f();
                    local_480 = vmovdqa64_avx512f(auVar214);
                    local_800 = auVar130;
                    local_7c0 = local_580;
                    local_7a0 = pGVar107;
                    local_55c = iVar102;
                    local_550 = auVar31;
                    local_540 = uVar32;
                    uStack_538 = uVar36;
                    local_530 = uVar93;
                    uStack_528 = uVar94;
                    local_520 = uVar95;
                    uStack_518 = uVar96;
                    do {
                      local_200 = vbroadcastss_avx512f(ZEXT416((uint)local_500[uVar99]));
                      local_1c0 = vbroadcastss_avx512f(ZEXT416(*(uint *)(local_4e0 + uVar99 * 4)));
                      *(undefined4 *)(ray + k * 4 + 0x200) = *(undefined4 *)(local_4c0 + uVar99 * 4)
                      ;
                      local_840.context = context->user;
                      fVar170 = local_200._0_4_;
                      fVar187 = 1.0 - fVar170;
                      auVar203 = vfnmadd231ss_fma(ZEXT416((uint)(fVar170 * (fVar187 + fVar187))),
                                                  ZEXT416((uint)fVar187),ZEXT416((uint)fVar187));
                      auVar115 = local_200._0_16_;
                      auVar116 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar115,
                                                 ZEXT416(0xc0a00000));
                      auVar117 = vfmadd231ss_fma(ZEXT416((uint)(fVar170 * fVar170 * 3.0)),
                                                 ZEXT416((uint)(fVar170 + fVar170)),auVar116);
                      auVar223 = ZEXT1664(auVar117);
                      auVar116 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar115,
                                                 ZEXT416(0x40000000));
                      auVar116 = vfmadd231ss_fma(ZEXT416((uint)(fVar187 * fVar187 * -3.0)),
                                                 ZEXT416((uint)(fVar187 + fVar187)),auVar116);
                      auVar115 = vfmadd231ss_fma(ZEXT416((uint)(fVar170 * fVar170)),auVar115,
                                                 ZEXT416((uint)(fVar187 * -2.0)));
                      fVar187 = auVar203._0_4_ * 0.5;
                      fVar170 = auVar117._0_4_ * 0.5;
                      fVar183 = auVar116._0_4_ * 0.5;
                      fVar184 = auVar115._0_4_ * 0.5;
                      auVar203._0_4_ = fVar184 * local_880;
                      auVar203._4_4_ = fVar184 * fStack_87c;
                      auVar203._8_4_ = fVar184 * fStack_878;
                      auVar203._12_4_ = fVar184 * fStack_874;
                      auVar218._4_4_ = fVar183;
                      auVar218._0_4_ = fVar183;
                      auVar218._8_4_ = fVar183;
                      auVar218._12_4_ = fVar183;
                      auVar116 = vfmadd132ps_fma(auVar218,auVar203,auVar172);
                      auVar114._4_4_ = fVar170;
                      auVar114._0_4_ = fVar170;
                      auVar114._8_4_ = fVar170;
                      auVar114._12_4_ = fVar170;
                      auVar116 = vfmadd132ps_fma(auVar114,auVar116,auVar8);
                      auVar115._4_4_ = fVar187;
                      auVar115._0_4_ = fVar187;
                      auVar115._8_4_ = fVar187;
                      auVar115._12_4_ = fVar187;
                      auVar116 = vfmadd213ps_fma(auVar115,auVar31,auVar116);
                      auVar161 = vbroadcastss_avx512f(auVar116);
                      auVar214 = vbroadcastss_avx512f(ZEXT416(1));
                      auVar214 = vpermps_avx512f(auVar214,ZEXT1664(auVar116));
                      auVar219 = vbroadcastss_avx512f(ZEXT416(2));
                      local_240 = vpermps_avx512f(auVar219,ZEXT1664(auVar116));
                      local_2c0[0] = (RTCHitN)auVar161[0];
                      local_2c0[1] = (RTCHitN)auVar161[1];
                      local_2c0[2] = (RTCHitN)auVar161[2];
                      local_2c0[3] = (RTCHitN)auVar161[3];
                      local_2c0[4] = (RTCHitN)auVar161[4];
                      local_2c0[5] = (RTCHitN)auVar161[5];
                      local_2c0[6] = (RTCHitN)auVar161[6];
                      local_2c0[7] = (RTCHitN)auVar161[7];
                      local_2c0[8] = (RTCHitN)auVar161[8];
                      local_2c0[9] = (RTCHitN)auVar161[9];
                      local_2c0[10] = (RTCHitN)auVar161[10];
                      local_2c0[0xb] = (RTCHitN)auVar161[0xb];
                      local_2c0[0xc] = (RTCHitN)auVar161[0xc];
                      local_2c0[0xd] = (RTCHitN)auVar161[0xd];
                      local_2c0[0xe] = (RTCHitN)auVar161[0xe];
                      local_2c0[0xf] = (RTCHitN)auVar161[0xf];
                      local_2c0[0x10] = (RTCHitN)auVar161[0x10];
                      local_2c0[0x11] = (RTCHitN)auVar161[0x11];
                      local_2c0[0x12] = (RTCHitN)auVar161[0x12];
                      local_2c0[0x13] = (RTCHitN)auVar161[0x13];
                      local_2c0[0x14] = (RTCHitN)auVar161[0x14];
                      local_2c0[0x15] = (RTCHitN)auVar161[0x15];
                      local_2c0[0x16] = (RTCHitN)auVar161[0x16];
                      local_2c0[0x17] = (RTCHitN)auVar161[0x17];
                      local_2c0[0x18] = (RTCHitN)auVar161[0x18];
                      local_2c0[0x19] = (RTCHitN)auVar161[0x19];
                      local_2c0[0x1a] = (RTCHitN)auVar161[0x1a];
                      local_2c0[0x1b] = (RTCHitN)auVar161[0x1b];
                      local_2c0[0x1c] = (RTCHitN)auVar161[0x1c];
                      local_2c0[0x1d] = (RTCHitN)auVar161[0x1d];
                      local_2c0[0x1e] = (RTCHitN)auVar161[0x1e];
                      local_2c0[0x1f] = (RTCHitN)auVar161[0x1f];
                      local_2c0[0x20] = (RTCHitN)auVar161[0x20];
                      local_2c0[0x21] = (RTCHitN)auVar161[0x21];
                      local_2c0[0x22] = (RTCHitN)auVar161[0x22];
                      local_2c0[0x23] = (RTCHitN)auVar161[0x23];
                      local_2c0[0x24] = (RTCHitN)auVar161[0x24];
                      local_2c0[0x25] = (RTCHitN)auVar161[0x25];
                      local_2c0[0x26] = (RTCHitN)auVar161[0x26];
                      local_2c0[0x27] = (RTCHitN)auVar161[0x27];
                      local_2c0[0x28] = (RTCHitN)auVar161[0x28];
                      local_2c0[0x29] = (RTCHitN)auVar161[0x29];
                      local_2c0[0x2a] = (RTCHitN)auVar161[0x2a];
                      local_2c0[0x2b] = (RTCHitN)auVar161[0x2b];
                      local_2c0[0x2c] = (RTCHitN)auVar161[0x2c];
                      local_2c0[0x2d] = (RTCHitN)auVar161[0x2d];
                      local_2c0[0x2e] = (RTCHitN)auVar161[0x2e];
                      local_2c0[0x2f] = (RTCHitN)auVar161[0x2f];
                      local_2c0[0x30] = (RTCHitN)auVar161[0x30];
                      local_2c0[0x31] = (RTCHitN)auVar161[0x31];
                      local_2c0[0x32] = (RTCHitN)auVar161[0x32];
                      local_2c0[0x33] = (RTCHitN)auVar161[0x33];
                      local_2c0[0x34] = (RTCHitN)auVar161[0x34];
                      local_2c0[0x35] = (RTCHitN)auVar161[0x35];
                      local_2c0[0x36] = (RTCHitN)auVar161[0x36];
                      local_2c0[0x37] = (RTCHitN)auVar161[0x37];
                      local_2c0[0x38] = (RTCHitN)auVar161[0x38];
                      local_2c0[0x39] = (RTCHitN)auVar161[0x39];
                      local_2c0[0x3a] = (RTCHitN)auVar161[0x3a];
                      local_2c0[0x3b] = (RTCHitN)auVar161[0x3b];
                      local_2c0[0x3c] = (RTCHitN)auVar161[0x3c];
                      local_2c0[0x3d] = (RTCHitN)auVar161[0x3d];
                      local_2c0[0x3e] = (RTCHitN)auVar161[0x3e];
                      local_2c0[0x3f] = (RTCHitN)auVar161[0x3f];
                      local_280 = auVar214;
                      local_180 = local_480._0_8_;
                      uStack_178 = local_480._8_8_;
                      uStack_170 = local_480._16_8_;
                      uStack_168 = local_480._24_8_;
                      uStack_160 = local_480._32_8_;
                      uStack_158 = local_480._40_8_;
                      uStack_150 = local_480._48_8_;
                      uStack_148 = local_480._56_8_;
                      auVar161 = vmovdqa64_avx512f(local_400);
                      local_140 = vmovdqa64_avx512f(auVar161);
                      auVar124 = vpcmpeqd_avx2(auVar161._0_32_,auVar161._0_32_);
                      local_810[3] = auVar124;
                      local_810[2] = auVar124;
                      local_810[1] = auVar124;
                      *local_810 = auVar124;
                      local_100 = vbroadcastss_avx512f(ZEXT416((local_840.context)->instID[0]));
                      local_c0 = vbroadcastss_avx512f(ZEXT416((local_840.context)->instPrimID[0]));
                      auVar161 = vmovdqa64_avx512f(local_300);
                      local_700 = vmovdqa64_avx512f(auVar161);
                      local_840.valid = (int *)local_700;
                      local_840.geometryUserPtr = pGVar107->userPtr;
                      local_840.hit = local_2c0;
                      local_840.N = 0x10;
                      local_740 = auVar239._0_32_;
                      local_840.ray = (RTCRayN *)ray;
                      if (pGVar107->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                        auVar214 = ZEXT1664(auVar214._0_16_);
                        auVar219 = ZEXT1664(auVar219._0_16_);
                        auVar223 = ZEXT1664(auVar117);
                        (*pGVar107->intersectionFilterN)(&local_840);
                        auVar228 = ZEXT3264(local_7c0);
                        auVar239 = ZEXT3264(local_740);
                        auVar240 = ZEXT3264(local_800);
                        auVar241 = ZEXT3264(local_780);
                        auVar182 = ZEXT3264(local_760);
                        auVar161 = vmovdqa64_avx512f(local_700);
                        pGVar107 = local_7a0;
                      }
                      uVar33 = vptestmd_avx512f(auVar161,auVar161);
                      if ((short)uVar33 == 0) {
LAB_01d2d5f5:
                        *(int *)(ray + k * 4 + 0x200) = auVar239._0_4_;
                      }
                      else {
                        p_Var16 = context->args->filter;
                        if ((p_Var16 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar107->field_8).field_0x2 & 0x40) != 0)))) {
                          auVar214 = ZEXT1664(auVar214._0_16_);
                          auVar219 = ZEXT1664(auVar219._0_16_);
                          auVar223 = ZEXT1664(auVar223._0_16_);
                          (*p_Var16)(&local_840);
                          auVar228 = ZEXT3264(local_7c0);
                          auVar239 = ZEXT3264(local_740);
                          auVar240 = ZEXT3264(local_800);
                          auVar241 = ZEXT3264(local_780);
                          auVar182 = ZEXT3264(local_760);
                          auVar161 = vmovdqa64_avx512f(local_700);
                          pGVar107 = local_7a0;
                        }
                        uVar35 = vptestmd_avx512f(auVar161,auVar161);
                        if ((short)uVar35 == 0) goto LAB_01d2d5f5;
                        iVar1 = *(int *)(local_840.hit + 4);
                        iVar2 = *(int *)(local_840.hit + 8);
                        iVar80 = *(int *)(local_840.hit + 0xc);
                        iVar81 = *(int *)(local_840.hit + 0x10);
                        iVar82 = *(int *)(local_840.hit + 0x14);
                        iVar83 = *(int *)(local_840.hit + 0x18);
                        iVar84 = *(int *)(local_840.hit + 0x1c);
                        iVar85 = *(int *)(local_840.hit + 0x20);
                        iVar86 = *(int *)(local_840.hit + 0x24);
                        iVar87 = *(int *)(local_840.hit + 0x28);
                        iVar88 = *(int *)(local_840.hit + 0x2c);
                        iVar89 = *(int *)(local_840.hit + 0x30);
                        iVar90 = *(int *)(local_840.hit + 0x34);
                        iVar91 = *(int *)(local_840.hit + 0x38);
                        iVar92 = *(int *)(local_840.hit + 0x3c);
                        bVar108 = (byte)uVar35;
                        bVar17 = (bool)((byte)(uVar35 >> 1) & 1);
                        bVar18 = (bool)((byte)(uVar35 >> 2) & 1);
                        bVar19 = (bool)((byte)(uVar35 >> 3) & 1);
                        bVar20 = (bool)((byte)(uVar35 >> 4) & 1);
                        bVar21 = (bool)((byte)(uVar35 >> 5) & 1);
                        bVar22 = (bool)((byte)(uVar35 >> 6) & 1);
                        bVar23 = (bool)((byte)(uVar35 >> 7) & 1);
                        bVar98 = (byte)(uVar35 >> 8);
                        bVar24 = (bool)((byte)(uVar35 >> 9) & 1);
                        bVar25 = (bool)((byte)(uVar35 >> 10) & 1);
                        bVar26 = (bool)((byte)(uVar35 >> 0xb) & 1);
                        bVar27 = (bool)((byte)(uVar35 >> 0xc) & 1);
                        bVar28 = (bool)((byte)(uVar35 >> 0xd) & 1);
                        bVar29 = (bool)((byte)(uVar35 >> 0xe) & 1);
                        bVar30 = SUB81(uVar35 >> 0xf,0);
                        *(uint *)(local_840.ray + 0x300) =
                             (uint)(bVar108 & 1) * *(int *)local_840.hit |
                             (uint)!(bool)(bVar108 & 1) * *(int *)(local_840.ray + 0x300);
                        *(uint *)(local_840.ray + 0x304) =
                             (uint)bVar17 * iVar1 | (uint)!bVar17 * *(int *)(local_840.ray + 0x304);
                        *(uint *)(local_840.ray + 0x308) =
                             (uint)bVar18 * iVar2 | (uint)!bVar18 * *(int *)(local_840.ray + 0x308);
                        *(uint *)(local_840.ray + 0x30c) =
                             (uint)bVar19 * iVar80 | (uint)!bVar19 * *(int *)(local_840.ray + 0x30c)
                        ;
                        *(uint *)(local_840.ray + 0x310) =
                             (uint)bVar20 * iVar81 | (uint)!bVar20 * *(int *)(local_840.ray + 0x310)
                        ;
                        *(uint *)(local_840.ray + 0x314) =
                             (uint)bVar21 * iVar82 | (uint)!bVar21 * *(int *)(local_840.ray + 0x314)
                        ;
                        *(uint *)(local_840.ray + 0x318) =
                             (uint)bVar22 * iVar83 | (uint)!bVar22 * *(int *)(local_840.ray + 0x318)
                        ;
                        *(uint *)(local_840.ray + 0x31c) =
                             (uint)bVar23 * iVar84 | (uint)!bVar23 * *(int *)(local_840.ray + 0x31c)
                        ;
                        *(uint *)(local_840.ray + 800) =
                             (uint)(bVar98 & 1) * iVar85 |
                             (uint)!(bool)(bVar98 & 1) * *(int *)(local_840.ray + 800);
                        *(uint *)(local_840.ray + 0x324) =
                             (uint)bVar24 * iVar86 | (uint)!bVar24 * *(int *)(local_840.ray + 0x324)
                        ;
                        *(uint *)(local_840.ray + 0x328) =
                             (uint)bVar25 * iVar87 | (uint)!bVar25 * *(int *)(local_840.ray + 0x328)
                        ;
                        *(uint *)(local_840.ray + 0x32c) =
                             (uint)bVar26 * iVar88 | (uint)!bVar26 * *(int *)(local_840.ray + 0x32c)
                        ;
                        *(uint *)(local_840.ray + 0x330) =
                             (uint)bVar27 * iVar89 | (uint)!bVar27 * *(int *)(local_840.ray + 0x330)
                        ;
                        *(uint *)(local_840.ray + 0x334) =
                             (uint)bVar28 * iVar90 | (uint)!bVar28 * *(int *)(local_840.ray + 0x334)
                        ;
                        *(uint *)(local_840.ray + 0x338) =
                             (uint)bVar29 * iVar91 | (uint)!bVar29 * *(int *)(local_840.ray + 0x338)
                        ;
                        *(uint *)(local_840.ray + 0x33c) =
                             (uint)bVar30 * iVar92 | (uint)!bVar30 * *(int *)(local_840.ray + 0x33c)
                        ;
                        iVar1 = *(int *)(local_840.hit + 0x44);
                        iVar2 = *(int *)(local_840.hit + 0x48);
                        iVar80 = *(int *)(local_840.hit + 0x4c);
                        iVar81 = *(int *)(local_840.hit + 0x50);
                        iVar82 = *(int *)(local_840.hit + 0x54);
                        iVar83 = *(int *)(local_840.hit + 0x58);
                        iVar84 = *(int *)(local_840.hit + 0x5c);
                        iVar85 = *(int *)(local_840.hit + 0x60);
                        iVar86 = *(int *)(local_840.hit + 100);
                        iVar87 = *(int *)(local_840.hit + 0x68);
                        iVar88 = *(int *)(local_840.hit + 0x6c);
                        iVar89 = *(int *)(local_840.hit + 0x70);
                        iVar90 = *(int *)(local_840.hit + 0x74);
                        iVar91 = *(int *)(local_840.hit + 0x78);
                        iVar92 = *(int *)(local_840.hit + 0x7c);
                        bVar17 = (bool)((byte)(uVar35 >> 1) & 1);
                        bVar18 = (bool)((byte)(uVar35 >> 2) & 1);
                        bVar19 = (bool)((byte)(uVar35 >> 3) & 1);
                        bVar20 = (bool)((byte)(uVar35 >> 4) & 1);
                        bVar21 = (bool)((byte)(uVar35 >> 5) & 1);
                        bVar22 = (bool)((byte)(uVar35 >> 6) & 1);
                        bVar23 = (bool)((byte)(uVar35 >> 7) & 1);
                        bVar24 = (bool)((byte)(uVar35 >> 9) & 1);
                        bVar25 = (bool)((byte)(uVar35 >> 10) & 1);
                        bVar26 = (bool)((byte)(uVar35 >> 0xb) & 1);
                        bVar27 = (bool)((byte)(uVar35 >> 0xc) & 1);
                        bVar28 = (bool)((byte)(uVar35 >> 0xd) & 1);
                        bVar29 = (bool)((byte)(uVar35 >> 0xe) & 1);
                        bVar30 = SUB81(uVar35 >> 0xf,0);
                        *(uint *)(local_840.ray + 0x340) =
                             (uint)(bVar108 & 1) * *(int *)(local_840.hit + 0x40) |
                             (uint)!(bool)(bVar108 & 1) * *(int *)(local_840.ray + 0x340);
                        *(uint *)(local_840.ray + 0x344) =
                             (uint)bVar17 * iVar1 | (uint)!bVar17 * *(int *)(local_840.ray + 0x344);
                        *(uint *)(local_840.ray + 0x348) =
                             (uint)bVar18 * iVar2 | (uint)!bVar18 * *(int *)(local_840.ray + 0x348);
                        *(uint *)(local_840.ray + 0x34c) =
                             (uint)bVar19 * iVar80 | (uint)!bVar19 * *(int *)(local_840.ray + 0x34c)
                        ;
                        *(uint *)(local_840.ray + 0x350) =
                             (uint)bVar20 * iVar81 | (uint)!bVar20 * *(int *)(local_840.ray + 0x350)
                        ;
                        *(uint *)(local_840.ray + 0x354) =
                             (uint)bVar21 * iVar82 | (uint)!bVar21 * *(int *)(local_840.ray + 0x354)
                        ;
                        *(uint *)(local_840.ray + 0x358) =
                             (uint)bVar22 * iVar83 | (uint)!bVar22 * *(int *)(local_840.ray + 0x358)
                        ;
                        *(uint *)(local_840.ray + 0x35c) =
                             (uint)bVar23 * iVar84 | (uint)!bVar23 * *(int *)(local_840.ray + 0x35c)
                        ;
                        *(uint *)(local_840.ray + 0x360) =
                             (uint)(bVar98 & 1) * iVar85 |
                             (uint)!(bool)(bVar98 & 1) * *(int *)(local_840.ray + 0x360);
                        *(uint *)(local_840.ray + 0x364) =
                             (uint)bVar24 * iVar86 | (uint)!bVar24 * *(int *)(local_840.ray + 0x364)
                        ;
                        *(uint *)(local_840.ray + 0x368) =
                             (uint)bVar25 * iVar87 | (uint)!bVar25 * *(int *)(local_840.ray + 0x368)
                        ;
                        *(uint *)(local_840.ray + 0x36c) =
                             (uint)bVar26 * iVar88 | (uint)!bVar26 * *(int *)(local_840.ray + 0x36c)
                        ;
                        *(uint *)(local_840.ray + 0x370) =
                             (uint)bVar27 * iVar89 | (uint)!bVar27 * *(int *)(local_840.ray + 0x370)
                        ;
                        *(uint *)(local_840.ray + 0x374) =
                             (uint)bVar28 * iVar90 | (uint)!bVar28 * *(int *)(local_840.ray + 0x374)
                        ;
                        *(uint *)(local_840.ray + 0x378) =
                             (uint)bVar29 * iVar91 | (uint)!bVar29 * *(int *)(local_840.ray + 0x378)
                        ;
                        *(uint *)(local_840.ray + 0x37c) =
                             (uint)bVar30 * iVar92 | (uint)!bVar30 * *(int *)(local_840.ray + 0x37c)
                        ;
                        iVar1 = *(int *)(local_840.hit + 0x84);
                        iVar2 = *(int *)(local_840.hit + 0x88);
                        iVar80 = *(int *)(local_840.hit + 0x8c);
                        iVar81 = *(int *)(local_840.hit + 0x90);
                        iVar82 = *(int *)(local_840.hit + 0x94);
                        iVar83 = *(int *)(local_840.hit + 0x98);
                        iVar84 = *(int *)(local_840.hit + 0x9c);
                        iVar85 = *(int *)(local_840.hit + 0xa0);
                        iVar86 = *(int *)(local_840.hit + 0xa4);
                        iVar87 = *(int *)(local_840.hit + 0xa8);
                        iVar88 = *(int *)(local_840.hit + 0xac);
                        iVar89 = *(int *)(local_840.hit + 0xb0);
                        iVar90 = *(int *)(local_840.hit + 0xb4);
                        iVar91 = *(int *)(local_840.hit + 0xb8);
                        iVar92 = *(int *)(local_840.hit + 0xbc);
                        bVar17 = (bool)((byte)(uVar35 >> 1) & 1);
                        bVar18 = (bool)((byte)(uVar35 >> 2) & 1);
                        bVar19 = (bool)((byte)(uVar35 >> 3) & 1);
                        bVar20 = (bool)((byte)(uVar35 >> 4) & 1);
                        bVar21 = (bool)((byte)(uVar35 >> 5) & 1);
                        bVar22 = (bool)((byte)(uVar35 >> 6) & 1);
                        bVar23 = (bool)((byte)(uVar35 >> 7) & 1);
                        bVar24 = (bool)((byte)(uVar35 >> 9) & 1);
                        bVar25 = (bool)((byte)(uVar35 >> 10) & 1);
                        bVar26 = (bool)((byte)(uVar35 >> 0xb) & 1);
                        bVar27 = (bool)((byte)(uVar35 >> 0xc) & 1);
                        bVar28 = (bool)((byte)(uVar35 >> 0xd) & 1);
                        bVar29 = (bool)((byte)(uVar35 >> 0xe) & 1);
                        bVar30 = SUB81(uVar35 >> 0xf,0);
                        *(uint *)(local_840.ray + 0x380) =
                             (uint)(bVar108 & 1) * *(int *)(local_840.hit + 0x80) |
                             (uint)!(bool)(bVar108 & 1) * *(int *)(local_840.ray + 0x380);
                        *(uint *)(local_840.ray + 900) =
                             (uint)bVar17 * iVar1 | (uint)!bVar17 * *(int *)(local_840.ray + 900);
                        *(uint *)(local_840.ray + 0x388) =
                             (uint)bVar18 * iVar2 | (uint)!bVar18 * *(int *)(local_840.ray + 0x388);
                        *(uint *)(local_840.ray + 0x38c) =
                             (uint)bVar19 * iVar80 | (uint)!bVar19 * *(int *)(local_840.ray + 0x38c)
                        ;
                        *(uint *)(local_840.ray + 0x390) =
                             (uint)bVar20 * iVar81 | (uint)!bVar20 * *(int *)(local_840.ray + 0x390)
                        ;
                        *(uint *)(local_840.ray + 0x394) =
                             (uint)bVar21 * iVar82 | (uint)!bVar21 * *(int *)(local_840.ray + 0x394)
                        ;
                        *(uint *)(local_840.ray + 0x398) =
                             (uint)bVar22 * iVar83 | (uint)!bVar22 * *(int *)(local_840.ray + 0x398)
                        ;
                        *(uint *)(local_840.ray + 0x39c) =
                             (uint)bVar23 * iVar84 | (uint)!bVar23 * *(int *)(local_840.ray + 0x39c)
                        ;
                        *(uint *)(local_840.ray + 0x3a0) =
                             (uint)(bVar98 & 1) * iVar85 |
                             (uint)!(bool)(bVar98 & 1) * *(int *)(local_840.ray + 0x3a0);
                        *(uint *)(local_840.ray + 0x3a4) =
                             (uint)bVar24 * iVar86 | (uint)!bVar24 * *(int *)(local_840.ray + 0x3a4)
                        ;
                        *(uint *)(local_840.ray + 0x3a8) =
                             (uint)bVar25 * iVar87 | (uint)!bVar25 * *(int *)(local_840.ray + 0x3a8)
                        ;
                        *(uint *)(local_840.ray + 0x3ac) =
                             (uint)bVar26 * iVar88 | (uint)!bVar26 * *(int *)(local_840.ray + 0x3ac)
                        ;
                        *(uint *)(local_840.ray + 0x3b0) =
                             (uint)bVar27 * iVar89 | (uint)!bVar27 * *(int *)(local_840.ray + 0x3b0)
                        ;
                        *(uint *)(local_840.ray + 0x3b4) =
                             (uint)bVar28 * iVar90 | (uint)!bVar28 * *(int *)(local_840.ray + 0x3b4)
                        ;
                        *(uint *)(local_840.ray + 0x3b8) =
                             (uint)bVar29 * iVar91 | (uint)!bVar29 * *(int *)(local_840.ray + 0x3b8)
                        ;
                        *(uint *)(local_840.ray + 0x3bc) =
                             (uint)bVar30 * iVar92 | (uint)!bVar30 * *(int *)(local_840.ray + 0x3bc)
                        ;
                        iVar1 = *(int *)(local_840.hit + 0xc4);
                        iVar2 = *(int *)(local_840.hit + 200);
                        iVar80 = *(int *)(local_840.hit + 0xcc);
                        iVar81 = *(int *)(local_840.hit + 0xd0);
                        iVar82 = *(int *)(local_840.hit + 0xd4);
                        iVar83 = *(int *)(local_840.hit + 0xd8);
                        iVar84 = *(int *)(local_840.hit + 0xdc);
                        iVar85 = *(int *)(local_840.hit + 0xe0);
                        iVar86 = *(int *)(local_840.hit + 0xe4);
                        iVar87 = *(int *)(local_840.hit + 0xe8);
                        iVar88 = *(int *)(local_840.hit + 0xec);
                        iVar89 = *(int *)(local_840.hit + 0xf0);
                        iVar90 = *(int *)(local_840.hit + 0xf4);
                        iVar91 = *(int *)(local_840.hit + 0xf8);
                        iVar92 = *(int *)(local_840.hit + 0xfc);
                        bVar17 = (bool)((byte)(uVar35 >> 1) & 1);
                        bVar18 = (bool)((byte)(uVar35 >> 2) & 1);
                        bVar19 = (bool)((byte)(uVar35 >> 3) & 1);
                        bVar20 = (bool)((byte)(uVar35 >> 4) & 1);
                        bVar21 = (bool)((byte)(uVar35 >> 5) & 1);
                        bVar22 = (bool)((byte)(uVar35 >> 6) & 1);
                        bVar23 = (bool)((byte)(uVar35 >> 7) & 1);
                        bVar24 = (bool)((byte)(uVar35 >> 9) & 1);
                        bVar25 = (bool)((byte)(uVar35 >> 10) & 1);
                        bVar26 = (bool)((byte)(uVar35 >> 0xb) & 1);
                        bVar27 = (bool)((byte)(uVar35 >> 0xc) & 1);
                        bVar28 = (bool)((byte)(uVar35 >> 0xd) & 1);
                        bVar29 = (bool)((byte)(uVar35 >> 0xe) & 1);
                        bVar30 = SUB81(uVar35 >> 0xf,0);
                        *(uint *)(local_840.ray + 0x3c0) =
                             (uint)(bVar108 & 1) * *(int *)(local_840.hit + 0xc0) |
                             (uint)!(bool)(bVar108 & 1) * *(int *)(local_840.ray + 0x3c0);
                        *(uint *)(local_840.ray + 0x3c4) =
                             (uint)bVar17 * iVar1 | (uint)!bVar17 * *(int *)(local_840.ray + 0x3c4);
                        *(uint *)(local_840.ray + 0x3c8) =
                             (uint)bVar18 * iVar2 | (uint)!bVar18 * *(int *)(local_840.ray + 0x3c8);
                        *(uint *)(local_840.ray + 0x3cc) =
                             (uint)bVar19 * iVar80 | (uint)!bVar19 * *(int *)(local_840.ray + 0x3cc)
                        ;
                        *(uint *)(local_840.ray + 0x3d0) =
                             (uint)bVar20 * iVar81 | (uint)!bVar20 * *(int *)(local_840.ray + 0x3d0)
                        ;
                        *(uint *)(local_840.ray + 0x3d4) =
                             (uint)bVar21 * iVar82 | (uint)!bVar21 * *(int *)(local_840.ray + 0x3d4)
                        ;
                        *(uint *)(local_840.ray + 0x3d8) =
                             (uint)bVar22 * iVar83 | (uint)!bVar22 * *(int *)(local_840.ray + 0x3d8)
                        ;
                        *(uint *)(local_840.ray + 0x3dc) =
                             (uint)bVar23 * iVar84 | (uint)!bVar23 * *(int *)(local_840.ray + 0x3dc)
                        ;
                        *(uint *)(local_840.ray + 0x3e0) =
                             (uint)(bVar98 & 1) * iVar85 |
                             (uint)!(bool)(bVar98 & 1) * *(int *)(local_840.ray + 0x3e0);
                        *(uint *)(local_840.ray + 0x3e4) =
                             (uint)bVar24 * iVar86 | (uint)!bVar24 * *(int *)(local_840.ray + 0x3e4)
                        ;
                        *(uint *)(local_840.ray + 1000) =
                             (uint)bVar25 * iVar87 | (uint)!bVar25 * *(int *)(local_840.ray + 1000);
                        *(uint *)(local_840.ray + 0x3ec) =
                             (uint)bVar26 * iVar88 | (uint)!bVar26 * *(int *)(local_840.ray + 0x3ec)
                        ;
                        *(uint *)(local_840.ray + 0x3f0) =
                             (uint)bVar27 * iVar89 | (uint)!bVar27 * *(int *)(local_840.ray + 0x3f0)
                        ;
                        *(uint *)(local_840.ray + 0x3f4) =
                             (uint)bVar28 * iVar90 | (uint)!bVar28 * *(int *)(local_840.ray + 0x3f4)
                        ;
                        *(uint *)(local_840.ray + 0x3f8) =
                             (uint)bVar29 * iVar91 | (uint)!bVar29 * *(int *)(local_840.ray + 0x3f8)
                        ;
                        *(uint *)(local_840.ray + 0x3fc) =
                             (uint)bVar30 * iVar92 | (uint)!bVar30 * *(int *)(local_840.ray + 0x3fc)
                        ;
                        iVar1 = *(int *)(local_840.hit + 0x104);
                        iVar2 = *(int *)(local_840.hit + 0x108);
                        iVar80 = *(int *)(local_840.hit + 0x10c);
                        iVar81 = *(int *)(local_840.hit + 0x110);
                        iVar82 = *(int *)(local_840.hit + 0x114);
                        iVar83 = *(int *)(local_840.hit + 0x118);
                        iVar84 = *(int *)(local_840.hit + 0x11c);
                        iVar85 = *(int *)(local_840.hit + 0x120);
                        iVar86 = *(int *)(local_840.hit + 0x124);
                        iVar87 = *(int *)(local_840.hit + 0x128);
                        iVar88 = *(int *)(local_840.hit + 300);
                        iVar89 = *(int *)(local_840.hit + 0x130);
                        iVar90 = *(int *)(local_840.hit + 0x134);
                        iVar91 = *(int *)(local_840.hit + 0x138);
                        iVar92 = *(int *)(local_840.hit + 0x13c);
                        bVar17 = (bool)((byte)(uVar35 >> 1) & 1);
                        bVar18 = (bool)((byte)(uVar35 >> 2) & 1);
                        bVar19 = (bool)((byte)(uVar35 >> 3) & 1);
                        bVar20 = (bool)((byte)(uVar35 >> 4) & 1);
                        bVar21 = (bool)((byte)(uVar35 >> 5) & 1);
                        bVar22 = (bool)((byte)(uVar35 >> 6) & 1);
                        bVar23 = (bool)((byte)(uVar35 >> 7) & 1);
                        bVar24 = (bool)((byte)(uVar35 >> 9) & 1);
                        bVar25 = (bool)((byte)(uVar35 >> 10) & 1);
                        bVar26 = (bool)((byte)(uVar35 >> 0xb) & 1);
                        bVar27 = (bool)((byte)(uVar35 >> 0xc) & 1);
                        bVar28 = (bool)((byte)(uVar35 >> 0xd) & 1);
                        bVar29 = (bool)((byte)(uVar35 >> 0xe) & 1);
                        bVar30 = SUB81(uVar35 >> 0xf,0);
                        *(uint *)(local_840.ray + 0x400) =
                             (uint)(bVar108 & 1) * *(int *)(local_840.hit + 0x100) |
                             (uint)!(bool)(bVar108 & 1) * *(int *)(local_840.ray + 0x400);
                        *(uint *)(local_840.ray + 0x404) =
                             (uint)bVar17 * iVar1 | (uint)!bVar17 * *(int *)(local_840.ray + 0x404);
                        *(uint *)(local_840.ray + 0x408) =
                             (uint)bVar18 * iVar2 | (uint)!bVar18 * *(int *)(local_840.ray + 0x408);
                        *(uint *)(local_840.ray + 0x40c) =
                             (uint)bVar19 * iVar80 | (uint)!bVar19 * *(int *)(local_840.ray + 0x40c)
                        ;
                        *(uint *)(local_840.ray + 0x410) =
                             (uint)bVar20 * iVar81 | (uint)!bVar20 * *(int *)(local_840.ray + 0x410)
                        ;
                        *(uint *)(local_840.ray + 0x414) =
                             (uint)bVar21 * iVar82 | (uint)!bVar21 * *(int *)(local_840.ray + 0x414)
                        ;
                        *(uint *)(local_840.ray + 0x418) =
                             (uint)bVar22 * iVar83 | (uint)!bVar22 * *(int *)(local_840.ray + 0x418)
                        ;
                        *(uint *)(local_840.ray + 0x41c) =
                             (uint)bVar23 * iVar84 | (uint)!bVar23 * *(int *)(local_840.ray + 0x41c)
                        ;
                        *(uint *)(local_840.ray + 0x420) =
                             (uint)(bVar98 & 1) * iVar85 |
                             (uint)!(bool)(bVar98 & 1) * *(int *)(local_840.ray + 0x420);
                        *(uint *)(local_840.ray + 0x424) =
                             (uint)bVar24 * iVar86 | (uint)!bVar24 * *(int *)(local_840.ray + 0x424)
                        ;
                        *(uint *)(local_840.ray + 0x428) =
                             (uint)bVar25 * iVar87 | (uint)!bVar25 * *(int *)(local_840.ray + 0x428)
                        ;
                        *(uint *)(local_840.ray + 0x42c) =
                             (uint)bVar26 * iVar88 | (uint)!bVar26 * *(int *)(local_840.ray + 0x42c)
                        ;
                        *(uint *)(local_840.ray + 0x430) =
                             (uint)bVar27 * iVar89 | (uint)!bVar27 * *(int *)(local_840.ray + 0x430)
                        ;
                        *(uint *)(local_840.ray + 0x434) =
                             (uint)bVar28 * iVar90 | (uint)!bVar28 * *(int *)(local_840.ray + 0x434)
                        ;
                        *(uint *)(local_840.ray + 0x438) =
                             (uint)bVar29 * iVar91 | (uint)!bVar29 * *(int *)(local_840.ray + 0x438)
                        ;
                        *(uint *)(local_840.ray + 0x43c) =
                             (uint)bVar30 * iVar92 | (uint)!bVar30 * *(int *)(local_840.ray + 0x43c)
                        ;
                        auVar239 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_840.hit + 0x140));
                        auVar239 = vmovdqu32_avx512f(auVar239);
                        *(undefined1 (*) [64])(local_840.ray + 0x440) = auVar239;
                        auVar239 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_840.hit + 0x180));
                        auVar239 = vmovdqu32_avx512f(auVar239);
                        *(undefined1 (*) [64])(local_840.ray + 0x480) = auVar239;
                        auVar239 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_840.hit + 0x1c0));
                        auVar239 = vmovdqa32_avx512f(auVar239);
                        *(undefined1 (*) [64])(local_840.ray + 0x4c0) = auVar239;
                        auVar239 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_840.hit + 0x200));
                        auVar239 = vmovdqa32_avx512f(auVar239);
                        *(undefined1 (*) [64])(local_840.ray + 0x500) = auVar239;
                        auVar239 = ZEXT464(*(uint *)(ray + k * 4 + 0x200));
                      }
                      auVar130 = auVar240._0_32_;
                      bVar108 = ~(byte)(1 << ((uint)uVar99 & 0x1f)) & (byte)uVar103;
                      uVar171 = auVar239._0_4_;
                      auVar180._4_4_ = uVar171;
                      auVar180._0_4_ = uVar171;
                      auVar180._8_4_ = uVar171;
                      auVar180._12_4_ = uVar171;
                      auVar180._16_4_ = uVar171;
                      auVar180._20_4_ = uVar171;
                      auVar180._24_4_ = uVar171;
                      auVar180._28_4_ = uVar171;
                      uVar33 = vcmpps_avx512vl(auVar228._0_32_,auVar180,2);
                      if ((bVar108 & (byte)uVar33) == 0) goto LAB_01d2c411;
                      bVar108 = bVar108 & (byte)uVar33;
                      uVar103 = (ulong)bVar108;
                      auVar181._8_4_ = 0x7f800000;
                      auVar181._0_8_ = 0x7f8000007f800000;
                      auVar181._12_4_ = 0x7f800000;
                      auVar181._16_4_ = 0x7f800000;
                      auVar181._20_4_ = 0x7f800000;
                      auVar181._24_4_ = 0x7f800000;
                      auVar181._28_4_ = 0x7f800000;
                      auVar124 = vblendmps_avx512vl(auVar181,auVar228._0_32_);
                      auVar160._0_4_ =
                           (uint)(bVar108 & 1) * auVar124._0_4_ |
                           (uint)!(bool)(bVar108 & 1) * 0x7f800000;
                      bVar17 = (bool)(bVar108 >> 1 & 1);
                      auVar160._4_4_ = (uint)bVar17 * auVar124._4_4_ | (uint)!bVar17 * 0x7f800000;
                      bVar17 = (bool)(bVar108 >> 2 & 1);
                      auVar160._8_4_ = (uint)bVar17 * auVar124._8_4_ | (uint)!bVar17 * 0x7f800000;
                      bVar17 = (bool)(bVar108 >> 3 & 1);
                      auVar160._12_4_ = (uint)bVar17 * auVar124._12_4_ | (uint)!bVar17 * 0x7f800000;
                      bVar17 = (bool)(bVar108 >> 4 & 1);
                      auVar160._16_4_ = (uint)bVar17 * auVar124._16_4_ | (uint)!bVar17 * 0x7f800000;
                      bVar17 = (bool)(bVar108 >> 5 & 1);
                      auVar160._20_4_ = (uint)bVar17 * auVar124._20_4_ | (uint)!bVar17 * 0x7f800000;
                      bVar17 = (bool)(bVar108 >> 6 & 1);
                      auVar160._24_4_ = (uint)bVar17 * auVar124._24_4_ | (uint)!bVar17 * 0x7f800000;
                      auVar160._28_4_ =
                           (uint)(bVar108 >> 7) * auVar124._28_4_ |
                           (uint)!(bool)(bVar108 >> 7) * 0x7f800000;
                      auVar124 = vshufps_avx(auVar160,auVar160,0xb1);
                      auVar124 = vminps_avx(auVar160,auVar124);
                      auVar122 = vshufpd_avx(auVar124,auVar124,5);
                      auVar124 = vminps_avx(auVar124,auVar122);
                      auVar122 = vpermpd_avx2(auVar124,0x4e);
                      auVar124 = vminps_avx(auVar124,auVar122);
                      uVar33 = vcmpps_avx512vl(auVar160,auVar124,0);
                      bVar98 = (byte)uVar33 & bVar108;
                      if (bVar98 != 0) {
                        bVar108 = bVar98;
                      }
                      uVar100 = 0;
                      for (uVar101 = (uint)bVar108; (uVar101 & 1) == 0;
                          uVar101 = uVar101 >> 1 | 0x80000000) {
                        uVar100 = uVar100 + 1;
                      }
                      uVar99 = (ulong)uVar100;
                    } while( true );
                  }
                  fVar187 = local_500[uVar99];
                  uVar171 = *(undefined4 *)(local_4e0 + uVar99 * 4);
                  fVar170 = 1.0 - fVar187;
                  auVar8 = vfnmadd231ss_fma(ZEXT416((uint)(fVar187 * (fVar170 + fVar170))),
                                            ZEXT416((uint)fVar170),ZEXT416((uint)fVar170));
                  auVar172 = ZEXT416((uint)fVar187);
                  auVar116 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar172,
                                             ZEXT416(0xc0a00000));
                  auVar117 = vfmadd231ss_fma(ZEXT416((uint)(fVar187 * fVar187 * 3.0)),
                                             ZEXT416((uint)(fVar187 + fVar187)),auVar116);
                  auVar223 = ZEXT1664(auVar117);
                  auVar116 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar172,
                                             ZEXT416(0x40000000));
                  auVar116 = vfmadd231ss_fma(ZEXT416((uint)(fVar170 * fVar170 * -3.0)),
                                             ZEXT416((uint)(fVar170 + fVar170)),auVar116);
                  auVar172 = vfmadd231ss_fma(ZEXT416((uint)(fVar187 * fVar187)),auVar172,
                                             ZEXT416((uint)(fVar170 * -2.0)));
                  fVar170 = auVar8._0_4_ * 0.5;
                  fVar183 = auVar117._0_4_ * 0.5;
                  auVar214 = ZEXT464((uint)fVar183);
                  fVar184 = auVar116._0_4_ * 0.5;
                  fVar194 = auVar172._0_4_ * 0.5;
                  auVar197._0_4_ = fVar194 * local_880;
                  auVar197._4_4_ = fVar194 * fStack_87c;
                  auVar197._8_4_ = fVar194 * fStack_878;
                  auVar197._12_4_ = fVar194 * fStack_874;
                  auVar215._4_4_ = fVar184;
                  auVar215._0_4_ = fVar184;
                  auVar215._8_4_ = fVar184;
                  auVar215._12_4_ = fVar184;
                  auVar116 = vfmadd132ps_fma(auVar215,auVar197,*pauVar4);
                  auVar219 = ZEXT1664(auVar116);
                  auVar198._4_4_ = fVar183;
                  auVar198._0_4_ = fVar183;
                  auVar198._8_4_ = fVar183;
                  auVar198._12_4_ = fVar183;
                  auVar116 = vfmadd132ps_fma(auVar198,auVar116,*pauVar3);
                  auVar188._4_4_ = fVar170;
                  auVar188._0_4_ = fVar170;
                  auVar188._8_4_ = fVar170;
                  auVar188._12_4_ = fVar170;
                  auVar116 = vfmadd213ps_fma(auVar188,auVar31,auVar116);
                  *(undefined4 *)(ray + k * 4 + 0x200) = *(undefined4 *)(local_4c0 + uVar99 * 4);
                  *(int *)(ray + k * 4 + 0x300) = auVar116._0_4_;
                  uVar15 = vextractps_avx(auVar116,1);
                  *(undefined4 *)(ray + k * 4 + 0x340) = uVar15;
                  uVar15 = vextractps_avx(auVar116,2);
                  *(undefined4 *)(ray + k * 4 + 0x380) = uVar15;
                  *(float *)(ray + k * 4 + 0x3c0) = fVar187;
                  *(undefined4 *)(ray + k * 4 + 0x400) = uVar171;
                  *(uint *)(ray + k * 4 + 0x440) = uVar14;
                  *(uint *)(ray + k * 4 + 0x480) = uVar104;
                  *(uint *)(ray + k * 4 + 0x4c0) = context->user->instID[0];
                  *(uint *)(ray + k * 4 + 0x500) = context->user->instPrimID[0];
                }
              }
            }
          }
        }
      }
LAB_01d2c411:
      if (8 < iVar102) {
        auVar124 = vpbroadcastd_avx512vl();
        auVar228 = ZEXT3264(auVar124);
        local_740._4_4_ = local_7e0._0_4_;
        local_740._0_4_ = local_7e0._0_4_;
        local_740._8_4_ = local_7e0._0_4_;
        local_740._12_4_ = local_7e0._0_4_;
        local_740._16_4_ = local_7e0._0_4_;
        local_740._20_4_ = local_7e0._0_4_;
        local_740._24_4_ = local_7e0._0_4_;
        local_740._28_4_ = local_7e0._0_4_;
        uStack_71c = local_720;
        uStack_718 = local_720;
        uStack_714 = local_720;
        uStack_710 = local_720;
        uStack_70c = local_720;
        uStack_708 = local_720;
        uStack_704 = local_720;
        fStack_798 = 1.0 / (float)local_440._0_4_;
        auVar240 = vpbroadcastd_avx512f();
        local_440 = vmovdqa64_avx512f(auVar240);
        auVar240 = vpbroadcastd_avx512f();
        local_400 = vmovdqa64_avx512f(auVar240);
        lVar106 = 8;
        local_800 = auVar130;
        fStack_794 = fStack_798;
        fStack_790 = fStack_798;
        fStack_78c = fStack_798;
        fStack_788 = fStack_798;
        fStack_784 = fStack_798;
        local_7a0._0_4_ = fStack_798;
        local_7a0._4_4_ = fStack_798;
LAB_01d2c4bc:
        auVar124 = vpbroadcastd_avx512vl();
        auVar124 = vpor_avx2(auVar124,_DAT_01fe9900);
        uVar34 = vpcmpgtd_avx512vl(auVar228._0_32_,auVar124);
        auVar124 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar106 * 4 + lVar37);
        auVar122 = *(undefined1 (*) [32])(lVar37 + 0x21b37f0 + lVar106 * 4);
        auVar135 = *(undefined1 (*) [32])(lVar37 + 0x21b3c74 + lVar106 * 4);
        auVar134 = *(undefined1 (*) [32])(lVar37 + 0x21b40f8 + lVar106 * 4);
        auVar240._0_4_ = auVar134._0_4_ * (float)local_6a0._0_4_;
        auVar240._4_4_ = auVar134._4_4_ * (float)local_6a0._4_4_;
        auVar240._8_4_ = auVar134._8_4_ * fStack_698;
        auVar240._12_4_ = auVar134._12_4_ * fStack_694;
        auVar240._16_4_ = auVar134._16_4_ * fStack_690;
        auVar240._20_4_ = auVar134._20_4_ * fStack_68c;
        auVar240._28_36_ = auVar219._28_36_;
        auVar240._24_4_ = auVar134._24_4_ * fStack_688;
        auVar219._0_4_ = auVar134._0_4_ * (float)local_6c0._0_4_;
        auVar219._4_4_ = auVar134._4_4_ * (float)local_6c0._4_4_;
        auVar219._8_4_ = auVar134._8_4_ * fStack_6b8;
        auVar219._12_4_ = auVar134._12_4_ * fStack_6b4;
        auVar219._16_4_ = auVar134._16_4_ * fStack_6b0;
        auVar219._20_4_ = auVar134._20_4_ * fStack_6ac;
        auVar219._28_36_ = auVar214._28_36_;
        auVar219._24_4_ = auVar134._24_4_ * fStack_6a8;
        auVar125 = vmulps_avx512vl(local_3a0,auVar134);
        local_760 = auVar182._0_32_;
        auVar123 = vfmadd231ps_avx512vl(auVar240._0_32_,auVar135,local_660);
        auVar126 = vfmadd231ps_avx512vl(auVar219._0_32_,auVar135,local_680);
        auVar125 = vfmadd231ps_avx512vl(auVar125,auVar135,local_380);
        auVar123 = vfmadd231ps_avx512vl(auVar123,auVar122,local_620);
        auVar126 = vfmadd231ps_avx512vl(auVar126,auVar122,local_640);
        auVar133 = vfmadd231ps_avx512vl(auVar125,auVar122,local_360);
        auVar116 = vfmadd231ps_fma(auVar123,auVar124,local_5e0);
        auVar219 = ZEXT1664(auVar116);
        auVar117 = vfmadd231ps_fma(auVar126,auVar124,local_600);
        auVar214 = ZEXT1664(auVar117);
        auVar125 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar106 * 4 + lVar37);
        auVar123 = *(undefined1 (*) [32])(lVar37 + 0x21b5c10 + lVar106 * 4);
        auVar121 = vfmadd231ps_avx512vl(auVar133,auVar124,local_340);
        auVar126 = *(undefined1 (*) [32])(lVar37 + 0x21b6094 + lVar106 * 4);
        auVar133 = *(undefined1 (*) [32])(lVar37 + 0x21b6518 + lVar106 * 4);
        auVar182._0_4_ = auVar133._0_4_ * (float)local_6a0._0_4_;
        auVar182._4_4_ = auVar133._4_4_ * (float)local_6a0._4_4_;
        auVar182._8_4_ = auVar133._8_4_ * fStack_698;
        auVar182._12_4_ = auVar133._12_4_ * fStack_694;
        auVar182._16_4_ = auVar133._16_4_ * fStack_690;
        auVar182._20_4_ = auVar133._20_4_ * fStack_68c;
        auVar182._28_36_ = auVar223._28_36_;
        auVar182._24_4_ = auVar133._24_4_ * fStack_688;
        auVar63._4_4_ = auVar133._4_4_ * (float)local_6c0._4_4_;
        auVar63._0_4_ = auVar133._0_4_ * (float)local_6c0._0_4_;
        auVar63._8_4_ = auVar133._8_4_ * fStack_6b8;
        auVar63._12_4_ = auVar133._12_4_ * fStack_6b4;
        auVar63._16_4_ = auVar133._16_4_ * fStack_6b0;
        auVar63._20_4_ = auVar133._20_4_ * fStack_6ac;
        auVar63._24_4_ = auVar133._24_4_ * fStack_6a8;
        auVar63._28_4_ = uStack_6a4;
        auVar127 = vmulps_avx512vl(local_3a0,auVar133);
        auVar128 = vfmadd231ps_avx512vl(auVar182._0_32_,auVar126,local_660);
        auVar182 = ZEXT3264(local_760);
        auVar129 = vfmadd231ps_avx512vl(auVar63,auVar126,local_680);
        auVar127 = vfmadd231ps_avx512vl(auVar127,auVar126,local_380);
        auVar128 = vfmadd231ps_avx512vl(auVar128,auVar123,local_620);
        auVar129 = vfmadd231ps_avx512vl(auVar129,auVar123,local_640);
        auVar127 = vfmadd231ps_avx512vl(auVar127,auVar123,local_360);
        auVar172 = vfmadd231ps_fma(auVar128,auVar125,local_5e0);
        auVar223 = ZEXT1664(auVar172);
        auVar8 = vfmadd231ps_fma(auVar129,auVar125,local_600);
        auVar129 = vfmadd231ps_avx512vl(auVar127,auVar125,local_340);
        auVar130 = vmaxps_avx512vl(auVar121,auVar129);
        auVar127 = vsubps_avx(ZEXT1632(auVar172),ZEXT1632(auVar116));
        auVar128 = vsubps_avx(ZEXT1632(auVar8),ZEXT1632(auVar117));
        auVar119 = vmulps_avx512vl(ZEXT1632(auVar117),auVar127);
        auVar120 = vmulps_avx512vl(ZEXT1632(auVar116),auVar128);
        auVar119 = vsubps_avx512vl(auVar119,auVar120);
        auVar120 = vmulps_avx512vl(auVar128,auVar128);
        auVar120 = vfmadd231ps_avx512vl(auVar120,auVar127,auVar127);
        auVar130 = vmulps_avx512vl(auVar130,auVar130);
        auVar130 = vmulps_avx512vl(auVar130,auVar120);
        auVar119 = vmulps_avx512vl(auVar119,auVar119);
        uVar33 = vcmpps_avx512vl(auVar119,auVar130,2);
        bVar108 = (byte)uVar34 & (byte)uVar33;
        if (bVar108 != 0) {
          auVar133 = vmulps_avx512vl(local_4a0,auVar133);
          auVar126 = vfmadd213ps_avx512vl(auVar126,local_800,auVar133);
          local_780 = auVar241._0_32_;
          auVar123 = vfmadd213ps_avx512vl(auVar123,local_780,auVar126);
          auVar125 = vfmadd213ps_avx512vl(auVar125,local_760,auVar123);
          auVar134 = vmulps_avx512vl(local_4a0,auVar134);
          auVar135 = vfmadd213ps_avx512vl(auVar135,local_800,auVar134);
          auVar122 = vfmadd213ps_avx512vl(auVar122,local_780,auVar135);
          auVar123 = vfmadd213ps_avx512vl(auVar124,local_760,auVar122);
          auVar124 = *(undefined1 (*) [32])(lVar37 + 0x21b457c + lVar106 * 4);
          auVar122 = *(undefined1 (*) [32])(lVar37 + 0x21b4a00 + lVar106 * 4);
          auVar135 = *(undefined1 (*) [32])(lVar37 + 0x21b4e84 + lVar106 * 4);
          auVar134 = *(undefined1 (*) [32])(lVar37 + 0x21b5308 + lVar106 * 4);
          auVar126 = vmulps_avx512vl(_local_6a0,auVar134);
          auVar133 = vmulps_avx512vl(_local_6c0,auVar134);
          auVar134 = vmulps_avx512vl(local_4a0,auVar134);
          auVar126 = vfmadd231ps_avx512vl(auVar126,auVar135,local_660);
          auVar133 = vfmadd231ps_avx512vl(auVar133,auVar135,local_680);
          auVar115 = vfmadd231ps_fma(auVar134,auVar135,local_800);
          auVar135 = vfmadd231ps_avx512vl(auVar126,auVar122,local_620);
          auVar134 = vfmadd231ps_avx512vl(auVar133,auVar122,local_640);
          auVar122 = vfmadd231ps_avx512vl(ZEXT1632(auVar115),local_780,auVar122);
          auVar126 = vfmadd231ps_avx512vl(auVar135,auVar124,local_5e0);
          auVar134 = vfmadd231ps_avx512vl(auVar134,auVar124,local_600);
          auVar133 = vfmadd231ps_avx512vl(auVar122,local_760,auVar124);
          auVar124 = *(undefined1 (*) [32])(lVar37 + 0x21b699c + lVar106 * 4);
          auVar122 = *(undefined1 (*) [32])(lVar37 + 0x21b72a4 + lVar106 * 4);
          auVar135 = *(undefined1 (*) [32])(lVar37 + 0x21b7728 + lVar106 * 4);
          auVar130 = vmulps_avx512vl(_local_6a0,auVar135);
          auVar119 = vmulps_avx512vl(_local_6c0,auVar135);
          auVar135 = vmulps_avx512vl(local_4a0,auVar135);
          auVar130 = vfmadd231ps_avx512vl(auVar130,auVar122,local_660);
          auVar119 = vfmadd231ps_avx512vl(auVar119,auVar122,local_680);
          auVar135 = vfmadd231ps_avx512vl(auVar135,local_800,auVar122);
          auVar122 = *(undefined1 (*) [32])(lVar37 + 0x21b6e20 + lVar106 * 4);
          auVar130 = vfmadd231ps_avx512vl(auVar130,auVar122,local_620);
          auVar182 = ZEXT3264(local_760);
          auVar119 = vfmadd231ps_avx512vl(auVar119,auVar122,local_640);
          auVar122 = vfmadd231ps_avx512vl(auVar135,local_780,auVar122);
          auVar135 = vfmadd231ps_avx512vl(auVar130,auVar124,local_5e0);
          auVar130 = vfmadd231ps_avx512vl(auVar119,auVar124,local_600);
          auVar122 = vfmadd231ps_avx512vl(auVar122,local_760,auVar124);
          auVar119 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          vandps_avx512vl(auVar126,auVar119);
          vandps_avx512vl(auVar134,auVar119);
          auVar124 = vmaxps_avx(auVar119,auVar119);
          vandps_avx512vl(auVar133,auVar119);
          auVar124 = vmaxps_avx(auVar124,auVar119);
          uVar99 = vcmpps_avx512vl(auVar124,local_740,1);
          bVar17 = (bool)((byte)uVar99 & 1);
          auVar148._0_4_ = (float)((uint)bVar17 * auVar127._0_4_ | (uint)!bVar17 * auVar126._0_4_);
          bVar17 = (bool)((byte)(uVar99 >> 1) & 1);
          auVar148._4_4_ = (float)((uint)bVar17 * auVar127._4_4_ | (uint)!bVar17 * auVar126._4_4_);
          bVar17 = (bool)((byte)(uVar99 >> 2) & 1);
          auVar148._8_4_ = (float)((uint)bVar17 * auVar127._8_4_ | (uint)!bVar17 * auVar126._8_4_);
          bVar17 = (bool)((byte)(uVar99 >> 3) & 1);
          auVar148._12_4_ =
               (float)((uint)bVar17 * auVar127._12_4_ | (uint)!bVar17 * auVar126._12_4_);
          bVar17 = (bool)((byte)(uVar99 >> 4) & 1);
          auVar148._16_4_ =
               (float)((uint)bVar17 * auVar127._16_4_ | (uint)!bVar17 * auVar126._16_4_);
          bVar17 = (bool)((byte)(uVar99 >> 5) & 1);
          auVar148._20_4_ =
               (float)((uint)bVar17 * auVar127._20_4_ | (uint)!bVar17 * auVar126._20_4_);
          bVar17 = (bool)((byte)(uVar99 >> 6) & 1);
          auVar148._24_4_ =
               (float)((uint)bVar17 * auVar127._24_4_ | (uint)!bVar17 * auVar126._24_4_);
          bVar17 = SUB81(uVar99 >> 7,0);
          auVar148._28_4_ = (uint)bVar17 * auVar127._28_4_ | (uint)!bVar17 * auVar126._28_4_;
          bVar17 = (bool)((byte)uVar99 & 1);
          auVar149._0_4_ = (float)((uint)bVar17 * auVar128._0_4_ | (uint)!bVar17 * auVar134._0_4_);
          bVar17 = (bool)((byte)(uVar99 >> 1) & 1);
          auVar149._4_4_ = (float)((uint)bVar17 * auVar128._4_4_ | (uint)!bVar17 * auVar134._4_4_);
          bVar17 = (bool)((byte)(uVar99 >> 2) & 1);
          auVar149._8_4_ = (float)((uint)bVar17 * auVar128._8_4_ | (uint)!bVar17 * auVar134._8_4_);
          bVar17 = (bool)((byte)(uVar99 >> 3) & 1);
          auVar149._12_4_ =
               (float)((uint)bVar17 * auVar128._12_4_ | (uint)!bVar17 * auVar134._12_4_);
          bVar17 = (bool)((byte)(uVar99 >> 4) & 1);
          auVar149._16_4_ =
               (float)((uint)bVar17 * auVar128._16_4_ | (uint)!bVar17 * auVar134._16_4_);
          bVar17 = (bool)((byte)(uVar99 >> 5) & 1);
          auVar149._20_4_ =
               (float)((uint)bVar17 * auVar128._20_4_ | (uint)!bVar17 * auVar134._20_4_);
          bVar17 = (bool)((byte)(uVar99 >> 6) & 1);
          auVar149._24_4_ =
               (float)((uint)bVar17 * auVar128._24_4_ | (uint)!bVar17 * auVar134._24_4_);
          bVar17 = SUB81(uVar99 >> 7,0);
          auVar149._28_4_ = (uint)bVar17 * auVar128._28_4_ | (uint)!bVar17 * auVar134._28_4_;
          vandps_avx512vl(auVar135,auVar119);
          vandps_avx512vl(auVar130,auVar119);
          auVar124 = vmaxps_avx(auVar149,auVar149);
          vandps_avx512vl(auVar122,auVar119);
          auVar124 = vmaxps_avx(auVar124,auVar149);
          uVar99 = vcmpps_avx512vl(auVar124,local_740,1);
          bVar17 = (bool)((byte)uVar99 & 1);
          auVar150._0_4_ = (uint)bVar17 * auVar127._0_4_ | (uint)!bVar17 * auVar135._0_4_;
          bVar17 = (bool)((byte)(uVar99 >> 1) & 1);
          auVar150._4_4_ = (uint)bVar17 * auVar127._4_4_ | (uint)!bVar17 * auVar135._4_4_;
          bVar17 = (bool)((byte)(uVar99 >> 2) & 1);
          auVar150._8_4_ = (uint)bVar17 * auVar127._8_4_ | (uint)!bVar17 * auVar135._8_4_;
          bVar17 = (bool)((byte)(uVar99 >> 3) & 1);
          auVar150._12_4_ = (uint)bVar17 * auVar127._12_4_ | (uint)!bVar17 * auVar135._12_4_;
          bVar17 = (bool)((byte)(uVar99 >> 4) & 1);
          auVar150._16_4_ = (uint)bVar17 * auVar127._16_4_ | (uint)!bVar17 * auVar135._16_4_;
          bVar17 = (bool)((byte)(uVar99 >> 5) & 1);
          auVar150._20_4_ = (uint)bVar17 * auVar127._20_4_ | (uint)!bVar17 * auVar135._20_4_;
          bVar17 = (bool)((byte)(uVar99 >> 6) & 1);
          auVar150._24_4_ = (uint)bVar17 * auVar127._24_4_ | (uint)!bVar17 * auVar135._24_4_;
          bVar17 = SUB81(uVar99 >> 7,0);
          auVar150._28_4_ = (uint)bVar17 * auVar127._28_4_ | (uint)!bVar17 * auVar135._28_4_;
          bVar17 = (bool)((byte)uVar99 & 1);
          auVar151._0_4_ = (float)((uint)bVar17 * auVar128._0_4_ | (uint)!bVar17 * auVar130._0_4_);
          bVar17 = (bool)((byte)(uVar99 >> 1) & 1);
          auVar151._4_4_ = (float)((uint)bVar17 * auVar128._4_4_ | (uint)!bVar17 * auVar130._4_4_);
          bVar17 = (bool)((byte)(uVar99 >> 2) & 1);
          auVar151._8_4_ = (float)((uint)bVar17 * auVar128._8_4_ | (uint)!bVar17 * auVar130._8_4_);
          bVar17 = (bool)((byte)(uVar99 >> 3) & 1);
          auVar151._12_4_ =
               (float)((uint)bVar17 * auVar128._12_4_ | (uint)!bVar17 * auVar130._12_4_);
          bVar17 = (bool)((byte)(uVar99 >> 4) & 1);
          auVar151._16_4_ =
               (float)((uint)bVar17 * auVar128._16_4_ | (uint)!bVar17 * auVar130._16_4_);
          bVar17 = (bool)((byte)(uVar99 >> 5) & 1);
          auVar151._20_4_ =
               (float)((uint)bVar17 * auVar128._20_4_ | (uint)!bVar17 * auVar130._20_4_);
          bVar17 = (bool)((byte)(uVar99 >> 6) & 1);
          auVar151._24_4_ =
               (float)((uint)bVar17 * auVar128._24_4_ | (uint)!bVar17 * auVar130._24_4_);
          bVar17 = SUB81(uVar99 >> 7,0);
          auVar151._28_4_ = (uint)bVar17 * auVar128._28_4_ | (uint)!bVar17 * auVar130._28_4_;
          auVar226._8_4_ = 0x80000000;
          auVar226._0_8_ = 0x8000000080000000;
          auVar226._12_4_ = 0x80000000;
          auVar226._16_4_ = 0x80000000;
          auVar226._20_4_ = 0x80000000;
          auVar226._24_4_ = 0x80000000;
          auVar226._28_4_ = 0x80000000;
          auVar124 = vxorps_avx512vl(auVar150,auVar226);
          auVar118 = vxorps_avx512vl(auVar119._0_16_,auVar119._0_16_);
          auVar122 = vfmadd213ps_avx512vl(auVar148,auVar148,ZEXT1632(auVar118));
          auVar115 = vfmadd231ps_fma(auVar122,auVar149,auVar149);
          auVar122 = vrsqrt14ps_avx512vl(ZEXT1632(auVar115));
          auVar237._8_4_ = 0xbf000000;
          auVar237._0_8_ = 0xbf000000bf000000;
          auVar237._12_4_ = 0xbf000000;
          auVar237._16_4_ = 0xbf000000;
          auVar237._20_4_ = 0xbf000000;
          auVar237._24_4_ = 0xbf000000;
          auVar237._28_4_ = 0xbf000000;
          fVar187 = auVar122._0_4_;
          fVar170 = auVar122._4_4_;
          fVar183 = auVar122._8_4_;
          fVar184 = auVar122._12_4_;
          fVar194 = auVar122._16_4_;
          fVar208 = auVar122._20_4_;
          fVar109 = auVar122._24_4_;
          auVar64._4_4_ = fVar170 * fVar170 * fVar170 * auVar115._4_4_ * -0.5;
          auVar64._0_4_ = fVar187 * fVar187 * fVar187 * auVar115._0_4_ * -0.5;
          auVar64._8_4_ = fVar183 * fVar183 * fVar183 * auVar115._8_4_ * -0.5;
          auVar64._12_4_ = fVar184 * fVar184 * fVar184 * auVar115._12_4_ * -0.5;
          auVar64._16_4_ = fVar194 * fVar194 * fVar194 * -0.0;
          auVar64._20_4_ = fVar208 * fVar208 * fVar208 * -0.0;
          auVar64._24_4_ = fVar109 * fVar109 * fVar109 * -0.0;
          auVar64._28_4_ = auVar149._28_4_;
          auVar135 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
          auVar122 = vfmadd231ps_avx512vl(auVar64,auVar135,auVar122);
          auVar65._4_4_ = auVar149._4_4_ * auVar122._4_4_;
          auVar65._0_4_ = auVar149._0_4_ * auVar122._0_4_;
          auVar65._8_4_ = auVar149._8_4_ * auVar122._8_4_;
          auVar65._12_4_ = auVar149._12_4_ * auVar122._12_4_;
          auVar65._16_4_ = auVar149._16_4_ * auVar122._16_4_;
          auVar65._20_4_ = auVar149._20_4_ * auVar122._20_4_;
          auVar65._24_4_ = auVar149._24_4_ * auVar122._24_4_;
          auVar65._28_4_ = 0;
          auVar66._4_4_ = auVar122._4_4_ * -auVar148._4_4_;
          auVar66._0_4_ = auVar122._0_4_ * -auVar148._0_4_;
          auVar66._8_4_ = auVar122._8_4_ * -auVar148._8_4_;
          auVar66._12_4_ = auVar122._12_4_ * -auVar148._12_4_;
          auVar66._16_4_ = auVar122._16_4_ * -auVar148._16_4_;
          auVar66._20_4_ = auVar122._20_4_ * -auVar148._20_4_;
          auVar66._24_4_ = auVar122._24_4_ * -auVar148._24_4_;
          auVar66._28_4_ = auVar149._28_4_;
          auVar134 = vmulps_avx512vl(auVar122,ZEXT1632(auVar118));
          auVar133 = ZEXT1632(auVar118);
          auVar122 = vfmadd213ps_avx512vl(auVar150,auVar150,auVar133);
          auVar122 = vfmadd231ps_avx512vl(auVar122,auVar151,auVar151);
          auVar126 = vrsqrt14ps_avx512vl(auVar122);
          auVar122 = vmulps_avx512vl(auVar122,auVar237);
          fVar187 = auVar126._0_4_;
          fVar170 = auVar126._4_4_;
          fVar183 = auVar126._8_4_;
          fVar184 = auVar126._12_4_;
          fVar194 = auVar126._16_4_;
          fVar208 = auVar126._20_4_;
          fVar109 = auVar126._24_4_;
          auVar67._4_4_ = fVar170 * fVar170 * fVar170 * auVar122._4_4_;
          auVar67._0_4_ = fVar187 * fVar187 * fVar187 * auVar122._0_4_;
          auVar67._8_4_ = fVar183 * fVar183 * fVar183 * auVar122._8_4_;
          auVar67._12_4_ = fVar184 * fVar184 * fVar184 * auVar122._12_4_;
          auVar67._16_4_ = fVar194 * fVar194 * fVar194 * auVar122._16_4_;
          auVar67._20_4_ = fVar208 * fVar208 * fVar208 * auVar122._20_4_;
          auVar67._24_4_ = fVar109 * fVar109 * fVar109 * auVar122._24_4_;
          auVar67._28_4_ = auVar122._28_4_;
          auVar122 = vfmadd231ps_avx512vl(auVar67,auVar135,auVar126);
          auVar68._4_4_ = auVar151._4_4_ * auVar122._4_4_;
          auVar68._0_4_ = auVar151._0_4_ * auVar122._0_4_;
          auVar68._8_4_ = auVar151._8_4_ * auVar122._8_4_;
          auVar68._12_4_ = auVar151._12_4_ * auVar122._12_4_;
          auVar68._16_4_ = auVar151._16_4_ * auVar122._16_4_;
          auVar68._20_4_ = auVar151._20_4_ * auVar122._20_4_;
          auVar68._24_4_ = auVar151._24_4_ * auVar122._24_4_;
          auVar68._28_4_ = auVar126._28_4_;
          auVar69._4_4_ = auVar122._4_4_ * auVar124._4_4_;
          auVar69._0_4_ = auVar122._0_4_ * auVar124._0_4_;
          auVar69._8_4_ = auVar122._8_4_ * auVar124._8_4_;
          auVar69._12_4_ = auVar122._12_4_ * auVar124._12_4_;
          auVar69._16_4_ = auVar122._16_4_ * auVar124._16_4_;
          auVar69._20_4_ = auVar122._20_4_ * auVar124._20_4_;
          auVar69._24_4_ = auVar122._24_4_ * auVar124._24_4_;
          auVar69._28_4_ = auVar124._28_4_;
          auVar124 = vmulps_avx512vl(auVar122,auVar133);
          auVar115 = vfmadd213ps_fma(auVar65,auVar121,ZEXT1632(auVar116));
          auVar203 = vfmadd213ps_fma(auVar66,auVar121,ZEXT1632(auVar117));
          auVar135 = vfmadd213ps_avx512vl(auVar134,auVar121,auVar123);
          auVar126 = vfmadd213ps_avx512vl(auVar68,auVar129,ZEXT1632(auVar172));
          auVar111 = vfnmadd213ps_fma(auVar65,auVar121,ZEXT1632(auVar116));
          auVar116 = vfmadd213ps_fma(auVar69,auVar129,ZEXT1632(auVar8));
          auVar224 = vfnmadd213ps_fma(auVar66,auVar121,ZEXT1632(auVar117));
          auVar117 = vfmadd213ps_fma(auVar124,auVar129,auVar125);
          auVar38 = vfnmadd231ps_fma(auVar123,auVar121,auVar134);
          auVar195 = vfnmadd213ps_fma(auVar68,auVar129,ZEXT1632(auVar172));
          auVar112 = vfnmadd213ps_fma(auVar69,auVar129,ZEXT1632(auVar8));
          auVar113 = vfnmadd231ps_fma(auVar125,auVar129,auVar124);
          auVar125 = vsubps_avx512vl(auVar126,ZEXT1632(auVar111));
          auVar124 = vsubps_avx(ZEXT1632(auVar116),ZEXT1632(auVar224));
          auVar122 = vsubps_avx(ZEXT1632(auVar117),ZEXT1632(auVar38));
          auVar70._4_4_ = auVar124._4_4_ * auVar38._4_4_;
          auVar70._0_4_ = auVar124._0_4_ * auVar38._0_4_;
          auVar70._8_4_ = auVar124._8_4_ * auVar38._8_4_;
          auVar70._12_4_ = auVar124._12_4_ * auVar38._12_4_;
          auVar70._16_4_ = auVar124._16_4_ * 0.0;
          auVar70._20_4_ = auVar124._20_4_ * 0.0;
          auVar70._24_4_ = auVar124._24_4_ * 0.0;
          auVar70._28_4_ = auVar134._28_4_;
          auVar172 = vfmsub231ps_fma(auVar70,ZEXT1632(auVar224),auVar122);
          auVar71._4_4_ = auVar122._4_4_ * auVar111._4_4_;
          auVar71._0_4_ = auVar122._0_4_ * auVar111._0_4_;
          auVar71._8_4_ = auVar122._8_4_ * auVar111._8_4_;
          auVar71._12_4_ = auVar122._12_4_ * auVar111._12_4_;
          auVar71._16_4_ = auVar122._16_4_ * 0.0;
          auVar71._20_4_ = auVar122._20_4_ * 0.0;
          auVar71._24_4_ = auVar122._24_4_ * 0.0;
          auVar71._28_4_ = auVar122._28_4_;
          auVar8 = vfmsub231ps_fma(auVar71,ZEXT1632(auVar38),auVar125);
          auVar72._4_4_ = auVar224._4_4_ * auVar125._4_4_;
          auVar72._0_4_ = auVar224._0_4_ * auVar125._0_4_;
          auVar72._8_4_ = auVar224._8_4_ * auVar125._8_4_;
          auVar72._12_4_ = auVar224._12_4_ * auVar125._12_4_;
          auVar72._16_4_ = auVar125._16_4_ * 0.0;
          auVar72._20_4_ = auVar125._20_4_ * 0.0;
          auVar72._24_4_ = auVar125._24_4_ * 0.0;
          auVar72._28_4_ = auVar125._28_4_;
          auVar114 = vfmsub231ps_fma(auVar72,ZEXT1632(auVar111),auVar124);
          auVar124 = vfmadd231ps_avx512vl(ZEXT1632(auVar114),auVar133,ZEXT1632(auVar8));
          auVar124 = vfmadd231ps_avx512vl(auVar124,auVar133,ZEXT1632(auVar172));
          auVar119 = ZEXT1632(auVar118);
          uVar99 = vcmpps_avx512vl(auVar124,auVar119,2);
          bVar98 = (byte)uVar99;
          fVar162 = (float)((uint)(bVar98 & 1) * auVar115._0_4_ |
                           (uint)!(bool)(bVar98 & 1) * auVar195._0_4_);
          bVar17 = (bool)((byte)(uVar99 >> 1) & 1);
          fVar164 = (float)((uint)bVar17 * auVar115._4_4_ | (uint)!bVar17 * auVar195._4_4_);
          bVar17 = (bool)((byte)(uVar99 >> 2) & 1);
          fVar167 = (float)((uint)bVar17 * auVar115._8_4_ | (uint)!bVar17 * auVar195._8_4_);
          bVar17 = (bool)((byte)(uVar99 >> 3) & 1);
          fVar168 = (float)((uint)bVar17 * auVar115._12_4_ | (uint)!bVar17 * auVar195._12_4_);
          auVar133 = ZEXT1632(CONCAT412(fVar168,CONCAT48(fVar167,CONCAT44(fVar164,fVar162))));
          fVar163 = (float)((uint)(bVar98 & 1) * auVar203._0_4_ |
                           (uint)!(bool)(bVar98 & 1) * auVar112._0_4_);
          bVar17 = (bool)((byte)(uVar99 >> 1) & 1);
          fVar166 = (float)((uint)bVar17 * auVar203._4_4_ | (uint)!bVar17 * auVar112._4_4_);
          bVar17 = (bool)((byte)(uVar99 >> 2) & 1);
          fVar165 = (float)((uint)bVar17 * auVar203._8_4_ | (uint)!bVar17 * auVar112._8_4_);
          bVar17 = (bool)((byte)(uVar99 >> 3) & 1);
          fVar169 = (float)((uint)bVar17 * auVar203._12_4_ | (uint)!bVar17 * auVar112._12_4_);
          auVar127 = ZEXT1632(CONCAT412(fVar169,CONCAT48(fVar165,CONCAT44(fVar166,fVar163))));
          auVar152._0_4_ =
               (float)((uint)(bVar98 & 1) * auVar135._0_4_ |
                      (uint)!(bool)(bVar98 & 1) * auVar113._0_4_);
          bVar17 = (bool)((byte)(uVar99 >> 1) & 1);
          auVar152._4_4_ = (float)((uint)bVar17 * auVar135._4_4_ | (uint)!bVar17 * auVar113._4_4_);
          bVar17 = (bool)((byte)(uVar99 >> 2) & 1);
          auVar152._8_4_ = (float)((uint)bVar17 * auVar135._8_4_ | (uint)!bVar17 * auVar113._8_4_);
          bVar17 = (bool)((byte)(uVar99 >> 3) & 1);
          auVar152._12_4_ =
               (float)((uint)bVar17 * auVar135._12_4_ | (uint)!bVar17 * auVar113._12_4_);
          fVar187 = (float)((uint)((byte)(uVar99 >> 4) & 1) * auVar135._16_4_);
          auVar152._16_4_ = fVar187;
          fVar170 = (float)((uint)((byte)(uVar99 >> 5) & 1) * auVar135._20_4_);
          auVar152._20_4_ = fVar170;
          fVar183 = (float)((uint)((byte)(uVar99 >> 6) & 1) * auVar135._24_4_);
          auVar152._24_4_ = fVar183;
          iVar1 = (uint)(byte)(uVar99 >> 7) * auVar135._28_4_;
          auVar152._28_4_ = iVar1;
          auVar124 = vblendmps_avx512vl(ZEXT1632(auVar111),auVar126);
          auVar153._0_4_ =
               (uint)(bVar98 & 1) * auVar124._0_4_ | (uint)!(bool)(bVar98 & 1) * auVar172._0_4_;
          bVar17 = (bool)((byte)(uVar99 >> 1) & 1);
          auVar153._4_4_ = (uint)bVar17 * auVar124._4_4_ | (uint)!bVar17 * auVar172._4_4_;
          bVar17 = (bool)((byte)(uVar99 >> 2) & 1);
          auVar153._8_4_ = (uint)bVar17 * auVar124._8_4_ | (uint)!bVar17 * auVar172._8_4_;
          bVar17 = (bool)((byte)(uVar99 >> 3) & 1);
          auVar153._12_4_ = (uint)bVar17 * auVar124._12_4_ | (uint)!bVar17 * auVar172._12_4_;
          auVar153._16_4_ = (uint)((byte)(uVar99 >> 4) & 1) * auVar124._16_4_;
          auVar153._20_4_ = (uint)((byte)(uVar99 >> 5) & 1) * auVar124._20_4_;
          auVar153._24_4_ = (uint)((byte)(uVar99 >> 6) & 1) * auVar124._24_4_;
          auVar153._28_4_ = (uint)(byte)(uVar99 >> 7) * auVar124._28_4_;
          auVar124 = vblendmps_avx512vl(ZEXT1632(auVar224),ZEXT1632(auVar116));
          auVar154._0_4_ =
               (float)((uint)(bVar98 & 1) * auVar124._0_4_ |
                      (uint)!(bool)(bVar98 & 1) * auVar115._0_4_);
          bVar17 = (bool)((byte)(uVar99 >> 1) & 1);
          auVar154._4_4_ = (float)((uint)bVar17 * auVar124._4_4_ | (uint)!bVar17 * auVar115._4_4_);
          bVar17 = (bool)((byte)(uVar99 >> 2) & 1);
          auVar154._8_4_ = (float)((uint)bVar17 * auVar124._8_4_ | (uint)!bVar17 * auVar115._8_4_);
          bVar17 = (bool)((byte)(uVar99 >> 3) & 1);
          auVar154._12_4_ =
               (float)((uint)bVar17 * auVar124._12_4_ | (uint)!bVar17 * auVar115._12_4_);
          fVar208 = (float)((uint)((byte)(uVar99 >> 4) & 1) * auVar124._16_4_);
          auVar154._16_4_ = fVar208;
          fVar194 = (float)((uint)((byte)(uVar99 >> 5) & 1) * auVar124._20_4_);
          auVar154._20_4_ = fVar194;
          fVar184 = (float)((uint)((byte)(uVar99 >> 6) & 1) * auVar124._24_4_);
          auVar154._24_4_ = fVar184;
          auVar154._28_4_ = (uint)(byte)(uVar99 >> 7) * auVar124._28_4_;
          auVar124 = vblendmps_avx512vl(ZEXT1632(auVar38),ZEXT1632(auVar117));
          auVar155._0_4_ =
               (float)((uint)(bVar98 & 1) * auVar124._0_4_ |
                      (uint)!(bool)(bVar98 & 1) * auVar203._0_4_);
          bVar17 = (bool)((byte)(uVar99 >> 1) & 1);
          auVar155._4_4_ = (float)((uint)bVar17 * auVar124._4_4_ | (uint)!bVar17 * auVar203._4_4_);
          bVar17 = (bool)((byte)(uVar99 >> 2) & 1);
          auVar155._8_4_ = (float)((uint)bVar17 * auVar124._8_4_ | (uint)!bVar17 * auVar203._8_4_);
          bVar17 = (bool)((byte)(uVar99 >> 3) & 1);
          auVar155._12_4_ =
               (float)((uint)bVar17 * auVar124._12_4_ | (uint)!bVar17 * auVar203._12_4_);
          fVar109 = (float)((uint)((byte)(uVar99 >> 4) & 1) * auVar124._16_4_);
          auVar155._16_4_ = fVar109;
          fVar110 = (float)((uint)((byte)(uVar99 >> 5) & 1) * auVar124._20_4_);
          auVar155._20_4_ = fVar110;
          fVar193 = (float)((uint)((byte)(uVar99 >> 6) & 1) * auVar124._24_4_);
          auVar155._24_4_ = fVar193;
          iVar2 = (uint)(byte)(uVar99 >> 7) * auVar124._28_4_;
          auVar155._28_4_ = iVar2;
          auVar156._0_4_ =
               (uint)(bVar98 & 1) * (int)auVar111._0_4_ | (uint)!(bool)(bVar98 & 1) * auVar126._0_4_
          ;
          bVar17 = (bool)((byte)(uVar99 >> 1) & 1);
          auVar156._4_4_ = (uint)bVar17 * (int)auVar111._4_4_ | (uint)!bVar17 * auVar126._4_4_;
          bVar17 = (bool)((byte)(uVar99 >> 2) & 1);
          auVar156._8_4_ = (uint)bVar17 * (int)auVar111._8_4_ | (uint)!bVar17 * auVar126._8_4_;
          bVar17 = (bool)((byte)(uVar99 >> 3) & 1);
          auVar156._12_4_ = (uint)bVar17 * (int)auVar111._12_4_ | (uint)!bVar17 * auVar126._12_4_;
          auVar156._16_4_ = (uint)!(bool)((byte)(uVar99 >> 4) & 1) * auVar126._16_4_;
          auVar156._20_4_ = (uint)!(bool)((byte)(uVar99 >> 5) & 1) * auVar126._20_4_;
          auVar156._24_4_ = (uint)!(bool)((byte)(uVar99 >> 6) & 1) * auVar126._24_4_;
          auVar156._28_4_ = (uint)!SUB81(uVar99 >> 7,0) * auVar126._28_4_;
          bVar17 = (bool)((byte)(uVar99 >> 1) & 1);
          bVar19 = (bool)((byte)(uVar99 >> 2) & 1);
          bVar21 = (bool)((byte)(uVar99 >> 3) & 1);
          bVar18 = (bool)((byte)(uVar99 >> 1) & 1);
          bVar20 = (bool)((byte)(uVar99 >> 2) & 1);
          bVar22 = (bool)((byte)(uVar99 >> 3) & 1);
          auVar126 = vsubps_avx512vl(auVar156,auVar133);
          auVar122 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar21 * (int)auVar224._12_4_ |
                                                   (uint)!bVar21 * auVar116._12_4_,
                                                   CONCAT48((uint)bVar19 * (int)auVar224._8_4_ |
                                                            (uint)!bVar19 * auVar116._8_4_,
                                                            CONCAT44((uint)bVar17 *
                                                                     (int)auVar224._4_4_ |
                                                                     (uint)!bVar17 * auVar116._4_4_,
                                                                     (uint)(bVar98 & 1) *
                                                                     (int)auVar224._0_4_ |
                                                                     (uint)!(bool)(bVar98 & 1) *
                                                                     auVar116._0_4_)))),auVar127);
          auVar219 = ZEXT3264(auVar122);
          auVar135 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar22 * (int)auVar38._12_4_ |
                                                   (uint)!bVar22 * auVar117._12_4_,
                                                   CONCAT48((uint)bVar20 * (int)auVar38._8_4_ |
                                                            (uint)!bVar20 * auVar117._8_4_,
                                                            CONCAT44((uint)bVar18 *
                                                                     (int)auVar38._4_4_ |
                                                                     (uint)!bVar18 * auVar117._4_4_,
                                                                     (uint)(bVar98 & 1) *
                                                                     (int)auVar38._0_4_ |
                                                                     (uint)!(bool)(bVar98 & 1) *
                                                                     auVar117._0_4_)))),auVar152);
          auVar134 = vsubps_avx(auVar133,auVar153);
          auVar223 = ZEXT3264(auVar134);
          auVar125 = vsubps_avx(auVar127,auVar154);
          auVar123 = vsubps_avx(auVar152,auVar155);
          auVar73._4_4_ = auVar135._4_4_ * fVar164;
          auVar73._0_4_ = auVar135._0_4_ * fVar162;
          auVar73._8_4_ = auVar135._8_4_ * fVar167;
          auVar73._12_4_ = auVar135._12_4_ * fVar168;
          auVar73._16_4_ = auVar135._16_4_ * 0.0;
          auVar73._20_4_ = auVar135._20_4_ * 0.0;
          auVar73._24_4_ = auVar135._24_4_ * 0.0;
          auVar73._28_4_ = 0;
          auVar116 = vfmsub231ps_fma(auVar73,auVar152,auVar126);
          auVar206._0_4_ = fVar163 * auVar126._0_4_;
          auVar206._4_4_ = fVar166 * auVar126._4_4_;
          auVar206._8_4_ = fVar165 * auVar126._8_4_;
          auVar206._12_4_ = fVar169 * auVar126._12_4_;
          auVar206._16_4_ = auVar126._16_4_ * 0.0;
          auVar206._20_4_ = auVar126._20_4_ * 0.0;
          auVar206._24_4_ = auVar126._24_4_ * 0.0;
          auVar206._28_4_ = 0;
          auVar117 = vfmsub231ps_fma(auVar206,auVar133,auVar122);
          auVar124 = vfmadd231ps_avx512vl(ZEXT1632(auVar117),auVar119,ZEXT1632(auVar116));
          auVar212._0_4_ = auVar122._0_4_ * auVar152._0_4_;
          auVar212._4_4_ = auVar122._4_4_ * auVar152._4_4_;
          auVar212._8_4_ = auVar122._8_4_ * auVar152._8_4_;
          auVar212._12_4_ = auVar122._12_4_ * auVar152._12_4_;
          auVar212._16_4_ = auVar122._16_4_ * fVar187;
          auVar212._20_4_ = auVar122._20_4_ * fVar170;
          auVar212._24_4_ = auVar122._24_4_ * fVar183;
          auVar212._28_4_ = 0;
          auVar116 = vfmsub231ps_fma(auVar212,auVar127,auVar135);
          auVar128 = vfmadd231ps_avx512vl(auVar124,auVar119,ZEXT1632(auVar116));
          auVar124 = vmulps_avx512vl(auVar123,auVar153);
          auVar124 = vfmsub231ps_avx512vl(auVar124,auVar134,auVar155);
          auVar74._4_4_ = auVar125._4_4_ * auVar155._4_4_;
          auVar74._0_4_ = auVar125._0_4_ * auVar155._0_4_;
          auVar74._8_4_ = auVar125._8_4_ * auVar155._8_4_;
          auVar74._12_4_ = auVar125._12_4_ * auVar155._12_4_;
          auVar74._16_4_ = auVar125._16_4_ * fVar109;
          auVar74._20_4_ = auVar125._20_4_ * fVar110;
          auVar74._24_4_ = auVar125._24_4_ * fVar193;
          auVar74._28_4_ = iVar2;
          auVar116 = vfmsub231ps_fma(auVar74,auVar154,auVar123);
          auVar213._0_4_ = auVar154._0_4_ * auVar134._0_4_;
          auVar213._4_4_ = auVar154._4_4_ * auVar134._4_4_;
          auVar213._8_4_ = auVar154._8_4_ * auVar134._8_4_;
          auVar213._12_4_ = auVar154._12_4_ * auVar134._12_4_;
          auVar213._16_4_ = fVar208 * auVar134._16_4_;
          auVar213._20_4_ = fVar194 * auVar134._20_4_;
          auVar213._24_4_ = fVar184 * auVar134._24_4_;
          auVar213._28_4_ = 0;
          auVar117 = vfmsub231ps_fma(auVar213,auVar125,auVar153);
          auVar124 = vfmadd231ps_avx512vl(ZEXT1632(auVar117),auVar119,auVar124);
          auVar130 = vfmadd231ps_avx512vl(auVar124,auVar119,ZEXT1632(auVar116));
          auVar214 = ZEXT3264(auVar130);
          auVar124 = vmaxps_avx(auVar128,auVar130);
          uVar33 = vcmpps_avx512vl(auVar124,auVar119,2);
          bVar108 = bVar108 & (byte)uVar33;
          if (bVar108 != 0) {
            uVar171 = *(undefined4 *)(ray + k * 4 + 0x200);
            auVar238._4_4_ = uVar171;
            auVar238._0_4_ = uVar171;
            auVar238._8_4_ = uVar171;
            auVar238._12_4_ = uVar171;
            auVar238._16_4_ = uVar171;
            auVar238._20_4_ = uVar171;
            auVar238._24_4_ = uVar171;
            auVar238._28_4_ = uVar171;
            auVar239 = ZEXT3264(auVar238);
            auVar75._4_4_ = auVar123._4_4_ * auVar122._4_4_;
            auVar75._0_4_ = auVar123._0_4_ * auVar122._0_4_;
            auVar75._8_4_ = auVar123._8_4_ * auVar122._8_4_;
            auVar75._12_4_ = auVar123._12_4_ * auVar122._12_4_;
            auVar75._16_4_ = auVar123._16_4_ * auVar122._16_4_;
            auVar75._20_4_ = auVar123._20_4_ * auVar122._20_4_;
            auVar75._24_4_ = auVar123._24_4_ * auVar122._24_4_;
            auVar75._28_4_ = auVar124._28_4_;
            auVar8 = vfmsub231ps_fma(auVar75,auVar125,auVar135);
            auVar76._4_4_ = auVar135._4_4_ * auVar134._4_4_;
            auVar76._0_4_ = auVar135._0_4_ * auVar134._0_4_;
            auVar76._8_4_ = auVar135._8_4_ * auVar134._8_4_;
            auVar76._12_4_ = auVar135._12_4_ * auVar134._12_4_;
            auVar76._16_4_ = auVar135._16_4_ * auVar134._16_4_;
            auVar76._20_4_ = auVar135._20_4_ * auVar134._20_4_;
            auVar76._24_4_ = auVar135._24_4_ * auVar134._24_4_;
            auVar76._28_4_ = auVar135._28_4_;
            auVar172 = vfmsub231ps_fma(auVar76,auVar126,auVar123);
            auVar77._4_4_ = auVar125._4_4_ * auVar126._4_4_;
            auVar77._0_4_ = auVar125._0_4_ * auVar126._0_4_;
            auVar77._8_4_ = auVar125._8_4_ * auVar126._8_4_;
            auVar77._12_4_ = auVar125._12_4_ * auVar126._12_4_;
            auVar77._16_4_ = auVar125._16_4_ * auVar126._16_4_;
            auVar77._20_4_ = auVar125._20_4_ * auVar126._20_4_;
            auVar77._24_4_ = auVar125._24_4_ * auVar126._24_4_;
            auVar77._28_4_ = auVar125._28_4_;
            auVar115 = vfmsub231ps_fma(auVar77,auVar134,auVar122);
            auVar116 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar172),ZEXT1632(auVar115));
            auVar117 = vfmadd231ps_fma(ZEXT1632(auVar116),ZEXT1632(auVar8),
                                       ZEXT1232(ZEXT412(0)) << 0x20);
            auVar124 = vrcp14ps_avx512vl(ZEXT1632(auVar117));
            auVar223 = ZEXT3264(auVar124);
            auVar43._8_4_ = 0x3f800000;
            auVar43._0_8_ = 0x3f8000003f800000;
            auVar43._12_4_ = 0x3f800000;
            auVar43._16_4_ = 0x3f800000;
            auVar43._20_4_ = 0x3f800000;
            auVar43._24_4_ = 0x3f800000;
            auVar43._28_4_ = 0x3f800000;
            auVar122 = vfnmadd213ps_avx512vl(auVar124,ZEXT1632(auVar117),auVar43);
            auVar116 = vfmadd132ps_fma(auVar122,auVar124,auVar124);
            auVar219 = ZEXT1664(auVar116);
            auVar78._4_4_ = auVar115._4_4_ * auVar152._4_4_;
            auVar78._0_4_ = auVar115._0_4_ * auVar152._0_4_;
            auVar78._8_4_ = auVar115._8_4_ * auVar152._8_4_;
            auVar78._12_4_ = auVar115._12_4_ * auVar152._12_4_;
            auVar78._16_4_ = fVar187 * 0.0;
            auVar78._20_4_ = fVar170 * 0.0;
            auVar78._24_4_ = fVar183 * 0.0;
            auVar78._28_4_ = iVar1;
            auVar172 = vfmadd231ps_fma(auVar78,auVar127,ZEXT1632(auVar172));
            auVar172 = vfmadd231ps_fma(ZEXT1632(auVar172),auVar133,ZEXT1632(auVar8));
            fVar187 = auVar116._0_4_;
            fVar170 = auVar116._4_4_;
            fVar183 = auVar116._8_4_;
            fVar184 = auVar116._12_4_;
            local_580 = ZEXT1632(CONCAT412(auVar172._12_4_ * fVar184,
                                           CONCAT48(auVar172._8_4_ * fVar183,
                                                    CONCAT44(auVar172._4_4_ * fVar170,
                                                             auVar172._0_4_ * fVar187))));
            auVar240 = ZEXT3264(local_580);
            uVar33 = vcmpps_avx512vl(local_580,auVar238,2);
            auVar97._4_4_ = uStack_71c;
            auVar97._0_4_ = local_720;
            auVar97._8_4_ = uStack_718;
            auVar97._12_4_ = uStack_714;
            auVar97._16_4_ = uStack_710;
            auVar97._20_4_ = uStack_70c;
            auVar97._24_4_ = uStack_708;
            auVar97._28_4_ = uStack_704;
            uVar34 = vcmpps_avx512vl(local_580,auVar97,0xd);
            bVar108 = (byte)uVar33 & (byte)uVar34 & bVar108;
            if (bVar108 != 0) {
              uVar103 = vcmpps_avx512vl(ZEXT1632(auVar117),ZEXT1232(ZEXT412(0)) << 0x20,4);
              uVar103 = bVar108 & uVar103;
              if ((char)uVar103 != '\0') {
                fVar194 = auVar128._0_4_ * fVar187;
                fVar208 = auVar128._4_4_ * fVar170;
                auVar79._4_4_ = fVar208;
                auVar79._0_4_ = fVar194;
                fVar109 = auVar128._8_4_ * fVar183;
                auVar79._8_4_ = fVar109;
                fVar110 = auVar128._12_4_ * fVar184;
                auVar79._12_4_ = fVar110;
                fVar193 = auVar128._16_4_ * 0.0;
                auVar79._16_4_ = fVar193;
                fVar162 = auVar128._20_4_ * 0.0;
                auVar79._20_4_ = fVar162;
                fVar163 = auVar128._24_4_ * 0.0;
                auVar79._24_4_ = fVar163;
                auVar79._28_4_ = auVar128._28_4_;
                auVar192._8_4_ = 0x3f800000;
                auVar192._0_8_ = 0x3f8000003f800000;
                auVar192._12_4_ = 0x3f800000;
                auVar192._16_4_ = 0x3f800000;
                auVar192._20_4_ = 0x3f800000;
                auVar192._24_4_ = 0x3f800000;
                auVar192._28_4_ = 0x3f800000;
                auVar124 = vsubps_avx(auVar192,auVar79);
                local_5c0._0_4_ =
                     (float)((uint)(bVar98 & 1) * (int)fVar194 |
                            (uint)!(bool)(bVar98 & 1) * auVar124._0_4_);
                bVar17 = (bool)((byte)(uVar99 >> 1) & 1);
                local_5c0._4_4_ =
                     (float)((uint)bVar17 * (int)fVar208 | (uint)!bVar17 * auVar124._4_4_);
                bVar17 = (bool)((byte)(uVar99 >> 2) & 1);
                local_5c0._8_4_ =
                     (float)((uint)bVar17 * (int)fVar109 | (uint)!bVar17 * auVar124._8_4_);
                bVar17 = (bool)((byte)(uVar99 >> 3) & 1);
                local_5c0._12_4_ =
                     (float)((uint)bVar17 * (int)fVar110 | (uint)!bVar17 * auVar124._12_4_);
                bVar17 = (bool)((byte)(uVar99 >> 4) & 1);
                local_5c0._16_4_ =
                     (float)((uint)bVar17 * (int)fVar193 | (uint)!bVar17 * auVar124._16_4_);
                bVar17 = (bool)((byte)(uVar99 >> 5) & 1);
                local_5c0._20_4_ =
                     (float)((uint)bVar17 * (int)fVar162 | (uint)!bVar17 * auVar124._20_4_);
                bVar17 = (bool)((byte)(uVar99 >> 6) & 1);
                local_5c0._24_4_ =
                     (float)((uint)bVar17 * (int)fVar163 | (uint)!bVar17 * auVar124._24_4_);
                bVar17 = SUB81(uVar99 >> 7,0);
                local_5c0._28_4_ =
                     (float)((uint)bVar17 * auVar128._28_4_ | (uint)!bVar17 * auVar124._28_4_);
                auVar124 = vsubps_avx(auVar129,auVar121);
                auVar116 = vfmadd213ps_fma(auVar124,local_5c0,auVar121);
                uVar171 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x40);
                auVar44._4_4_ = uVar171;
                auVar44._0_4_ = uVar171;
                auVar44._8_4_ = uVar171;
                auVar44._12_4_ = uVar171;
                auVar44._16_4_ = uVar171;
                auVar44._20_4_ = uVar171;
                auVar44._24_4_ = uVar171;
                auVar44._28_4_ = uVar171;
                auVar124 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar116._12_4_ + auVar116._12_4_,
                                                              CONCAT48(auVar116._8_4_ +
                                                                       auVar116._8_4_,
                                                                       CONCAT44(auVar116._4_4_ +
                                                                                auVar116._4_4_,
                                                                                auVar116._0_4_ +
                                                                                auVar116._0_4_)))),
                                           auVar44);
                uVar35 = vcmpps_avx512vl(local_580,auVar124,6);
                uVar103 = uVar103 & uVar35;
                bVar108 = (byte)uVar103;
                if (bVar108 != 0) {
                  auVar186._0_4_ = auVar130._0_4_ * fVar187;
                  auVar186._4_4_ = auVar130._4_4_ * fVar170;
                  auVar186._8_4_ = auVar130._8_4_ * fVar183;
                  auVar186._12_4_ = auVar130._12_4_ * fVar184;
                  auVar186._16_4_ = auVar130._16_4_ * 0.0;
                  auVar186._20_4_ = auVar130._20_4_ * 0.0;
                  auVar186._24_4_ = auVar130._24_4_ * 0.0;
                  auVar186._28_4_ = 0;
                  auVar207._8_4_ = 0x3f800000;
                  auVar207._0_8_ = 0x3f8000003f800000;
                  auVar207._12_4_ = 0x3f800000;
                  auVar207._16_4_ = 0x3f800000;
                  auVar207._20_4_ = 0x3f800000;
                  auVar207._24_4_ = 0x3f800000;
                  auVar207._28_4_ = 0x3f800000;
                  auVar124 = vsubps_avx(auVar207,auVar186);
                  auVar157._0_4_ =
                       (uint)(bVar98 & 1) * (int)auVar186._0_4_ |
                       (uint)!(bool)(bVar98 & 1) * auVar124._0_4_;
                  bVar17 = (bool)((byte)(uVar99 >> 1) & 1);
                  auVar157._4_4_ =
                       (uint)bVar17 * (int)auVar186._4_4_ | (uint)!bVar17 * auVar124._4_4_;
                  bVar17 = (bool)((byte)(uVar99 >> 2) & 1);
                  auVar157._8_4_ =
                       (uint)bVar17 * (int)auVar186._8_4_ | (uint)!bVar17 * auVar124._8_4_;
                  bVar17 = (bool)((byte)(uVar99 >> 3) & 1);
                  auVar157._12_4_ =
                       (uint)bVar17 * (int)auVar186._12_4_ | (uint)!bVar17 * auVar124._12_4_;
                  bVar17 = (bool)((byte)(uVar99 >> 4) & 1);
                  auVar157._16_4_ =
                       (uint)bVar17 * (int)auVar186._16_4_ | (uint)!bVar17 * auVar124._16_4_;
                  bVar17 = (bool)((byte)(uVar99 >> 5) & 1);
                  auVar157._20_4_ =
                       (uint)bVar17 * (int)auVar186._20_4_ | (uint)!bVar17 * auVar124._20_4_;
                  bVar17 = (bool)((byte)(uVar99 >> 6) & 1);
                  auVar157._24_4_ =
                       (uint)bVar17 * (int)auVar186._24_4_ | (uint)!bVar17 * auVar124._24_4_;
                  auVar157._28_4_ = (uint)!SUB81(uVar99 >> 7,0) * auVar124._28_4_;
                  auVar45._8_4_ = 0x40000000;
                  auVar45._0_8_ = 0x4000000040000000;
                  auVar45._12_4_ = 0x40000000;
                  auVar45._16_4_ = 0x40000000;
                  auVar45._20_4_ = 0x40000000;
                  auVar45._24_4_ = 0x40000000;
                  auVar45._28_4_ = 0x40000000;
                  local_5a0 = vfmsub132ps_avx512vl(auVar157,auVar207,auVar45);
                  local_560 = (undefined4)lVar106;
                  pGVar107 = (context->scene->geometries).items[uVar104].ptr;
                  if ((pGVar107->mask & *(uint *)(ray + k * 4 + 0x240)) != 0) {
                    auVar116 = vcvtsi2ss_avx512f(auVar118,local_560);
                    fVar187 = auVar116._0_4_;
                    local_500[0] = (fVar187 + local_5c0._0_4_ + 0.0) * (float)local_7a0;
                    local_500[1] = (fVar187 + local_5c0._4_4_ + 1.0) * local_7a0._4_4_;
                    local_500[2] = (fVar187 + local_5c0._8_4_ + 2.0) * fStack_798;
                    local_500[3] = (fVar187 + local_5c0._12_4_ + 3.0) * fStack_794;
                    fStack_4f0 = (fVar187 + local_5c0._16_4_ + 4.0) * fStack_790;
                    fStack_4ec = (fVar187 + local_5c0._20_4_ + 5.0) * fStack_78c;
                    fStack_4e8 = (fVar187 + local_5c0._24_4_ + 6.0) * fStack_788;
                    fStack_4e4 = fVar187 + local_5c0._28_4_ + 7.0;
                    local_4e0 = local_5a0;
                    local_4c0 = local_580;
                    auVar177._8_4_ = 0x7f800000;
                    auVar177._0_8_ = 0x7f8000007f800000;
                    auVar177._12_4_ = 0x7f800000;
                    auVar177._16_4_ = 0x7f800000;
                    auVar177._20_4_ = 0x7f800000;
                    auVar177._24_4_ = 0x7f800000;
                    auVar177._28_4_ = 0x7f800000;
                    auVar124 = vblendmps_avx512vl(auVar177,local_580);
                    auVar158._0_4_ =
                         (uint)(bVar108 & 1) * auVar124._0_4_ |
                         (uint)!(bool)(bVar108 & 1) * 0x7f800000;
                    bVar17 = (bool)((byte)(uVar103 >> 1) & 1);
                    auVar158._4_4_ = (uint)bVar17 * auVar124._4_4_ | (uint)!bVar17 * 0x7f800000;
                    bVar17 = (bool)((byte)(uVar103 >> 2) & 1);
                    auVar158._8_4_ = (uint)bVar17 * auVar124._8_4_ | (uint)!bVar17 * 0x7f800000;
                    bVar17 = (bool)((byte)(uVar103 >> 3) & 1);
                    auVar158._12_4_ = (uint)bVar17 * auVar124._12_4_ | (uint)!bVar17 * 0x7f800000;
                    bVar17 = (bool)((byte)(uVar103 >> 4) & 1);
                    auVar158._16_4_ = (uint)bVar17 * auVar124._16_4_ | (uint)!bVar17 * 0x7f800000;
                    bVar17 = (bool)((byte)(uVar103 >> 5) & 1);
                    auVar158._20_4_ = (uint)bVar17 * auVar124._20_4_ | (uint)!bVar17 * 0x7f800000;
                    bVar17 = (bool)((byte)(uVar103 >> 6) & 1);
                    auVar158._24_4_ = (uint)bVar17 * auVar124._24_4_ | (uint)!bVar17 * 0x7f800000;
                    bVar17 = SUB81(uVar103 >> 7,0);
                    auVar158._28_4_ = (uint)bVar17 * auVar124._28_4_ | (uint)!bVar17 * 0x7f800000;
                    auVar124 = vshufps_avx(auVar158,auVar158,0xb1);
                    auVar124 = vminps_avx(auVar158,auVar124);
                    auVar122 = vshufpd_avx(auVar124,auVar124,5);
                    auVar124 = vminps_avx(auVar124,auVar122);
                    auVar122 = vpermpd_avx2(auVar124,0x4e);
                    auVar124 = vminps_avx(auVar124,auVar122);
                    uVar33 = vcmpps_avx512vl(auVar158,auVar124,0);
                    uVar100 = (uint)uVar103;
                    if (((byte)uVar33 & bVar108) != 0) {
                      uVar100 = (uint)((byte)uVar33 & bVar108);
                    }
                    uVar101 = 0;
                    for (; (uVar100 & 1) == 0; uVar100 = uVar100 >> 1 | 0x80000000) {
                      uVar101 = uVar101 + 1;
                    }
                    uVar99 = (ulong)uVar101;
                    if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                       (pGVar107->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                      local_3c0 = vmovdqa64_avx512vl(auVar228._0_32_);
                      local_7c0._0_4_ = iVar102;
                      local_480._0_32_ = local_580;
                      local_808 = uVar105;
                      local_55c = iVar102;
                      local_550 = auVar31;
                      local_540 = uVar32;
                      uStack_538 = uVar36;
                      local_530 = uVar93;
                      uStack_528 = uVar94;
                      local_520 = uVar95;
                      uStack_518 = uVar96;
                      do {
                        local_200 = vbroadcastss_avx512f(ZEXT416((uint)local_500[uVar99]));
                        local_1c0 = vbroadcastss_avx512f(ZEXT416(*(uint *)(local_4e0 + uVar99 * 4)))
                        ;
                        *(undefined4 *)(ray + k * 4 + 0x200) =
                             *(undefined4 *)(local_4c0 + uVar99 * 4);
                        local_840.context = context->user;
                        fVar170 = local_200._0_4_;
                        fVar187 = 1.0 - fVar170;
                        auVar8 = vfnmadd231ss_fma(ZEXT416((uint)(fVar170 * (fVar187 + fVar187))),
                                                  ZEXT416((uint)fVar187),ZEXT416((uint)fVar187));
                        auVar172 = local_200._0_16_;
                        auVar116 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar172,
                                                   ZEXT416(0xc0a00000));
                        auVar117 = vfmadd231ss_fma(ZEXT416((uint)(fVar170 * fVar170 * 3.0)),
                                                   ZEXT416((uint)(fVar170 + fVar170)),auVar116);
                        auVar223 = ZEXT1664(auVar117);
                        auVar116 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar172,
                                                   ZEXT416(0x40000000));
                        auVar116 = vfmadd231ss_fma(ZEXT416((uint)(fVar187 * fVar187 * -3.0)),
                                                   ZEXT416((uint)(fVar187 + fVar187)),auVar116);
                        auVar172 = vfmadd231ss_fma(ZEXT416((uint)(fVar170 * fVar170)),auVar172,
                                                   ZEXT416((uint)(fVar187 * -2.0)));
                        fVar187 = auVar8._0_4_ * 0.5;
                        fVar170 = auVar117._0_4_ * 0.5;
                        fVar183 = auVar116._0_4_ * 0.5;
                        fVar184 = auVar172._0_4_ * 0.5;
                        auVar201._0_4_ = fVar184 * local_880;
                        auVar201._4_4_ = fVar184 * fStack_87c;
                        auVar201._8_4_ = fVar184 * fStack_878;
                        auVar201._12_4_ = fVar184 * fStack_874;
                        auVar217._4_4_ = fVar183;
                        auVar217._0_4_ = fVar183;
                        auVar217._8_4_ = fVar183;
                        auVar217._12_4_ = fVar183;
                        auVar116 = vfmadd132ps_fma(auVar217,auVar201,auVar11);
                        auVar202._4_4_ = fVar170;
                        auVar202._0_4_ = fVar170;
                        auVar202._8_4_ = fVar170;
                        auVar202._12_4_ = fVar170;
                        auVar116 = vfmadd132ps_fma(auVar202,auVar116,auVar12);
                        auVar173._4_4_ = fVar187;
                        auVar173._0_4_ = fVar187;
                        auVar173._8_4_ = fVar187;
                        auVar173._12_4_ = fVar187;
                        auVar116 = vfmadd213ps_fma(auVar173,auVar31,auVar116);
                        auVar182 = vbroadcastss_avx512f(auVar116);
                        auVar214 = vbroadcastss_avx512f(ZEXT416(1));
                        auVar214 = vpermps_avx512f(auVar214,ZEXT1664(auVar116));
                        auVar219 = vbroadcastss_avx512f(ZEXT416(2));
                        local_240 = vpermps_avx512f(auVar219,ZEXT1664(auVar116));
                        local_2c0[0] = (RTCHitN)auVar182[0];
                        local_2c0[1] = (RTCHitN)auVar182[1];
                        local_2c0[2] = (RTCHitN)auVar182[2];
                        local_2c0[3] = (RTCHitN)auVar182[3];
                        local_2c0[4] = (RTCHitN)auVar182[4];
                        local_2c0[5] = (RTCHitN)auVar182[5];
                        local_2c0[6] = (RTCHitN)auVar182[6];
                        local_2c0[7] = (RTCHitN)auVar182[7];
                        local_2c0[8] = (RTCHitN)auVar182[8];
                        local_2c0[9] = (RTCHitN)auVar182[9];
                        local_2c0[10] = (RTCHitN)auVar182[10];
                        local_2c0[0xb] = (RTCHitN)auVar182[0xb];
                        local_2c0[0xc] = (RTCHitN)auVar182[0xc];
                        local_2c0[0xd] = (RTCHitN)auVar182[0xd];
                        local_2c0[0xe] = (RTCHitN)auVar182[0xe];
                        local_2c0[0xf] = (RTCHitN)auVar182[0xf];
                        local_2c0[0x10] = (RTCHitN)auVar182[0x10];
                        local_2c0[0x11] = (RTCHitN)auVar182[0x11];
                        local_2c0[0x12] = (RTCHitN)auVar182[0x12];
                        local_2c0[0x13] = (RTCHitN)auVar182[0x13];
                        local_2c0[0x14] = (RTCHitN)auVar182[0x14];
                        local_2c0[0x15] = (RTCHitN)auVar182[0x15];
                        local_2c0[0x16] = (RTCHitN)auVar182[0x16];
                        local_2c0[0x17] = (RTCHitN)auVar182[0x17];
                        local_2c0[0x18] = (RTCHitN)auVar182[0x18];
                        local_2c0[0x19] = (RTCHitN)auVar182[0x19];
                        local_2c0[0x1a] = (RTCHitN)auVar182[0x1a];
                        local_2c0[0x1b] = (RTCHitN)auVar182[0x1b];
                        local_2c0[0x1c] = (RTCHitN)auVar182[0x1c];
                        local_2c0[0x1d] = (RTCHitN)auVar182[0x1d];
                        local_2c0[0x1e] = (RTCHitN)auVar182[0x1e];
                        local_2c0[0x1f] = (RTCHitN)auVar182[0x1f];
                        local_2c0[0x20] = (RTCHitN)auVar182[0x20];
                        local_2c0[0x21] = (RTCHitN)auVar182[0x21];
                        local_2c0[0x22] = (RTCHitN)auVar182[0x22];
                        local_2c0[0x23] = (RTCHitN)auVar182[0x23];
                        local_2c0[0x24] = (RTCHitN)auVar182[0x24];
                        local_2c0[0x25] = (RTCHitN)auVar182[0x25];
                        local_2c0[0x26] = (RTCHitN)auVar182[0x26];
                        local_2c0[0x27] = (RTCHitN)auVar182[0x27];
                        local_2c0[0x28] = (RTCHitN)auVar182[0x28];
                        local_2c0[0x29] = (RTCHitN)auVar182[0x29];
                        local_2c0[0x2a] = (RTCHitN)auVar182[0x2a];
                        local_2c0[0x2b] = (RTCHitN)auVar182[0x2b];
                        local_2c0[0x2c] = (RTCHitN)auVar182[0x2c];
                        local_2c0[0x2d] = (RTCHitN)auVar182[0x2d];
                        local_2c0[0x2e] = (RTCHitN)auVar182[0x2e];
                        local_2c0[0x2f] = (RTCHitN)auVar182[0x2f];
                        local_2c0[0x30] = (RTCHitN)auVar182[0x30];
                        local_2c0[0x31] = (RTCHitN)auVar182[0x31];
                        local_2c0[0x32] = (RTCHitN)auVar182[0x32];
                        local_2c0[0x33] = (RTCHitN)auVar182[0x33];
                        local_2c0[0x34] = (RTCHitN)auVar182[0x34];
                        local_2c0[0x35] = (RTCHitN)auVar182[0x35];
                        local_2c0[0x36] = (RTCHitN)auVar182[0x36];
                        local_2c0[0x37] = (RTCHitN)auVar182[0x37];
                        local_2c0[0x38] = (RTCHitN)auVar182[0x38];
                        local_2c0[0x39] = (RTCHitN)auVar182[0x39];
                        local_2c0[0x3a] = (RTCHitN)auVar182[0x3a];
                        local_2c0[0x3b] = (RTCHitN)auVar182[0x3b];
                        local_2c0[0x3c] = (RTCHitN)auVar182[0x3c];
                        local_2c0[0x3d] = (RTCHitN)auVar182[0x3d];
                        local_2c0[0x3e] = (RTCHitN)auVar182[0x3e];
                        local_2c0[0x3f] = (RTCHitN)auVar182[0x3f];
                        local_280 = auVar214;
                        local_180 = local_400._0_8_;
                        uStack_178 = local_400._8_8_;
                        uStack_170 = local_400._16_8_;
                        uStack_168 = local_400._24_8_;
                        uStack_160 = local_400._32_8_;
                        uStack_158 = local_400._40_8_;
                        uStack_150 = local_400._48_8_;
                        uStack_148 = local_400._56_8_;
                        auVar182 = vmovdqa64_avx512f(local_440);
                        local_140 = vmovdqa64_avx512f(auVar182);
                        auVar124 = vpcmpeqd_avx2(auVar182._0_32_,auVar182._0_32_);
                        local_810[3] = auVar124;
                        local_810[2] = auVar124;
                        local_810[1] = auVar124;
                        *local_810 = auVar124;
                        local_100 = vbroadcastss_avx512f(ZEXT416((local_840.context)->instID[0]));
                        local_c0 = vbroadcastss_avx512f(ZEXT416((local_840.context)->instPrimID[0]))
                        ;
                        auVar182 = vmovdqa64_avx512f(local_300);
                        local_700 = vmovdqa64_avx512f(auVar182);
                        local_840.valid = (int *)local_700;
                        local_840.geometryUserPtr = pGVar107->userPtr;
                        local_840.hit = local_2c0;
                        local_840.N = 0x10;
                        local_7e0 = auVar239._0_32_;
                        local_840.ray = (RTCRayN *)ray;
                        if (pGVar107->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                          auVar214 = ZEXT1664(auVar214._0_16_);
                          auVar219 = ZEXT1664(auVar219._0_16_);
                          auVar223 = ZEXT1664(auVar117);
                          (*pGVar107->intersectionFilterN)(&local_840);
                          auVar240 = ZEXT3264(local_480._0_32_);
                          auVar239 = ZEXT3264(local_7e0);
                          auVar182 = vmovdqa64_avx512f(local_700);
                        }
                        uVar33 = vptestmd_avx512f(auVar182,auVar182);
                        if ((short)uVar33 == 0) {
LAB_01d2d142:
                          *(int *)(ray + k * 4 + 0x200) = auVar239._0_4_;
                        }
                        else {
                          p_Var16 = context->args->filter;
                          if ((p_Var16 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar107->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar214 = ZEXT1664(auVar214._0_16_);
                            auVar219 = ZEXT1664(auVar219._0_16_);
                            auVar223 = ZEXT1664(auVar223._0_16_);
                            (*p_Var16)(&local_840);
                            auVar240 = ZEXT3264(local_480._0_32_);
                            auVar239 = ZEXT3264(local_7e0);
                            auVar182 = vmovdqa64_avx512f(local_700);
                          }
                          uVar105 = vptestmd_avx512f(auVar182,auVar182);
                          if ((short)uVar105 == 0) goto LAB_01d2d142;
                          iVar102 = *(int *)(local_840.hit + 4);
                          iVar1 = *(int *)(local_840.hit + 8);
                          iVar2 = *(int *)(local_840.hit + 0xc);
                          iVar80 = *(int *)(local_840.hit + 0x10);
                          iVar81 = *(int *)(local_840.hit + 0x14);
                          iVar82 = *(int *)(local_840.hit + 0x18);
                          iVar83 = *(int *)(local_840.hit + 0x1c);
                          iVar84 = *(int *)(local_840.hit + 0x20);
                          iVar85 = *(int *)(local_840.hit + 0x24);
                          iVar86 = *(int *)(local_840.hit + 0x28);
                          iVar87 = *(int *)(local_840.hit + 0x2c);
                          iVar88 = *(int *)(local_840.hit + 0x30);
                          iVar89 = *(int *)(local_840.hit + 0x34);
                          iVar90 = *(int *)(local_840.hit + 0x38);
                          iVar91 = *(int *)(local_840.hit + 0x3c);
                          bVar108 = (byte)uVar105;
                          bVar17 = (bool)((byte)(uVar105 >> 1) & 1);
                          bVar18 = (bool)((byte)(uVar105 >> 2) & 1);
                          bVar19 = (bool)((byte)(uVar105 >> 3) & 1);
                          bVar20 = (bool)((byte)(uVar105 >> 4) & 1);
                          bVar21 = (bool)((byte)(uVar105 >> 5) & 1);
                          bVar22 = (bool)((byte)(uVar105 >> 6) & 1);
                          bVar23 = (bool)((byte)(uVar105 >> 7) & 1);
                          bVar98 = (byte)(uVar105 >> 8);
                          bVar24 = (bool)((byte)(uVar105 >> 9) & 1);
                          bVar25 = (bool)((byte)(uVar105 >> 10) & 1);
                          bVar26 = (bool)((byte)(uVar105 >> 0xb) & 1);
                          bVar27 = (bool)((byte)(uVar105 >> 0xc) & 1);
                          bVar28 = (bool)((byte)(uVar105 >> 0xd) & 1);
                          bVar29 = (bool)((byte)(uVar105 >> 0xe) & 1);
                          bVar30 = SUB81(uVar105 >> 0xf,0);
                          *(uint *)(local_840.ray + 0x300) =
                               (uint)(bVar108 & 1) * *(int *)local_840.hit |
                               (uint)!(bool)(bVar108 & 1) * *(int *)(local_840.ray + 0x300);
                          *(uint *)(local_840.ray + 0x304) =
                               (uint)bVar17 * iVar102 |
                               (uint)!bVar17 * *(int *)(local_840.ray + 0x304);
                          *(uint *)(local_840.ray + 0x308) =
                               (uint)bVar18 * iVar1 |
                               (uint)!bVar18 * *(int *)(local_840.ray + 0x308);
                          *(uint *)(local_840.ray + 0x30c) =
                               (uint)bVar19 * iVar2 |
                               (uint)!bVar19 * *(int *)(local_840.ray + 0x30c);
                          *(uint *)(local_840.ray + 0x310) =
                               (uint)bVar20 * iVar80 |
                               (uint)!bVar20 * *(int *)(local_840.ray + 0x310);
                          *(uint *)(local_840.ray + 0x314) =
                               (uint)bVar21 * iVar81 |
                               (uint)!bVar21 * *(int *)(local_840.ray + 0x314);
                          *(uint *)(local_840.ray + 0x318) =
                               (uint)bVar22 * iVar82 |
                               (uint)!bVar22 * *(int *)(local_840.ray + 0x318);
                          *(uint *)(local_840.ray + 0x31c) =
                               (uint)bVar23 * iVar83 |
                               (uint)!bVar23 * *(int *)(local_840.ray + 0x31c);
                          *(uint *)(local_840.ray + 800) =
                               (uint)(bVar98 & 1) * iVar84 |
                               (uint)!(bool)(bVar98 & 1) * *(int *)(local_840.ray + 800);
                          *(uint *)(local_840.ray + 0x324) =
                               (uint)bVar24 * iVar85 |
                               (uint)!bVar24 * *(int *)(local_840.ray + 0x324);
                          *(uint *)(local_840.ray + 0x328) =
                               (uint)bVar25 * iVar86 |
                               (uint)!bVar25 * *(int *)(local_840.ray + 0x328);
                          *(uint *)(local_840.ray + 0x32c) =
                               (uint)bVar26 * iVar87 |
                               (uint)!bVar26 * *(int *)(local_840.ray + 0x32c);
                          *(uint *)(local_840.ray + 0x330) =
                               (uint)bVar27 * iVar88 |
                               (uint)!bVar27 * *(int *)(local_840.ray + 0x330);
                          *(uint *)(local_840.ray + 0x334) =
                               (uint)bVar28 * iVar89 |
                               (uint)!bVar28 * *(int *)(local_840.ray + 0x334);
                          *(uint *)(local_840.ray + 0x338) =
                               (uint)bVar29 * iVar90 |
                               (uint)!bVar29 * *(int *)(local_840.ray + 0x338);
                          *(uint *)(local_840.ray + 0x33c) =
                               (uint)bVar30 * iVar91 |
                               (uint)!bVar30 * *(int *)(local_840.ray + 0x33c);
                          iVar102 = *(int *)(local_840.hit + 0x44);
                          iVar1 = *(int *)(local_840.hit + 0x48);
                          iVar2 = *(int *)(local_840.hit + 0x4c);
                          iVar80 = *(int *)(local_840.hit + 0x50);
                          iVar81 = *(int *)(local_840.hit + 0x54);
                          iVar82 = *(int *)(local_840.hit + 0x58);
                          iVar83 = *(int *)(local_840.hit + 0x5c);
                          iVar84 = *(int *)(local_840.hit + 0x60);
                          iVar85 = *(int *)(local_840.hit + 100);
                          iVar86 = *(int *)(local_840.hit + 0x68);
                          iVar87 = *(int *)(local_840.hit + 0x6c);
                          iVar88 = *(int *)(local_840.hit + 0x70);
                          iVar89 = *(int *)(local_840.hit + 0x74);
                          iVar90 = *(int *)(local_840.hit + 0x78);
                          iVar91 = *(int *)(local_840.hit + 0x7c);
                          bVar17 = (bool)((byte)(uVar105 >> 1) & 1);
                          bVar18 = (bool)((byte)(uVar105 >> 2) & 1);
                          bVar19 = (bool)((byte)(uVar105 >> 3) & 1);
                          bVar20 = (bool)((byte)(uVar105 >> 4) & 1);
                          bVar21 = (bool)((byte)(uVar105 >> 5) & 1);
                          bVar22 = (bool)((byte)(uVar105 >> 6) & 1);
                          bVar23 = (bool)((byte)(uVar105 >> 7) & 1);
                          bVar24 = (bool)((byte)(uVar105 >> 9) & 1);
                          bVar25 = (bool)((byte)(uVar105 >> 10) & 1);
                          bVar26 = (bool)((byte)(uVar105 >> 0xb) & 1);
                          bVar27 = (bool)((byte)(uVar105 >> 0xc) & 1);
                          bVar28 = (bool)((byte)(uVar105 >> 0xd) & 1);
                          bVar29 = (bool)((byte)(uVar105 >> 0xe) & 1);
                          bVar30 = SUB81(uVar105 >> 0xf,0);
                          *(uint *)(local_840.ray + 0x340) =
                               (uint)(bVar108 & 1) * *(int *)(local_840.hit + 0x40) |
                               (uint)!(bool)(bVar108 & 1) * *(int *)(local_840.ray + 0x340);
                          *(uint *)(local_840.ray + 0x344) =
                               (uint)bVar17 * iVar102 |
                               (uint)!bVar17 * *(int *)(local_840.ray + 0x344);
                          *(uint *)(local_840.ray + 0x348) =
                               (uint)bVar18 * iVar1 |
                               (uint)!bVar18 * *(int *)(local_840.ray + 0x348);
                          *(uint *)(local_840.ray + 0x34c) =
                               (uint)bVar19 * iVar2 |
                               (uint)!bVar19 * *(int *)(local_840.ray + 0x34c);
                          *(uint *)(local_840.ray + 0x350) =
                               (uint)bVar20 * iVar80 |
                               (uint)!bVar20 * *(int *)(local_840.ray + 0x350);
                          *(uint *)(local_840.ray + 0x354) =
                               (uint)bVar21 * iVar81 |
                               (uint)!bVar21 * *(int *)(local_840.ray + 0x354);
                          *(uint *)(local_840.ray + 0x358) =
                               (uint)bVar22 * iVar82 |
                               (uint)!bVar22 * *(int *)(local_840.ray + 0x358);
                          *(uint *)(local_840.ray + 0x35c) =
                               (uint)bVar23 * iVar83 |
                               (uint)!bVar23 * *(int *)(local_840.ray + 0x35c);
                          *(uint *)(local_840.ray + 0x360) =
                               (uint)(bVar98 & 1) * iVar84 |
                               (uint)!(bool)(bVar98 & 1) * *(int *)(local_840.ray + 0x360);
                          *(uint *)(local_840.ray + 0x364) =
                               (uint)bVar24 * iVar85 |
                               (uint)!bVar24 * *(int *)(local_840.ray + 0x364);
                          *(uint *)(local_840.ray + 0x368) =
                               (uint)bVar25 * iVar86 |
                               (uint)!bVar25 * *(int *)(local_840.ray + 0x368);
                          *(uint *)(local_840.ray + 0x36c) =
                               (uint)bVar26 * iVar87 |
                               (uint)!bVar26 * *(int *)(local_840.ray + 0x36c);
                          *(uint *)(local_840.ray + 0x370) =
                               (uint)bVar27 * iVar88 |
                               (uint)!bVar27 * *(int *)(local_840.ray + 0x370);
                          *(uint *)(local_840.ray + 0x374) =
                               (uint)bVar28 * iVar89 |
                               (uint)!bVar28 * *(int *)(local_840.ray + 0x374);
                          *(uint *)(local_840.ray + 0x378) =
                               (uint)bVar29 * iVar90 |
                               (uint)!bVar29 * *(int *)(local_840.ray + 0x378);
                          *(uint *)(local_840.ray + 0x37c) =
                               (uint)bVar30 * iVar91 |
                               (uint)!bVar30 * *(int *)(local_840.ray + 0x37c);
                          iVar102 = *(int *)(local_840.hit + 0x84);
                          iVar1 = *(int *)(local_840.hit + 0x88);
                          iVar2 = *(int *)(local_840.hit + 0x8c);
                          iVar80 = *(int *)(local_840.hit + 0x90);
                          iVar81 = *(int *)(local_840.hit + 0x94);
                          iVar82 = *(int *)(local_840.hit + 0x98);
                          iVar83 = *(int *)(local_840.hit + 0x9c);
                          iVar84 = *(int *)(local_840.hit + 0xa0);
                          iVar85 = *(int *)(local_840.hit + 0xa4);
                          iVar86 = *(int *)(local_840.hit + 0xa8);
                          iVar87 = *(int *)(local_840.hit + 0xac);
                          iVar88 = *(int *)(local_840.hit + 0xb0);
                          iVar89 = *(int *)(local_840.hit + 0xb4);
                          iVar90 = *(int *)(local_840.hit + 0xb8);
                          iVar91 = *(int *)(local_840.hit + 0xbc);
                          bVar17 = (bool)((byte)(uVar105 >> 1) & 1);
                          bVar18 = (bool)((byte)(uVar105 >> 2) & 1);
                          bVar19 = (bool)((byte)(uVar105 >> 3) & 1);
                          bVar20 = (bool)((byte)(uVar105 >> 4) & 1);
                          bVar21 = (bool)((byte)(uVar105 >> 5) & 1);
                          bVar22 = (bool)((byte)(uVar105 >> 6) & 1);
                          bVar23 = (bool)((byte)(uVar105 >> 7) & 1);
                          bVar24 = (bool)((byte)(uVar105 >> 9) & 1);
                          bVar25 = (bool)((byte)(uVar105 >> 10) & 1);
                          bVar26 = (bool)((byte)(uVar105 >> 0xb) & 1);
                          bVar27 = (bool)((byte)(uVar105 >> 0xc) & 1);
                          bVar28 = (bool)((byte)(uVar105 >> 0xd) & 1);
                          bVar29 = (bool)((byte)(uVar105 >> 0xe) & 1);
                          bVar30 = SUB81(uVar105 >> 0xf,0);
                          *(uint *)(local_840.ray + 0x380) =
                               (uint)(bVar108 & 1) * *(int *)(local_840.hit + 0x80) |
                               (uint)!(bool)(bVar108 & 1) * *(int *)(local_840.ray + 0x380);
                          *(uint *)(local_840.ray + 900) =
                               (uint)bVar17 * iVar102 |
                               (uint)!bVar17 * *(int *)(local_840.ray + 900);
                          *(uint *)(local_840.ray + 0x388) =
                               (uint)bVar18 * iVar1 |
                               (uint)!bVar18 * *(int *)(local_840.ray + 0x388);
                          *(uint *)(local_840.ray + 0x38c) =
                               (uint)bVar19 * iVar2 |
                               (uint)!bVar19 * *(int *)(local_840.ray + 0x38c);
                          *(uint *)(local_840.ray + 0x390) =
                               (uint)bVar20 * iVar80 |
                               (uint)!bVar20 * *(int *)(local_840.ray + 0x390);
                          *(uint *)(local_840.ray + 0x394) =
                               (uint)bVar21 * iVar81 |
                               (uint)!bVar21 * *(int *)(local_840.ray + 0x394);
                          *(uint *)(local_840.ray + 0x398) =
                               (uint)bVar22 * iVar82 |
                               (uint)!bVar22 * *(int *)(local_840.ray + 0x398);
                          *(uint *)(local_840.ray + 0x39c) =
                               (uint)bVar23 * iVar83 |
                               (uint)!bVar23 * *(int *)(local_840.ray + 0x39c);
                          *(uint *)(local_840.ray + 0x3a0) =
                               (uint)(bVar98 & 1) * iVar84 |
                               (uint)!(bool)(bVar98 & 1) * *(int *)(local_840.ray + 0x3a0);
                          *(uint *)(local_840.ray + 0x3a4) =
                               (uint)bVar24 * iVar85 |
                               (uint)!bVar24 * *(int *)(local_840.ray + 0x3a4);
                          *(uint *)(local_840.ray + 0x3a8) =
                               (uint)bVar25 * iVar86 |
                               (uint)!bVar25 * *(int *)(local_840.ray + 0x3a8);
                          *(uint *)(local_840.ray + 0x3ac) =
                               (uint)bVar26 * iVar87 |
                               (uint)!bVar26 * *(int *)(local_840.ray + 0x3ac);
                          *(uint *)(local_840.ray + 0x3b0) =
                               (uint)bVar27 * iVar88 |
                               (uint)!bVar27 * *(int *)(local_840.ray + 0x3b0);
                          *(uint *)(local_840.ray + 0x3b4) =
                               (uint)bVar28 * iVar89 |
                               (uint)!bVar28 * *(int *)(local_840.ray + 0x3b4);
                          *(uint *)(local_840.ray + 0x3b8) =
                               (uint)bVar29 * iVar90 |
                               (uint)!bVar29 * *(int *)(local_840.ray + 0x3b8);
                          *(uint *)(local_840.ray + 0x3bc) =
                               (uint)bVar30 * iVar91 |
                               (uint)!bVar30 * *(int *)(local_840.ray + 0x3bc);
                          iVar102 = *(int *)(local_840.hit + 0xc4);
                          iVar1 = *(int *)(local_840.hit + 200);
                          iVar2 = *(int *)(local_840.hit + 0xcc);
                          iVar80 = *(int *)(local_840.hit + 0xd0);
                          iVar81 = *(int *)(local_840.hit + 0xd4);
                          iVar82 = *(int *)(local_840.hit + 0xd8);
                          iVar83 = *(int *)(local_840.hit + 0xdc);
                          iVar84 = *(int *)(local_840.hit + 0xe0);
                          iVar85 = *(int *)(local_840.hit + 0xe4);
                          iVar86 = *(int *)(local_840.hit + 0xe8);
                          iVar87 = *(int *)(local_840.hit + 0xec);
                          iVar88 = *(int *)(local_840.hit + 0xf0);
                          iVar89 = *(int *)(local_840.hit + 0xf4);
                          iVar90 = *(int *)(local_840.hit + 0xf8);
                          iVar91 = *(int *)(local_840.hit + 0xfc);
                          bVar17 = (bool)((byte)(uVar105 >> 1) & 1);
                          bVar18 = (bool)((byte)(uVar105 >> 2) & 1);
                          bVar19 = (bool)((byte)(uVar105 >> 3) & 1);
                          bVar20 = (bool)((byte)(uVar105 >> 4) & 1);
                          bVar21 = (bool)((byte)(uVar105 >> 5) & 1);
                          bVar22 = (bool)((byte)(uVar105 >> 6) & 1);
                          bVar23 = (bool)((byte)(uVar105 >> 7) & 1);
                          bVar24 = (bool)((byte)(uVar105 >> 9) & 1);
                          bVar25 = (bool)((byte)(uVar105 >> 10) & 1);
                          bVar26 = (bool)((byte)(uVar105 >> 0xb) & 1);
                          bVar27 = (bool)((byte)(uVar105 >> 0xc) & 1);
                          bVar28 = (bool)((byte)(uVar105 >> 0xd) & 1);
                          bVar29 = (bool)((byte)(uVar105 >> 0xe) & 1);
                          bVar30 = SUB81(uVar105 >> 0xf,0);
                          *(uint *)(local_840.ray + 0x3c0) =
                               (uint)(bVar108 & 1) * *(int *)(local_840.hit + 0xc0) |
                               (uint)!(bool)(bVar108 & 1) * *(int *)(local_840.ray + 0x3c0);
                          *(uint *)(local_840.ray + 0x3c4) =
                               (uint)bVar17 * iVar102 |
                               (uint)!bVar17 * *(int *)(local_840.ray + 0x3c4);
                          *(uint *)(local_840.ray + 0x3c8) =
                               (uint)bVar18 * iVar1 |
                               (uint)!bVar18 * *(int *)(local_840.ray + 0x3c8);
                          *(uint *)(local_840.ray + 0x3cc) =
                               (uint)bVar19 * iVar2 |
                               (uint)!bVar19 * *(int *)(local_840.ray + 0x3cc);
                          *(uint *)(local_840.ray + 0x3d0) =
                               (uint)bVar20 * iVar80 |
                               (uint)!bVar20 * *(int *)(local_840.ray + 0x3d0);
                          *(uint *)(local_840.ray + 0x3d4) =
                               (uint)bVar21 * iVar81 |
                               (uint)!bVar21 * *(int *)(local_840.ray + 0x3d4);
                          *(uint *)(local_840.ray + 0x3d8) =
                               (uint)bVar22 * iVar82 |
                               (uint)!bVar22 * *(int *)(local_840.ray + 0x3d8);
                          *(uint *)(local_840.ray + 0x3dc) =
                               (uint)bVar23 * iVar83 |
                               (uint)!bVar23 * *(int *)(local_840.ray + 0x3dc);
                          *(uint *)(local_840.ray + 0x3e0) =
                               (uint)(bVar98 & 1) * iVar84 |
                               (uint)!(bool)(bVar98 & 1) * *(int *)(local_840.ray + 0x3e0);
                          *(uint *)(local_840.ray + 0x3e4) =
                               (uint)bVar24 * iVar85 |
                               (uint)!bVar24 * *(int *)(local_840.ray + 0x3e4);
                          *(uint *)(local_840.ray + 1000) =
                               (uint)bVar25 * iVar86 |
                               (uint)!bVar25 * *(int *)(local_840.ray + 1000);
                          *(uint *)(local_840.ray + 0x3ec) =
                               (uint)bVar26 * iVar87 |
                               (uint)!bVar26 * *(int *)(local_840.ray + 0x3ec);
                          *(uint *)(local_840.ray + 0x3f0) =
                               (uint)bVar27 * iVar88 |
                               (uint)!bVar27 * *(int *)(local_840.ray + 0x3f0);
                          *(uint *)(local_840.ray + 0x3f4) =
                               (uint)bVar28 * iVar89 |
                               (uint)!bVar28 * *(int *)(local_840.ray + 0x3f4);
                          *(uint *)(local_840.ray + 0x3f8) =
                               (uint)bVar29 * iVar90 |
                               (uint)!bVar29 * *(int *)(local_840.ray + 0x3f8);
                          *(uint *)(local_840.ray + 0x3fc) =
                               (uint)bVar30 * iVar91 |
                               (uint)!bVar30 * *(int *)(local_840.ray + 0x3fc);
                          iVar102 = *(int *)(local_840.hit + 0x104);
                          iVar1 = *(int *)(local_840.hit + 0x108);
                          iVar2 = *(int *)(local_840.hit + 0x10c);
                          iVar80 = *(int *)(local_840.hit + 0x110);
                          iVar81 = *(int *)(local_840.hit + 0x114);
                          iVar82 = *(int *)(local_840.hit + 0x118);
                          iVar83 = *(int *)(local_840.hit + 0x11c);
                          iVar84 = *(int *)(local_840.hit + 0x120);
                          iVar85 = *(int *)(local_840.hit + 0x124);
                          iVar86 = *(int *)(local_840.hit + 0x128);
                          iVar87 = *(int *)(local_840.hit + 300);
                          iVar88 = *(int *)(local_840.hit + 0x130);
                          iVar89 = *(int *)(local_840.hit + 0x134);
                          iVar90 = *(int *)(local_840.hit + 0x138);
                          iVar91 = *(int *)(local_840.hit + 0x13c);
                          bVar17 = (bool)((byte)(uVar105 >> 1) & 1);
                          bVar18 = (bool)((byte)(uVar105 >> 2) & 1);
                          bVar19 = (bool)((byte)(uVar105 >> 3) & 1);
                          bVar20 = (bool)((byte)(uVar105 >> 4) & 1);
                          bVar21 = (bool)((byte)(uVar105 >> 5) & 1);
                          bVar22 = (bool)((byte)(uVar105 >> 6) & 1);
                          bVar23 = (bool)((byte)(uVar105 >> 7) & 1);
                          bVar24 = (bool)((byte)(uVar105 >> 9) & 1);
                          bVar25 = (bool)((byte)(uVar105 >> 10) & 1);
                          bVar26 = (bool)((byte)(uVar105 >> 0xb) & 1);
                          bVar27 = (bool)((byte)(uVar105 >> 0xc) & 1);
                          bVar28 = (bool)((byte)(uVar105 >> 0xd) & 1);
                          bVar29 = (bool)((byte)(uVar105 >> 0xe) & 1);
                          bVar30 = SUB81(uVar105 >> 0xf,0);
                          *(uint *)(local_840.ray + 0x400) =
                               (uint)(bVar108 & 1) * *(int *)(local_840.hit + 0x100) |
                               (uint)!(bool)(bVar108 & 1) * *(int *)(local_840.ray + 0x400);
                          *(uint *)(local_840.ray + 0x404) =
                               (uint)bVar17 * iVar102 |
                               (uint)!bVar17 * *(int *)(local_840.ray + 0x404);
                          *(uint *)(local_840.ray + 0x408) =
                               (uint)bVar18 * iVar1 |
                               (uint)!bVar18 * *(int *)(local_840.ray + 0x408);
                          *(uint *)(local_840.ray + 0x40c) =
                               (uint)bVar19 * iVar2 |
                               (uint)!bVar19 * *(int *)(local_840.ray + 0x40c);
                          *(uint *)(local_840.ray + 0x410) =
                               (uint)bVar20 * iVar80 |
                               (uint)!bVar20 * *(int *)(local_840.ray + 0x410);
                          *(uint *)(local_840.ray + 0x414) =
                               (uint)bVar21 * iVar81 |
                               (uint)!bVar21 * *(int *)(local_840.ray + 0x414);
                          *(uint *)(local_840.ray + 0x418) =
                               (uint)bVar22 * iVar82 |
                               (uint)!bVar22 * *(int *)(local_840.ray + 0x418);
                          *(uint *)(local_840.ray + 0x41c) =
                               (uint)bVar23 * iVar83 |
                               (uint)!bVar23 * *(int *)(local_840.ray + 0x41c);
                          *(uint *)(local_840.ray + 0x420) =
                               (uint)(bVar98 & 1) * iVar84 |
                               (uint)!(bool)(bVar98 & 1) * *(int *)(local_840.ray + 0x420);
                          *(uint *)(local_840.ray + 0x424) =
                               (uint)bVar24 * iVar85 |
                               (uint)!bVar24 * *(int *)(local_840.ray + 0x424);
                          *(uint *)(local_840.ray + 0x428) =
                               (uint)bVar25 * iVar86 |
                               (uint)!bVar25 * *(int *)(local_840.ray + 0x428);
                          *(uint *)(local_840.ray + 0x42c) =
                               (uint)bVar26 * iVar87 |
                               (uint)!bVar26 * *(int *)(local_840.ray + 0x42c);
                          *(uint *)(local_840.ray + 0x430) =
                               (uint)bVar27 * iVar88 |
                               (uint)!bVar27 * *(int *)(local_840.ray + 0x430);
                          *(uint *)(local_840.ray + 0x434) =
                               (uint)bVar28 * iVar89 |
                               (uint)!bVar28 * *(int *)(local_840.ray + 0x434);
                          *(uint *)(local_840.ray + 0x438) =
                               (uint)bVar29 * iVar90 |
                               (uint)!bVar29 * *(int *)(local_840.ray + 0x438);
                          *(uint *)(local_840.ray + 0x43c) =
                               (uint)bVar30 * iVar91 |
                               (uint)!bVar30 * *(int *)(local_840.ray + 0x43c);
                          auVar182 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_840.hit + 0x140)
                                                      );
                          auVar182 = vmovdqu32_avx512f(auVar182);
                          *(undefined1 (*) [64])(local_840.ray + 0x440) = auVar182;
                          auVar182 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_840.hit + 0x180)
                                                      );
                          auVar182 = vmovdqu32_avx512f(auVar182);
                          *(undefined1 (*) [64])(local_840.ray + 0x480) = auVar182;
                          auVar182 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_840.hit + 0x1c0)
                                                      );
                          auVar182 = vmovdqa32_avx512f(auVar182);
                          *(undefined1 (*) [64])(local_840.ray + 0x4c0) = auVar182;
                          auVar182 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_840.hit + 0x200)
                                                      );
                          auVar182 = vmovdqa32_avx512f(auVar182);
                          *(undefined1 (*) [64])(local_840.ray + 0x500) = auVar182;
                          auVar239 = ZEXT464(*(uint *)(ray + k * 4 + 0x200));
                        }
                        bVar108 = ~(byte)(1 << ((uint)uVar99 & 0x1f)) & (byte)uVar103;
                        uVar171 = auVar239._0_4_;
                        auVar178._4_4_ = uVar171;
                        auVar178._0_4_ = uVar171;
                        auVar178._8_4_ = uVar171;
                        auVar178._12_4_ = uVar171;
                        auVar178._16_4_ = uVar171;
                        auVar178._20_4_ = uVar171;
                        auVar178._24_4_ = uVar171;
                        auVar178._28_4_ = uVar171;
                        uVar33 = vcmpps_avx512vl(auVar240._0_32_,auVar178,2);
                        if ((bVar108 & (byte)uVar33) == 0) goto LAB_01d2d1d5;
                        bVar108 = bVar108 & (byte)uVar33;
                        uVar103 = (ulong)bVar108;
                        auVar179._8_4_ = 0x7f800000;
                        auVar179._0_8_ = 0x7f8000007f800000;
                        auVar179._12_4_ = 0x7f800000;
                        auVar179._16_4_ = 0x7f800000;
                        auVar179._20_4_ = 0x7f800000;
                        auVar179._24_4_ = 0x7f800000;
                        auVar179._28_4_ = 0x7f800000;
                        auVar124 = vblendmps_avx512vl(auVar179,auVar240._0_32_);
                        auVar159._0_4_ =
                             (uint)(bVar108 & 1) * auVar124._0_4_ |
                             (uint)!(bool)(bVar108 & 1) * 0x7f800000;
                        bVar17 = (bool)(bVar108 >> 1 & 1);
                        auVar159._4_4_ = (uint)bVar17 * auVar124._4_4_ | (uint)!bVar17 * 0x7f800000;
                        bVar17 = (bool)(bVar108 >> 2 & 1);
                        auVar159._8_4_ = (uint)bVar17 * auVar124._8_4_ | (uint)!bVar17 * 0x7f800000;
                        bVar17 = (bool)(bVar108 >> 3 & 1);
                        auVar159._12_4_ =
                             (uint)bVar17 * auVar124._12_4_ | (uint)!bVar17 * 0x7f800000;
                        bVar17 = (bool)(bVar108 >> 4 & 1);
                        auVar159._16_4_ =
                             (uint)bVar17 * auVar124._16_4_ | (uint)!bVar17 * 0x7f800000;
                        bVar17 = (bool)(bVar108 >> 5 & 1);
                        auVar159._20_4_ =
                             (uint)bVar17 * auVar124._20_4_ | (uint)!bVar17 * 0x7f800000;
                        bVar17 = (bool)(bVar108 >> 6 & 1);
                        auVar159._24_4_ =
                             (uint)bVar17 * auVar124._24_4_ | (uint)!bVar17 * 0x7f800000;
                        auVar159._28_4_ =
                             (uint)(bVar108 >> 7) * auVar124._28_4_ |
                             (uint)!(bool)(bVar108 >> 7) * 0x7f800000;
                        auVar124 = vshufps_avx(auVar159,auVar159,0xb1);
                        auVar124 = vminps_avx(auVar159,auVar124);
                        auVar122 = vshufpd_avx(auVar124,auVar124,5);
                        auVar124 = vminps_avx(auVar124,auVar122);
                        auVar122 = vpermpd_avx2(auVar124,0x4e);
                        auVar124 = vminps_avx(auVar124,auVar122);
                        uVar33 = vcmpps_avx512vl(auVar159,auVar124,0);
                        bVar98 = (byte)uVar33 & bVar108;
                        if (bVar98 != 0) {
                          bVar108 = bVar98;
                        }
                        uVar100 = 0;
                        for (uVar101 = (uint)bVar108; (uVar101 & 1) == 0;
                            uVar101 = uVar101 >> 1 | 0x80000000) {
                          uVar100 = uVar100 + 1;
                        }
                        uVar99 = (ulong)uVar100;
                      } while( true );
                    }
                    fVar187 = local_500[uVar99];
                    uVar171 = *(undefined4 *)(local_4e0 + uVar99 * 4);
                    fVar170 = 1.0 - fVar187;
                    auVar8 = vfnmadd231ss_fma(ZEXT416((uint)(fVar187 * (fVar170 + fVar170))),
                                              ZEXT416((uint)fVar170),ZEXT416((uint)fVar170));
                    auVar172 = ZEXT416((uint)fVar187);
                    auVar116 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar172,
                                               ZEXT416(0xc0a00000));
                    auVar117 = vfmadd231ss_fma(ZEXT416((uint)(fVar187 * fVar187 * 3.0)),
                                               ZEXT416((uint)(fVar187 + fVar187)),auVar116);
                    auVar223 = ZEXT1664(auVar117);
                    auVar116 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar172,
                                               ZEXT416(0x40000000));
                    auVar116 = vfmadd231ss_fma(ZEXT416((uint)(fVar170 * fVar170 * -3.0)),
                                               ZEXT416((uint)(fVar170 + fVar170)),auVar116);
                    auVar172 = vfmadd231ss_fma(ZEXT416((uint)(fVar187 * fVar187)),auVar172,
                                               ZEXT416((uint)(fVar170 * -2.0)));
                    fVar170 = auVar8._0_4_ * 0.5;
                    fVar183 = auVar117._0_4_ * 0.5;
                    auVar214 = ZEXT464((uint)fVar183);
                    fVar184 = auVar116._0_4_ * 0.5;
                    fVar194 = auVar172._0_4_ * 0.5;
                    auVar199._0_4_ = fVar194 * local_880;
                    auVar199._4_4_ = fVar194 * fStack_87c;
                    auVar199._8_4_ = fVar194 * fStack_878;
                    auVar199._12_4_ = fVar194 * fStack_874;
                    auVar216._4_4_ = fVar184;
                    auVar216._0_4_ = fVar184;
                    auVar216._8_4_ = fVar184;
                    auVar216._12_4_ = fVar184;
                    auVar116 = vfmadd132ps_fma(auVar216,auVar199,auVar9);
                    auVar219 = ZEXT1664(auVar116);
                    auVar200._4_4_ = fVar183;
                    auVar200._0_4_ = fVar183;
                    auVar200._8_4_ = fVar183;
                    auVar200._12_4_ = fVar183;
                    auVar116 = vfmadd132ps_fma(auVar200,auVar116,auVar10);
                    auVar189._4_4_ = fVar170;
                    auVar189._0_4_ = fVar170;
                    auVar189._8_4_ = fVar170;
                    auVar189._12_4_ = fVar170;
                    auVar116 = vfmadd213ps_fma(auVar189,auVar31,auVar116);
                    *(undefined4 *)(ray + k * 4 + 0x200) = *(undefined4 *)(local_4c0 + uVar99 * 4);
                    *(int *)(ray + k * 4 + 0x300) = auVar116._0_4_;
                    uVar15 = vextractps_avx(auVar116,1);
                    *(undefined4 *)(ray + k * 4 + 0x340) = uVar15;
                    uVar15 = vextractps_avx(auVar116,2);
                    *(undefined4 *)(ray + k * 4 + 0x380) = uVar15;
                    *(float *)(ray + k * 4 + 0x3c0) = fVar187;
                    *(undefined4 *)(ray + k * 4 + 0x400) = uVar171;
                    *(uint *)(ray + k * 4 + 0x440) = uVar14;
                    *(uint *)(ray + k * 4 + 0x480) = uVar104;
                    *(uint *)(ray + k * 4 + 0x4c0) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x500) = context->user->instPrimID[0];
                  }
                }
              }
            }
          }
        }
        goto LAB_01d2cdbd;
      }
LAB_01d2c416:
      uVar171 = *(undefined4 *)(ray + k * 4 + 0x200);
      auVar42._4_4_ = uVar171;
      auVar42._0_4_ = uVar171;
      auVar42._8_4_ = uVar171;
      auVar42._12_4_ = uVar171;
      auVar42._16_4_ = uVar171;
      auVar42._20_4_ = uVar171;
      auVar42._24_4_ = uVar171;
      auVar42._28_4_ = uVar171;
      uVar32 = vcmpps_avx512vl(local_320,auVar42,2);
      uVar104 = (uint)uVar105 & (uint)uVar32;
      uVar105 = (ulong)uVar104;
    } while (uVar104 != 0);
  }
  return;
LAB_01d2d1d5:
  auVar182 = ZEXT3264(local_760);
  auVar241 = ZEXT3264(local_780);
  auVar124 = vmovdqa64_avx512vl(local_3c0);
  auVar228 = ZEXT3264(auVar124);
  uVar105 = local_808;
  iVar102 = local_7c0._0_4_;
LAB_01d2cdbd:
  lVar106 = lVar106 + 8;
  if (iVar102 <= (int)lVar106) goto LAB_01d2c416;
  goto LAB_01d2c4bc;
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }